

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O3

void anon_unknown.dwarf_143d90::testDct(void)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  float *pfVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined8 uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  bool bVar106;
  __m128 *srcVec;
  bool bVar107;
  int i_1;
  bool bVar108;
  undefined8 *puVar109;
  long lVar110;
  float *pfVar111;
  int iter;
  int iVar112;
  int i;
  long lVar113;
  ulong uVar114;
  int iter_18;
  byte bVar115;
  float fVar116;
  double dVar117;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 extraout_var [56];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar185 [48];
  undefined1 extraout_var_07 [56];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 extraout_var_11 [56];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 extraout_var_13 [56];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 extraout_var_15 [56];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 extraout_var_17 [56];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 extraout_var_19 [56];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 extraout_var_21 [56];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 extraout_var_23 [56];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 extraout_var_25 [56];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 extraout_var_27 [56];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 extraout_var_29 [56];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 extraout_var_31 [56];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 extraout_var_33 [56];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 extraout_var_35 [56];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 extraout_var_37 [56];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 extraout_var_39 [56];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  float fVar186;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar216;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar262;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar271;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar284;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar309;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar348 [36];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  float fVar349;
  float fVar350;
  float fVar381;
  float fVar383;
  float fVar385;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar382;
  float fVar384;
  float fVar386;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar387;
  float fVar397;
  float fVar398;
  float fVar399;
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar400 [16];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [16];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar414;
  float fVar426;
  float fVar427;
  float fVar428;
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  float fVar429;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  float fVar439;
  float fVar454;
  float fVar455;
  float fVar456;
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  float fVar457;
  float fVar469;
  float fVar470;
  float fVar471;
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  Rand48 rand48;
  __m128 in [8];
  CpuId cpuid;
  SimdAlignedBuffer64<float> local_150;
  ushort local_136 [3];
  SimdAlignedBuffer64<float> local_130;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  CpuId local_87 [5];
  char local_82;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_30 [56];
  undefined1 extraout_var_32 [56];
  undefined1 extraout_var_34 [56];
  undefined1 extraout_var_36 [56];
  undefined1 extraout_var_38 [56];
  undefined1 extraout_var_40 [56];
  
  bVar115 = 0;
  local_136[0] = 0x5a5a;
  local_136[1] = 0x5a5a;
  local_136[2] = 0x5a5a;
  local_130._buffer = (float *)0x0;
  local_130._handle = (char *)0x0;
  Imf_3_2::SimdAlignedBuffer64<float>::alloc(&local_130);
  local_150._buffer = (float *)0x0;
  local_150._handle = (char *)0x0;
  Imf_3_2::SimdAlignedBuffer64<float>::alloc(&local_150);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   DCT Round Trip ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar112 = 0;
  do {
    lVar113 = 0;
    do {
      dVar117 = (double)Imath_3_2::erand48(local_136);
      *(float *)((undefined1 *)local_150._buffer + lVar113 * 4) = (float)dVar117;
      local_130._buffer[lVar113] = (float)dVar117;
      lVar113 = lVar113 + 1;
    } while (lVar113 != 0x40);
    bVar106 = true;
    do {
      bVar107 = bVar106;
      lVar113 = 0;
      fVar429 = (float)DAT_001c2590;
      fVar436 = DAT_001c2590._4_4_;
      fVar437 = DAT_001c2590._8_4_;
      fVar438 = DAT_001c2590._12_4_;
      fVar439 = (float)DAT_001c25a0;
      fVar454 = DAT_001c25a0._4_4_;
      fVar455 = DAT_001c25a0._8_4_;
      fVar456 = DAT_001c25a0._12_4_;
      fVar457 = (float)DAT_001c25c0;
      fVar469 = DAT_001c25c0._4_4_;
      fVar470 = DAT_001c25c0._8_4_;
      fVar471 = DAT_001c25c0._12_4_;
      fVar414 = (float)DAT_001c25d0;
      fVar426 = DAT_001c25d0._4_4_;
      fVar427 = DAT_001c25d0._8_4_;
      fVar428 = DAT_001c25d0._12_4_;
      bVar106 = true;
      do {
        bVar108 = bVar106;
        pauVar5 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        pauVar2 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        pauVar3 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        pauVar4 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10);
        fVar284 = *(float *)*pauVar1 + *(float *)*pauVar5;
        fVar306 = *(float *)(*pauVar1 + 4) + *(float *)(*pauVar5 + 4);
        fVar307 = *(float *)(*pauVar1 + 8) + *(float *)(*pauVar5 + 8);
        fVar308 = *(float *)(*pauVar1 + 0xc) + *(float *)(*pauVar5 + 0xc);
        fVar116 = *(float *)*pauVar2 + *(float *)*pauVar3;
        fVar182 = *(float *)(*pauVar2 + 4) + *(float *)(*pauVar3 + 4);
        fVar183 = *(float *)(*pauVar2 + 8) + *(float *)(*pauVar3 + 8);
        fVar184 = *(float *)(*pauVar2 + 0xc) + *(float *)(*pauVar3 + 0xc);
        pauVar6 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10);
        fVar335 = *(float *)*pauVar4 + *(float *)*pauVar6;
        fVar345 = *(float *)(*pauVar4 + 4) + *(float *)(*pauVar6 + 4);
        fVar346 = *(float *)(*pauVar4 + 8) + *(float *)(*pauVar6 + 8);
        fVar347 = *(float *)(*pauVar4 + 0xc) + *(float *)(*pauVar6 + 0xc);
        pauVar7 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10);
        pauVar8 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10);
        fVar216 = *(float *)*pauVar1 - *(float *)*pauVar5;
        fVar259 = *(float *)(*pauVar1 + 4) - *(float *)(*pauVar5 + 4);
        fVar260 = *(float *)(*pauVar1 + 8) - *(float *)(*pauVar5 + 8);
        fVar261 = *(float *)(*pauVar1 + 0xc) - *(float *)(*pauVar5 + 0xc);
        fVar309 = *(float *)*pauVar7 + *(float *)*pauVar8;
        fVar332 = *(float *)(*pauVar7 + 4) + *(float *)(*pauVar8 + 4);
        fVar333 = *(float *)(*pauVar7 + 8) + *(float *)(*pauVar8 + 8);
        fVar334 = *(float *)(*pauVar7 + 0xc) + *(float *)(*pauVar8 + 0xc);
        fVar271 = *(float *)*pauVar2 - *(float *)*pauVar3;
        fVar281 = *(float *)(*pauVar2 + 4) - *(float *)(*pauVar3 + 4);
        fVar282 = *(float *)(*pauVar2 + 8) - *(float *)(*pauVar3 + 8);
        fVar283 = *(float *)(*pauVar2 + 0xc) - *(float *)(*pauVar3 + 0xc);
        fVar262 = *(float *)*pauVar4 - *(float *)*pauVar6;
        fVar268 = *(float *)(*pauVar4 + 4) - *(float *)(*pauVar6 + 4);
        fVar269 = *(float *)(*pauVar4 + 8) - *(float *)(*pauVar6 + 8);
        fVar270 = *(float *)(*pauVar4 + 0xc) - *(float *)(*pauVar6 + 0xc);
        fVar186 = *(float *)*pauVar7 - *(float *)*pauVar8;
        fVar213 = *(float *)(*pauVar7 + 4) - *(float *)(*pauVar8 + 4);
        fVar214 = *(float *)(*pauVar7 + 8) - *(float *)(*pauVar8 + 8);
        fVar215 = *(float *)(*pauVar7 + 0xc) - *(float *)(*pauVar8 + 0xc);
        fVar349 = (fVar284 + fVar335) * 0.70710677;
        fVar381 = (fVar306 + fVar345) * 0.70710677;
        fVar383 = (fVar307 + fVar346) * 0.70710677;
        fVar385 = (fVar308 + fVar347) * 0.70710677;
        fVar387 = (fVar116 + fVar309) * 0.70710677;
        fVar397 = (fVar182 + fVar332) * 0.70710677;
        fVar398 = (fVar183 + fVar333) * 0.70710677;
        fVar399 = (fVar184 + fVar334) * 0.70710677;
        auVar400._0_4_ = (fVar349 + fVar387) * 0.5;
        auVar400._4_4_ = (fVar381 + fVar397) * 0.5;
        auVar400._8_4_ = (fVar383 + fVar398) * 0.5;
        auVar400._12_4_ = (fVar385 + fVar399) * 0.5;
        *(undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10) = auVar400;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10);
        *(float *)*pauVar1 = (fVar349 - fVar387) * 0.5;
        *(float *)(*pauVar1 + 4) = (fVar381 - fVar397) * 0.5;
        *(float *)(*pauVar1 + 8) = (fVar383 - fVar398) * 0.5;
        *(float *)(*pauVar1 + 0xc) = (fVar385 - fVar399) * 0.5;
        fVar349 = fVar271 - fVar186;
        fVar381 = fVar281 - fVar213;
        fVar383 = fVar282 - fVar214;
        fVar385 = fVar283 - fVar215;
        fVar284 = fVar284 - fVar335;
        fVar306 = fVar306 - fVar345;
        fVar307 = fVar307 - fVar346;
        fVar308 = fVar308 - fVar347;
        auVar388._0_4_ = fVar284 * fVar439 + fVar349 * fVar429;
        auVar388._4_4_ = fVar306 * fVar454 + fVar381 * fVar436;
        auVar388._8_4_ = fVar307 * fVar455 + fVar383 * fVar437;
        auVar388._12_4_ = fVar308 * fVar456 + fVar385 * fVar438;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10) = auVar388;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10);
        *(float *)*pauVar1 = fVar284 * fVar429 - fVar349 * fVar439;
        *(float *)(*pauVar1 + 4) = fVar306 * fVar436 - fVar381 * fVar454;
        *(float *)(*pauVar1 + 8) = fVar307 * fVar437 - fVar383 * fVar455;
        *(float *)(*pauVar1 + 0xc) = fVar308 * fVar438 - fVar385 * fVar456;
        fVar116 = (fVar116 - fVar309) * 0.70710677;
        fVar182 = (fVar182 - fVar332) * 0.70710677;
        fVar183 = (fVar183 - fVar333) * 0.70710677;
        fVar184 = (fVar184 - fVar334) * 0.70710677;
        fVar186 = (fVar186 + fVar271) * -0.70710677;
        fVar213 = (fVar213 + fVar281) * -0.70710677;
        fVar214 = (fVar214 + fVar282) * -0.70710677;
        fVar215 = (fVar215 + fVar283) * -0.70710677;
        fVar271 = fVar216 - fVar116;
        fVar281 = fVar259 - fVar182;
        fVar282 = fVar260 - fVar183;
        fVar283 = fVar261 - fVar184;
        fVar284 = fVar262 + fVar186;
        fVar306 = fVar268 + fVar213;
        fVar307 = fVar269 + fVar214;
        fVar308 = fVar270 + fVar215;
        auVar310._0_4_ = fVar271 * fVar457 - fVar284 * fVar414;
        auVar310._4_4_ = fVar281 * fVar469 - fVar306 * fVar426;
        auVar310._8_4_ = fVar282 * fVar470 - fVar307 * fVar427;
        auVar310._12_4_ = fVar283 * fVar471 - fVar308 * fVar428;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar310;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10);
        *(float *)*pauVar1 = fVar284 * fVar457 + fVar271 * fVar414;
        *(float *)(*pauVar1 + 4) = fVar306 * fVar469 + fVar281 * fVar426;
        *(float *)(*pauVar1 + 8) = fVar307 * fVar470 + fVar282 * fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar308 * fVar471 + fVar283 * fVar428;
        fVar116 = fVar116 + fVar216;
        fVar182 = fVar182 + fVar259;
        fVar183 = fVar183 + fVar260;
        fVar184 = fVar184 + fVar261;
        fVar186 = fVar186 - fVar262;
        fVar213 = fVar213 - fVar268;
        fVar214 = fVar214 - fVar269;
        fVar215 = fVar215 - fVar270;
        fVar216 = (float)DAT_001c25e0;
        fVar259 = DAT_001c25e0._4_4_;
        fVar260 = DAT_001c25e0._8_4_;
        fVar261 = DAT_001c25e0._12_4_;
        fVar262 = (float)DAT_001c25f0;
        fVar268 = DAT_001c25f0._4_4_;
        fVar269 = DAT_001c25f0._8_4_;
        fVar270 = DAT_001c25f0._12_4_;
        auVar217._0_4_ = fVar116 * fVar216 - fVar186 * fVar262;
        auVar217._4_4_ = fVar182 * fVar259 - fVar213 * fVar268;
        auVar217._8_4_ = fVar183 * fVar260 - fVar214 * fVar269;
        auVar217._12_4_ = fVar184 * fVar261 - fVar215 * fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10) = auVar217;
        auVar187._0_4_ = fVar186 * fVar216 + fVar116 * fVar262;
        auVar187._4_4_ = fVar213 * fVar259 + fVar182 * fVar268;
        auVar187._8_4_ = fVar214 * fVar260 + fVar183 * fVar269;
        auVar187._12_4_ = fVar215 * fVar261 + fVar184 * fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10) = auVar187;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar108);
      uVar61 = *(undefined4 *)((undefined1 *)local_150._buffer + 4);
      uVar62 = *(undefined4 *)((undefined1 *)local_150._buffer + 8);
      uVar63 = *(undefined4 *)((undefined1 *)local_150._buffer + 0xc);
      uVar64 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      uVar65 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      uVar66 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      uVar68 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      uVar70 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      uVar71 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      uVar72 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      uVar73 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      uVar74 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      uVar75 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      uVar76 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      uVar77 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      uVar78 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      uVar79 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      uVar80 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      uVar81 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      uVar82 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      uVar83 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      uVar84 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      uVar85 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      uVar86 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      uVar87 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      uVar88 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      uVar89 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      uVar90 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      auVar187 = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar217 = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      *(undefined4 *)(undefined1 *)local_150._buffer =
           *(undefined4 *)(undefined1 *)local_150._buffer;
      *(undefined4 *)((undefined1 *)local_150._buffer + 4) =
           *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      *(undefined4 *)((undefined1 *)local_150._buffer + 8) = uVar75;
      *(undefined4 *)((undefined1 *)local_150._buffer + 0xc) = uVar79;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = uVar62;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = uVar69;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = uVar77;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = uVar81;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = uVar68;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = uVar76;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = uVar80;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = uVar63;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = uVar70;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = uVar78;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = uVar82;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = uVar83;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = uVar87;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = auVar187._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = auVar217._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = uVar85;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = uVar89;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = auVar187._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = auVar217._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = uVar84;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = uVar88;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = auVar187._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = auVar217._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = uVar86;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = uVar90;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = auVar187._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = auVar217._12_4_;
      auVar187 = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar217 = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      uVar61 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      uVar62 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      uVar63 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      uVar68 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      uVar69 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      uVar70 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      uVar76 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      auVar310 = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar388 = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = uVar64;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = uVar71;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = auVar187._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = auVar217._0_4_;
      auVar272._4_4_ = uVar73;
      auVar272._0_4_ = uVar66;
      auVar272._8_4_ = auVar187._8_4_;
      auVar272._12_4_ = auVar217._8_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = auVar272;
      auVar218._4_4_ = uVar72;
      auVar218._0_4_ = uVar65;
      auVar218._8_4_ = auVar187._4_4_;
      auVar218._12_4_ = auVar217._4_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = auVar218;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4) = uVar74;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8) = auVar187._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc) = auVar217._12_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = uVar69;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = auVar310._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = auVar388._0_4_;
      auVar118._4_4_ = uVar75;
      auVar118._0_4_ = uVar63;
      auVar118._8_4_ = auVar310._8_4_;
      auVar118._12_4_ = auVar388._8_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x50) = auVar118;
      auVar311._4_4_ = uVar70;
      auVar311._0_4_ = uVar62;
      auVar311._8_4_ = auVar310._4_4_;
      auVar311._12_4_ = auVar388._4_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x30) = auVar311;
      auVar188._4_4_ = uVar76;
      auVar188._0_4_ = uVar68;
      auVar188._8_4_ = auVar310._12_4_;
      auVar188._12_4_ = auVar388._12_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar188;
      bVar106 = false;
    } while (bVar107);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_150._buffer);
    compareBufferRelative(&local_130,&local_150,0.02,0.001);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Inverse, DC Only",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar112 = 0;
  do {
    dVar117 = (double)Imath_3_2::erand48(local_136);
    *(float *)(undefined1 *)local_150._buffer = (float)dVar117;
    *local_130._buffer = (float)dVar117;
    lVar113 = 1;
    do {
      *(undefined4 *)((undefined1 *)local_150._buffer + lVar113 * 4) = 0;
      local_130._buffer[lVar113] = 0.0;
      lVar113 = lVar113 + 1;
    } while (lVar113 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    fVar414 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 * 0.3535536;
    lVar113 = 0;
    do {
      pfVar111 = (float *)((undefined1 *)local_150._buffer + lVar113);
      *pfVar111 = fVar414;
      pfVar111[1] = fVar414;
      pfVar111[2] = fVar414;
      pfVar111[3] = fVar414;
      lVar113 = lVar113 + 0x10;
    } while (lVar113 != 0x100);
    compareBufferRelative(&local_130,&local_150,0.01,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Inverse, Scalar: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar112 = 0;
  do {
    lVar113 = 0;
    do {
      dVar117 = (double)Imath_3_2::erand48(local_136);
      *(float *)((undefined1 *)local_150._buffer + lVar113 * 4) = (float)dVar117;
      local_130._buffer[lVar113] = (float)dVar117;
      lVar113 = lVar113 + 1;
    } while (lVar113 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_150._buffer);
    compareBufferRelative(&local_130,&local_150,0.01,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar141._0_8_ = std::ostream::flush();
  auVar141._8_56_ = extraout_var;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar141._0_16_ = ZEXT816(0);
      if (uVar114 < 0x38) {
        auVar140._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar140._8_56_ = extraout_var_00;
        auVar141._4_60_ = auVar140._4_60_;
        auVar141._0_4_ = (float)auVar140._0_8_;
      }
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar141._0_4_;
      local_130._buffer[uVar114] = auVar141._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    lVar113 = 0;
    fVar414 = (float)DAT_001c2600;
    fVar426 = DAT_001c2600._4_4_;
    fVar427 = (float)DAT_001c2630;
    fVar428 = DAT_001c2630._4_4_;
    fVar429 = DAT_001c2630._8_4_;
    fVar436 = DAT_001c2630._12_4_;
    fVar437 = (float)DAT_001c2640;
    fVar438 = DAT_001c2640._4_4_;
    fVar439 = DAT_001c2640._8_4_;
    fVar454 = DAT_001c2640._12_4_;
    fVar455 = (float)DAT_001c2650;
    fVar456 = DAT_001c2650._4_4_;
    fVar457 = DAT_001c2650._8_4_;
    fVar469 = DAT_001c2650._12_4_;
    fVar470 = (float)DAT_001c2660;
    fVar471 = DAT_001c2660._4_4_;
    fVar116 = DAT_001c2660._8_4_;
    fVar182 = DAT_001c2660._12_4_;
    do {
      fVar214 = (*(float *)((undefined1 *)local_150._buffer + lVar113) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar414;
      fVar215 = (*(float *)((undefined1 *)local_150._buffer + lVar113) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar426;
      fVar259 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar216 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar183 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 0xc);
      fVar184 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 4);
      fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 4);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 0xc);
      fVar260 = fVar213 * fVar470 + fVar186 * fVar455 + fVar184 * fVar437 + fVar183 * fVar427;
      fVar261 = fVar213 * fVar471 + fVar186 * fVar456 + fVar184 * fVar438 + fVar183 * fVar428;
      fVar262 = fVar213 * fVar116 + fVar186 * fVar457 + fVar184 * fVar439 + fVar183 * fVar429;
      fVar186 = fVar213 * fVar182 + fVar186 * fVar469 + fVar184 * fVar454 + fVar183 * fVar436;
      fVar183 = fVar259 + fVar215;
      fVar184 = fVar216 + fVar214;
      fVar214 = fVar214 - fVar216;
      fVar215 = fVar215 - fVar259;
      auVar119._0_4_ = fVar260 + fVar184;
      auVar119._4_4_ = fVar261 + fVar183;
      auVar119._8_4_ = fVar262 + fVar215;
      auVar119._12_4_ = fVar186 + fVar214;
      auVar141._0_16_ = auVar119;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar113) = auVar119;
      auVar219._4_4_ = fVar215 - fVar262;
      auVar219._0_4_ = fVar214 - fVar186;
      auVar219._8_4_ = fVar183 - fVar261;
      auVar219._12_4_ = fVar184 - fVar260;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113) =
           auVar219;
      lVar113 = lVar113 + 0x20;
    } while (lVar113 != 0xe0);
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar284 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar306 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar307 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar308 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar309 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar332 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar333 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar334 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      auVar141._0_4_ =
           fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      auVar141._4_4_ =
           fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      auVar141._8_4_ =
           fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      auVar141._12_4_ =
           fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar335 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar345 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar346 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar347 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar349 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar381 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar383 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar385 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * fVar116;
      fVar397 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar398 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar399 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar284 + fVar271;
      fVar268 = fVar306 + fVar281;
      fVar269 = fVar307 + fVar282;
      fVar270 = fVar308 + fVar283;
      fVar271 = fVar271 - fVar284;
      fVar281 = fVar281 - fVar306;
      fVar282 = fVar282 - fVar307;
      fVar283 = fVar283 - fVar308;
      fVar186 = fVar309 + fVar387;
      fVar213 = fVar332 + fVar397;
      fVar214 = fVar333 + fVar398;
      fVar215 = fVar334 + fVar399;
      fVar387 = fVar387 - fVar309;
      fVar397 = fVar397 - fVar332;
      fVar398 = fVar398 - fVar333;
      fVar399 = fVar399 - fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = auVar141._0_4_ + fVar186;
      pfVar111[1] = auVar141._4_4_ + fVar213;
      pfVar111[2] = auVar141._8_4_ + fVar214;
      pfVar111[3] = auVar141._12_4_ + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar262;
      pfVar111[1] = fVar345 + fVar268;
      pfVar111[2] = fVar346 + fVar269;
      pfVar111[3] = fVar347 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar271;
      pfVar111[1] = fVar381 + fVar281;
      pfVar111[2] = fVar383 + fVar282;
      pfVar111[3] = fVar385 + fVar283;
      auVar220._0_4_ = fVar216 + fVar387;
      auVar220._4_4_ = fVar259 + fVar397;
      auVar220._8_4_ = fVar260 + fVar398;
      auVar220._12_4_ = fVar261 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar220;
      auVar351._0_4_ = fVar387 - fVar216;
      auVar351._4_4_ = fVar397 - fVar259;
      auVar351._8_4_ = fVar398 - fVar260;
      auVar351._12_4_ = fVar399 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar351;
      auVar312._0_4_ = fVar271 - fVar349;
      auVar312._4_4_ = fVar281 - fVar381;
      auVar312._8_4_ = fVar282 - fVar383;
      auVar312._12_4_ = fVar283 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar312;
      auVar285._0_4_ = fVar262 - fVar335;
      auVar285._4_4_ = fVar268 - fVar345;
      auVar285._8_4_ = fVar269 - fVar346;
      auVar285._12_4_ = fVar270 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar285;
      auVar189._0_4_ = fVar186 - auVar141._0_4_;
      auVar189._4_4_ = fVar213 - auVar141._4_4_;
      auVar189._8_4_ = fVar214 - auVar141._8_4_;
      auVar189._12_4_ = fVar215 - auVar141._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4)
           = auVar189;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar141._0_12_ = ZEXT812(0x3c23d70a);
    auVar141._12_4_ = 0.0;
    compareBufferRelative(&local_130,&local_150,auVar141._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar143._0_8_ = std::ostream::flush();
  auVar143._8_56_ = extraout_var_01;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar143._0_16_ = ZEXT816(0);
      if (uVar114 < 0x30) {
        auVar142._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar142._8_56_ = extraout_var_02;
        auVar143._4_60_ = auVar142._4_60_;
        auVar143._0_4_ = (float)auVar142._0_8_;
      }
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar143._0_4_;
      local_130._buffer[uVar114] = auVar143._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    lVar113 = 0;
    fVar414 = (float)DAT_001c2600;
    fVar426 = DAT_001c2600._4_4_;
    fVar427 = (float)DAT_001c2630;
    fVar428 = DAT_001c2630._4_4_;
    fVar429 = DAT_001c2630._8_4_;
    fVar436 = DAT_001c2630._12_4_;
    fVar437 = (float)DAT_001c2640;
    fVar438 = DAT_001c2640._4_4_;
    fVar439 = DAT_001c2640._8_4_;
    fVar454 = DAT_001c2640._12_4_;
    fVar455 = (float)DAT_001c2650;
    fVar456 = DAT_001c2650._4_4_;
    fVar457 = DAT_001c2650._8_4_;
    fVar469 = DAT_001c2650._12_4_;
    fVar470 = (float)DAT_001c2660;
    fVar471 = DAT_001c2660._4_4_;
    fVar116 = DAT_001c2660._8_4_;
    fVar182 = DAT_001c2660._12_4_;
    do {
      fVar214 = (*(float *)((undefined1 *)local_150._buffer + lVar113) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar414;
      fVar215 = (*(float *)((undefined1 *)local_150._buffer + lVar113) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar426;
      fVar259 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar216 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar183 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 0xc);
      fVar184 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 4);
      fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 4);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 0xc);
      fVar260 = fVar213 * fVar470 + fVar186 * fVar455 + fVar184 * fVar437 + fVar183 * fVar427;
      fVar261 = fVar213 * fVar471 + fVar186 * fVar456 + fVar184 * fVar438 + fVar183 * fVar428;
      fVar262 = fVar213 * fVar116 + fVar186 * fVar457 + fVar184 * fVar439 + fVar183 * fVar429;
      fVar186 = fVar213 * fVar182 + fVar186 * fVar469 + fVar184 * fVar454 + fVar183 * fVar436;
      fVar183 = fVar259 + fVar215;
      fVar184 = fVar216 + fVar214;
      fVar214 = fVar214 - fVar216;
      fVar215 = fVar215 - fVar259;
      auVar120._0_4_ = fVar260 + fVar184;
      auVar120._4_4_ = fVar261 + fVar183;
      auVar120._8_4_ = fVar262 + fVar215;
      auVar120._12_4_ = fVar186 + fVar214;
      auVar143._0_16_ = auVar120;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar113) = auVar120;
      auVar221._4_4_ = fVar215 - fVar262;
      auVar221._0_4_ = fVar214 - fVar186;
      auVar221._8_4_ = fVar183 - fVar261;
      auVar221._12_4_ = fVar184 - fVar260;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113) =
           auVar221;
      lVar113 = lVar113 + 0x20;
    } while (lVar113 != 0xc0);
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar284 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar306 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar307 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar308 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar309 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar332 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar333 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar334 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      auVar143._0_4_ =
           fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      auVar143._4_4_ =
           fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      auVar143._8_4_ =
           fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      auVar143._12_4_ =
           fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar335 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar345 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar346 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar347 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar349 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar381 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar383 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar385 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * fVar116;
      fVar397 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar398 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar399 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar284 + fVar271;
      fVar268 = fVar306 + fVar281;
      fVar269 = fVar307 + fVar282;
      fVar270 = fVar308 + fVar283;
      fVar271 = fVar271 - fVar284;
      fVar281 = fVar281 - fVar306;
      fVar282 = fVar282 - fVar307;
      fVar283 = fVar283 - fVar308;
      fVar186 = fVar309 + fVar387;
      fVar213 = fVar332 + fVar397;
      fVar214 = fVar333 + fVar398;
      fVar215 = fVar334 + fVar399;
      fVar387 = fVar387 - fVar309;
      fVar397 = fVar397 - fVar332;
      fVar398 = fVar398 - fVar333;
      fVar399 = fVar399 - fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = auVar143._0_4_ + fVar186;
      pfVar111[1] = auVar143._4_4_ + fVar213;
      pfVar111[2] = auVar143._8_4_ + fVar214;
      pfVar111[3] = auVar143._12_4_ + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar262;
      pfVar111[1] = fVar345 + fVar268;
      pfVar111[2] = fVar346 + fVar269;
      pfVar111[3] = fVar347 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar271;
      pfVar111[1] = fVar381 + fVar281;
      pfVar111[2] = fVar383 + fVar282;
      pfVar111[3] = fVar385 + fVar283;
      auVar222._0_4_ = fVar216 + fVar387;
      auVar222._4_4_ = fVar259 + fVar397;
      auVar222._8_4_ = fVar260 + fVar398;
      auVar222._12_4_ = fVar261 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar222;
      auVar352._0_4_ = fVar387 - fVar216;
      auVar352._4_4_ = fVar397 - fVar259;
      auVar352._8_4_ = fVar398 - fVar260;
      auVar352._12_4_ = fVar399 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar352;
      auVar313._0_4_ = fVar271 - fVar349;
      auVar313._4_4_ = fVar281 - fVar381;
      auVar313._8_4_ = fVar282 - fVar383;
      auVar313._12_4_ = fVar283 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar313;
      auVar286._0_4_ = fVar262 - fVar335;
      auVar286._4_4_ = fVar268 - fVar345;
      auVar286._8_4_ = fVar269 - fVar346;
      auVar286._12_4_ = fVar270 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar286;
      auVar190._0_4_ = fVar186 - auVar143._0_4_;
      auVar190._4_4_ = fVar213 - auVar143._4_4_;
      auVar190._8_4_ = fVar214 - auVar143._8_4_;
      auVar190._12_4_ = fVar215 - auVar143._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4)
           = auVar190;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar143._0_12_ = ZEXT812(0x3c23d70a);
    auVar143._12_4_ = 0.0;
    compareBufferRelative(&local_130,&local_150,auVar143._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar145._0_8_ = std::ostream::flush();
  auVar145._8_56_ = extraout_var_03;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar145._0_16_ = ZEXT816(0);
      if (uVar114 < 0x28) {
        auVar144._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar144._8_56_ = extraout_var_04;
        auVar145._4_60_ = auVar144._4_60_;
        auVar145._0_4_ = (float)auVar144._0_8_;
      }
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar145._0_4_;
      local_130._buffer[uVar114] = auVar145._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    lVar113 = 0;
    fVar414 = (float)DAT_001c2600;
    fVar426 = DAT_001c2600._4_4_;
    fVar427 = (float)DAT_001c2630;
    fVar428 = DAT_001c2630._4_4_;
    fVar429 = DAT_001c2630._8_4_;
    fVar436 = DAT_001c2630._12_4_;
    fVar437 = (float)DAT_001c2640;
    fVar438 = DAT_001c2640._4_4_;
    fVar439 = DAT_001c2640._8_4_;
    fVar454 = DAT_001c2640._12_4_;
    fVar455 = (float)DAT_001c2650;
    fVar456 = DAT_001c2650._4_4_;
    fVar457 = DAT_001c2650._8_4_;
    fVar469 = DAT_001c2650._12_4_;
    fVar470 = (float)DAT_001c2660;
    fVar471 = DAT_001c2660._4_4_;
    fVar116 = DAT_001c2660._8_4_;
    fVar182 = DAT_001c2660._12_4_;
    do {
      fVar214 = (*(float *)((undefined1 *)local_150._buffer + lVar113) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar414;
      fVar215 = (*(float *)((undefined1 *)local_150._buffer + lVar113) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar426;
      fVar259 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar216 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar183 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 0xc);
      fVar184 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 4);
      fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 4);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 0xc);
      fVar260 = fVar213 * fVar470 + fVar186 * fVar455 + fVar184 * fVar437 + fVar183 * fVar427;
      fVar261 = fVar213 * fVar471 + fVar186 * fVar456 + fVar184 * fVar438 + fVar183 * fVar428;
      fVar262 = fVar213 * fVar116 + fVar186 * fVar457 + fVar184 * fVar439 + fVar183 * fVar429;
      fVar186 = fVar213 * fVar182 + fVar186 * fVar469 + fVar184 * fVar454 + fVar183 * fVar436;
      fVar183 = fVar259 + fVar215;
      fVar184 = fVar216 + fVar214;
      fVar214 = fVar214 - fVar216;
      fVar215 = fVar215 - fVar259;
      auVar121._0_4_ = fVar260 + fVar184;
      auVar121._4_4_ = fVar261 + fVar183;
      auVar121._8_4_ = fVar262 + fVar215;
      auVar121._12_4_ = fVar186 + fVar214;
      auVar145._0_16_ = auVar121;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar113) = auVar121;
      auVar223._4_4_ = fVar215 - fVar262;
      auVar223._0_4_ = fVar214 - fVar186;
      auVar223._8_4_ = fVar183 - fVar261;
      auVar223._12_4_ = fVar184 - fVar260;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113) =
           auVar223;
      lVar113 = lVar113 + 0x20;
    } while (lVar113 != 0xa0);
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar284 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar306 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar307 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar308 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar309 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar332 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar333 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar334 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      auVar145._0_4_ =
           fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      auVar145._4_4_ =
           fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      auVar145._8_4_ =
           fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      auVar145._12_4_ =
           fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar335 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar345 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar346 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar347 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar349 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar381 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar383 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar385 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * fVar116;
      fVar397 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar398 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar399 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar284 + fVar271;
      fVar268 = fVar306 + fVar281;
      fVar269 = fVar307 + fVar282;
      fVar270 = fVar308 + fVar283;
      fVar271 = fVar271 - fVar284;
      fVar281 = fVar281 - fVar306;
      fVar282 = fVar282 - fVar307;
      fVar283 = fVar283 - fVar308;
      fVar186 = fVar309 + fVar387;
      fVar213 = fVar332 + fVar397;
      fVar214 = fVar333 + fVar398;
      fVar215 = fVar334 + fVar399;
      fVar387 = fVar387 - fVar309;
      fVar397 = fVar397 - fVar332;
      fVar398 = fVar398 - fVar333;
      fVar399 = fVar399 - fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = auVar145._0_4_ + fVar186;
      pfVar111[1] = auVar145._4_4_ + fVar213;
      pfVar111[2] = auVar145._8_4_ + fVar214;
      pfVar111[3] = auVar145._12_4_ + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar262;
      pfVar111[1] = fVar345 + fVar268;
      pfVar111[2] = fVar346 + fVar269;
      pfVar111[3] = fVar347 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar271;
      pfVar111[1] = fVar381 + fVar281;
      pfVar111[2] = fVar383 + fVar282;
      pfVar111[3] = fVar385 + fVar283;
      auVar224._0_4_ = fVar216 + fVar387;
      auVar224._4_4_ = fVar259 + fVar397;
      auVar224._8_4_ = fVar260 + fVar398;
      auVar224._12_4_ = fVar261 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar224;
      auVar353._0_4_ = fVar387 - fVar216;
      auVar353._4_4_ = fVar397 - fVar259;
      auVar353._8_4_ = fVar398 - fVar260;
      auVar353._12_4_ = fVar399 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar353;
      auVar314._0_4_ = fVar271 - fVar349;
      auVar314._4_4_ = fVar281 - fVar381;
      auVar314._8_4_ = fVar282 - fVar383;
      auVar314._12_4_ = fVar283 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar314;
      auVar287._0_4_ = fVar262 - fVar335;
      auVar287._4_4_ = fVar268 - fVar345;
      auVar287._8_4_ = fVar269 - fVar346;
      auVar287._12_4_ = fVar270 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar287;
      auVar191._0_4_ = fVar186 - auVar145._0_4_;
      auVar191._4_4_ = fVar213 - auVar145._4_4_;
      auVar191._8_4_ = fVar214 - auVar145._8_4_;
      auVar191._12_4_ = fVar215 - auVar145._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4)
           = auVar191;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar145._0_12_ = ZEXT812(0x3c23d70a);
    auVar145._12_4_ = 0.0;
    compareBufferRelative(&local_130,&local_150,auVar145._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar147._0_8_ = std::ostream::flush();
  auVar147._8_56_ = extraout_var_05;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar147._0_16_ = ZEXT816(0);
      if (uVar114 < 0x20) {
        auVar146._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar146._8_56_ = extraout_var_06;
        auVar147._4_60_ = auVar146._4_60_;
        auVar147._0_4_ = (float)auVar146._0_8_;
      }
      auVar185 = auVar147._16_48_;
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar147._0_4_;
      local_130._buffer[uVar114] = auVar147._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
    fVar426 = *(float *)((undefined1 *)local_150._buffer + 0xc);
    fVar116 = *(float *)((undefined1 *)local_150._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.46193984;
    fVar182 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.46193984;
    fVar183 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) * 0.46193984;
    fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) * 0.46193984;
    fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_150._buffer + 8) * 0.46193984;
    fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.46193984;
    fVar214 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) * 0.46193984;
    fVar215 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) * 0.46193984;
    fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
    fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
    fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
    fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
    fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
    fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
    fVar349 = (float)DAT_001c2690;
    fVar381 = DAT_001c2690._4_4_;
    fVar383 = DAT_001c2690._8_4_;
    fVar385 = DAT_001c2690._12_4_;
    fVar439 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
    fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
    fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
    fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
    fVar457 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
    fVar469 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
    fVar470 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
    fVar471 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
    fVar284 = (float)DAT_001c26c0;
    fVar306 = DAT_001c26c0._4_4_;
    fVar307 = DAT_001c26c0._8_4_;
    fVar308 = DAT_001c26c0._12_4_;
    fVar335 = fVar471 * fVar284 + fVar456 * 0.27778545 + fVar414 * 0.49039266 + fVar426 * fVar349;
    fVar345 = fVar470 * fVar306 + fVar455 * 0.27778545 + fVar429 * 0.49039266 + fVar438 * fVar381;
    fVar346 = fVar469 * fVar307 + fVar454 * 0.27778545 + fVar428 * 0.49039266 + fVar437 * fVar383;
    fVar347 = fVar457 * fVar308 + fVar439 * 0.27778545 + fVar427 * 0.49039266 + fVar436 * fVar385;
    fVar309 = (float)DAT_001c26e0;
    fVar332 = DAT_001c26e0._4_4_;
    fVar333 = DAT_001c26e0._8_4_;
    fVar334 = DAT_001c26e0._12_4_;
    fVar216 = fVar471 * -0.27778545 + fVar456 * fVar309 + fVar414 * fVar349 + fVar426 * -0.097545706
    ;
    fVar259 = fVar470 * -0.27778545 + fVar455 * fVar332 + fVar429 * fVar381 + fVar438 * -0.097545706
    ;
    fVar260 = fVar469 * -0.27778545 + fVar454 * fVar333 + fVar428 * fVar383 + fVar437 * -0.097545706
    ;
    fVar261 = fVar457 * -0.27778545 + fVar439 * fVar334 + fVar427 * fVar385 + fVar436 * -0.097545706
    ;
    fVar262 = fVar471 * fVar349 + fVar456 * fVar284 + fVar414 * 0.27778545 + fVar426 * fVar309;
    fVar268 = fVar470 * fVar381 + fVar455 * fVar306 + fVar429 * 0.27778545 + fVar438 * fVar332;
    fVar269 = fVar469 * fVar383 + fVar454 * fVar307 + fVar428 * 0.27778545 + fVar437 * fVar333;
    fVar270 = fVar457 * fVar385 + fVar439 * fVar308 + fVar427 * 0.27778545 + fVar436 * fVar334;
    fVar456 = fVar471 * fVar309 + fVar456 * fVar349 + fVar414 * fVar284 + fVar426 * -0.27778545;
    fVar455 = fVar470 * fVar332 + fVar455 * fVar381 + fVar429 * fVar306 + fVar438 * -0.27778545;
    fVar454 = fVar469 * fVar333 + fVar454 * fVar383 + fVar428 * fVar307 + fVar437 * -0.27778545;
    fVar439 = fVar457 * fVar334 + fVar439 * fVar385 + fVar427 * fVar308 + fVar436 * -0.27778545;
    fVar414 = (*(float *)(undefined1 *)local_150._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar426 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar427 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50)) * 0.35355362;
    fVar428 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70)) * 0.35355362;
    fVar271 = (*(float *)(undefined1 *)local_150._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar281 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar282 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50)) * 0.35355362;
    fVar283 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70)) * 0.35355362;
    fVar457 = fVar186 + fVar414;
    fVar469 = fVar213 + fVar426;
    fVar470 = fVar214 + fVar427;
    fVar471 = fVar215 + fVar428;
    fVar429 = fVar116 + fVar271;
    fVar436 = fVar182 + fVar281;
    fVar437 = fVar183 + fVar282;
    fVar438 = fVar184 + fVar283;
    fVar271 = fVar271 - fVar116;
    fVar281 = fVar281 - fVar182;
    fVar282 = fVar282 - fVar183;
    fVar283 = fVar283 - fVar184;
    fVar414 = fVar414 - fVar186;
    fVar426 = fVar426 - fVar213;
    fVar427 = fVar427 - fVar214;
    fVar428 = fVar428 - fVar215;
    local_70 = fVar335 + fVar457;
    fStack_6c = fVar345 + fVar469;
    fStack_68 = fVar346 + fVar470;
    fStack_64 = fVar347 + fVar471;
    local_80 = CONCAT44(fVar216 + fVar429,local_70);
    uStack_78._0_4_ = fVar262 + fVar271;
    uStack_78._4_4_ = fVar456 + fVar414;
    auVar315._4_4_ = fVar271 - fVar262;
    auVar315._0_4_ = fVar414 - fVar456;
    auVar315._8_4_ = fVar429 - fVar216;
    auVar315._12_4_ = fVar457 - fVar335;
    auVar336._4_4_ = fVar259 + fVar436;
    auVar336._0_4_ = fStack_6c;
    auVar336._8_4_ = fVar268 + fVar281;
    auVar336._12_4_ = fVar455 + fVar426;
    auVar225._4_4_ = fVar260 + fVar437;
    auVar225._0_4_ = fStack_68;
    auVar225._8_4_ = fVar269 + fVar282;
    auVar225._12_4_ = fVar454 + fVar427;
    auVar405._4_4_ = fVar283 - fVar270;
    auVar405._0_4_ = fVar428 - fVar439;
    auVar405._8_4_ = fVar438 - fVar261;
    auVar405._12_4_ = fVar471 - fVar347;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar405;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fStack_6c;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar261 + fVar438;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar270 + fVar283;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar439 + fVar428;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar427 - fVar454;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar282 - fVar269;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar437 - fVar260;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar470 - fVar346;
    fVar414 = (float)DAT_001c2670;
    fVar427 = DAT_001c2670._4_4_;
    fVar428 = DAT_001c2670._8_4_;
    fVar429 = DAT_001c2670._12_4_;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x40) = auVar225;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar426 - fVar455;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar281 - fVar268;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar436 - fVar259;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar469 - fVar345;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar336;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar315;
    *(undefined8 *)(undefined1 *)local_150._buffer = local_80;
    *(undefined8 *)((undefined1 *)local_150._buffer + 8) = uStack_78;
    lVar113 = -8;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar426 = *pfVar111;
      fVar436 = pfVar111[1];
      fVar437 = pfVar111[2];
      fVar438 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar439 = *pfVar9;
      fVar454 = pfVar9[1];
      fVar455 = pfVar9[2];
      fVar456 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar216 = *pfVar111 * 0.19134216 - *pfVar9 * fVar414;
      fVar259 = pfVar111[1] * 0.19134216 - pfVar9[1] * fVar427;
      fVar260 = pfVar111[2] * 0.19134216 - pfVar9[2] * fVar428;
      fVar261 = pfVar111[3] * 0.19134216 - pfVar9[3] * fVar429;
      fVar262 = *pfVar9 * 0.19134216 + *pfVar111 * fVar414;
      fVar268 = pfVar9[1] * 0.19134216 + pfVar111[1] * fVar427;
      fVar269 = pfVar9[2] * 0.19134216 + pfVar111[2] * fVar428;
      fVar270 = pfVar9[3] * 0.19134216 + pfVar111[3] * fVar429;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar457 = *pfVar111;
      fVar469 = pfVar111[1];
      fVar470 = pfVar111[2];
      fVar471 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar116 = *pfVar111;
      fVar182 = pfVar111[1];
      fVar183 = pfVar111[2];
      fVar184 = pfVar111[3];
      fVar186 = fVar116 * fVar284 + fVar457 * 0.27778545 + fVar426 * 0.49039266 + fVar439 * fVar349;
      fVar213 = fVar182 * fVar306 + fVar469 * 0.27778545 + fVar436 * 0.49039266 + fVar454 * fVar381;
      fVar214 = fVar183 * fVar307 + fVar470 * 0.27778545 + fVar437 * 0.49039266 + fVar455 * fVar383;
      fVar215 = fVar184 * fVar308 + fVar471 * 0.27778545 + fVar438 * 0.49039266 + fVar456 * fVar385;
      fVar271 = fVar116 * (float)DAT_001c26f0 +
                fVar457 * fVar309 + fVar426 * fVar349 + fVar439 * -0.097545706;
      fVar281 = fVar182 * DAT_001c26f0._4_4_ +
                fVar469 * fVar332 + fVar436 * fVar381 + fVar454 * -0.097545706;
      fVar282 = fVar183 * DAT_001c26f0._8_4_ +
                fVar470 * fVar333 + fVar437 * fVar383 + fVar455 * -0.097545706;
      fVar283 = fVar184 * DAT_001c26f0._12_4_ +
                fVar471 * fVar334 + fVar438 * fVar385 + fVar456 * -0.097545706;
      fVar335 = fVar116 * fVar349 + fVar457 * fVar284 + fVar426 * 0.27778545 + fVar439 * fVar309;
      fVar345 = fVar182 * fVar381 + fVar469 * fVar306 + fVar436 * 0.27778545 + fVar454 * fVar332;
      fVar346 = fVar183 * fVar383 + fVar470 * fVar307 + fVar437 * 0.27778545 + fVar455 * fVar333;
      fVar347 = fVar184 * fVar385 + fVar471 * fVar308 + fVar438 * 0.27778545 + fVar456 * fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar439 = fVar116 * fVar309 +
                fVar457 * fVar349 + fVar426 * fVar284 + fVar439 * (float)DAT_001c26f0;
      fVar454 = fVar182 * fVar332 +
                fVar469 * fVar381 + fVar436 * fVar306 + fVar454 * DAT_001c26f0._4_4_;
      fVar455 = fVar183 * fVar333 +
                fVar470 * fVar383 + fVar437 * fVar307 + fVar455 * DAT_001c26f0._8_4_;
      fVar456 = fVar184 * fVar334 +
                fVar471 * fVar385 + fVar438 * fVar308 + fVar456 * DAT_001c26f0._12_4_;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * (float)DAT_001c2700;
      fVar397 = (pfVar111[1] + pfVar9[1]) * DAT_001c2700._4_4_;
      fVar398 = (pfVar111[2] + pfVar9[2]) * DAT_001c2700._8_4_;
      fVar399 = (pfVar111[3] + pfVar9[3]) * DAT_001c2700._12_4_;
      fVar116 = (*pfVar111 - *pfVar9) * (float)DAT_001c2700;
      fVar182 = (pfVar111[1] - pfVar9[1]) * DAT_001c2700._4_4_;
      fVar183 = (pfVar111[2] - pfVar9[2]) * DAT_001c2700._8_4_;
      fVar184 = (pfVar111[3] - pfVar9[3]) * DAT_001c2700._12_4_;
      fVar457 = fVar216 + fVar116;
      fVar469 = fVar259 + fVar182;
      fVar470 = fVar260 + fVar183;
      fVar471 = fVar261 + fVar184;
      fVar116 = fVar116 - fVar216;
      fVar182 = fVar182 - fVar259;
      fVar183 = fVar183 - fVar260;
      fVar184 = fVar184 - fVar261;
      fVar426 = fVar262 + fVar387;
      fVar436 = fVar268 + fVar397;
      fVar437 = fVar269 + fVar398;
      fVar438 = fVar270 + fVar399;
      fVar387 = fVar387 - fVar262;
      fVar397 = fVar397 - fVar268;
      fVar398 = fVar398 - fVar269;
      fVar399 = fVar399 - fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = fVar186 + fVar426;
      pfVar111[1] = fVar213 + fVar436;
      pfVar111[2] = fVar214 + fVar437;
      pfVar111[3] = fVar215 + fVar438;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar271 + fVar457;
      pfVar111[1] = fVar281 + fVar469;
      pfVar111[2] = fVar282 + fVar470;
      pfVar111[3] = fVar283 + fVar471;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar116;
      pfVar111[1] = fVar345 + fVar182;
      pfVar111[2] = fVar346 + fVar183;
      pfVar111[3] = fVar347 + fVar184;
      auVar226._0_4_ = fVar439 + fVar387;
      auVar226._4_4_ = fVar454 + fVar397;
      auVar226._8_4_ = fVar455 + fVar398;
      auVar226._12_4_ = fVar456 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar226;
      auVar354._0_4_ = fVar387 - fVar439;
      auVar354._4_4_ = fVar397 - fVar454;
      auVar354._8_4_ = fVar398 - fVar455;
      auVar354._12_4_ = fVar399 - fVar456;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar354;
      auVar316._0_4_ = fVar116 - fVar335;
      auVar316._4_4_ = fVar182 - fVar345;
      auVar316._8_4_ = fVar183 - fVar346;
      auVar316._12_4_ = fVar184 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar316;
      auVar288._0_4_ = fVar457 - fVar271;
      auVar288._4_4_ = fVar469 - fVar281;
      auVar288._8_4_ = fVar470 - fVar282;
      auVar288._12_4_ = fVar471 - fVar283;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar288;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      *pfVar111 = fVar426 - fVar186;
      pfVar111[1] = fVar436 - fVar213;
      pfVar111[2] = fVar437 - fVar214;
      pfVar111[3] = fVar438 - fVar215;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar147._0_12_ = ZEXT812(0x3c23d70a);
    auVar147._12_4_ = 0;
    auVar147._16_48_ = auVar185;
    compareBufferRelative(&local_130,&local_150,auVar147._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar149._0_8_ = std::ostream::flush();
  auVar149._8_56_ = extraout_var_07;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar149._0_16_ = ZEXT816(0);
      if (uVar114 < 0x18) {
        auVar148._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar148._8_56_ = extraout_var_08;
        auVar149._4_60_ = auVar148._4_60_;
        auVar149._0_4_ = (float)auVar148._0_8_;
      }
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar149._0_4_;
      local_130._buffer[uVar114] = auVar149._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    lVar113 = 0;
    fVar414 = (float)DAT_001c2600;
    fVar426 = DAT_001c2600._4_4_;
    fVar427 = (float)DAT_001c2630;
    fVar428 = DAT_001c2630._4_4_;
    fVar429 = DAT_001c2630._8_4_;
    fVar436 = DAT_001c2630._12_4_;
    fVar437 = (float)DAT_001c2640;
    fVar438 = DAT_001c2640._4_4_;
    fVar439 = DAT_001c2640._8_4_;
    fVar454 = DAT_001c2640._12_4_;
    fVar455 = (float)DAT_001c2650;
    fVar456 = DAT_001c2650._4_4_;
    fVar457 = DAT_001c2650._8_4_;
    fVar469 = DAT_001c2650._12_4_;
    fVar470 = (float)DAT_001c2660;
    fVar471 = DAT_001c2660._4_4_;
    fVar116 = DAT_001c2660._8_4_;
    fVar182 = DAT_001c2660._12_4_;
    do {
      fVar214 = (*(float *)((undefined1 *)local_150._buffer + lVar113) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar414;
      fVar215 = (*(float *)((undefined1 *)local_150._buffer + lVar113) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar426;
      fVar259 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar216 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar183 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 0xc);
      fVar184 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 4);
      fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 4);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 0xc);
      fVar260 = fVar213 * fVar470 + fVar186 * fVar455 + fVar184 * fVar437 + fVar183 * fVar427;
      fVar261 = fVar213 * fVar471 + fVar186 * fVar456 + fVar184 * fVar438 + fVar183 * fVar428;
      fVar262 = fVar213 * fVar116 + fVar186 * fVar457 + fVar184 * fVar439 + fVar183 * fVar429;
      fVar186 = fVar213 * fVar182 + fVar186 * fVar469 + fVar184 * fVar454 + fVar183 * fVar436;
      fVar183 = fVar259 + fVar215;
      fVar184 = fVar216 + fVar214;
      fVar214 = fVar214 - fVar216;
      fVar215 = fVar215 - fVar259;
      auVar122._0_4_ = fVar260 + fVar184;
      auVar122._4_4_ = fVar261 + fVar183;
      auVar122._8_4_ = fVar262 + fVar215;
      auVar122._12_4_ = fVar186 + fVar214;
      auVar149._0_16_ = auVar122;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar113) = auVar122;
      auVar227._4_4_ = fVar215 - fVar262;
      auVar227._0_4_ = fVar214 - fVar186;
      auVar227._8_4_ = fVar183 - fVar261;
      auVar227._12_4_ = fVar184 - fVar260;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113) =
           auVar227;
      lVar113 = lVar113 + 0x20;
    } while (lVar113 != 0x60);
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar284 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar306 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar307 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar308 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar309 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar332 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar333 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar334 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      auVar149._0_4_ =
           fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      auVar149._4_4_ =
           fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      auVar149._8_4_ =
           fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      auVar149._12_4_ =
           fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar335 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar345 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar346 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar347 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar349 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar381 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar383 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar385 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * fVar116;
      fVar397 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar398 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar399 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar284 + fVar271;
      fVar268 = fVar306 + fVar281;
      fVar269 = fVar307 + fVar282;
      fVar270 = fVar308 + fVar283;
      fVar271 = fVar271 - fVar284;
      fVar281 = fVar281 - fVar306;
      fVar282 = fVar282 - fVar307;
      fVar283 = fVar283 - fVar308;
      fVar186 = fVar309 + fVar387;
      fVar213 = fVar332 + fVar397;
      fVar214 = fVar333 + fVar398;
      fVar215 = fVar334 + fVar399;
      fVar387 = fVar387 - fVar309;
      fVar397 = fVar397 - fVar332;
      fVar398 = fVar398 - fVar333;
      fVar399 = fVar399 - fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = auVar149._0_4_ + fVar186;
      pfVar111[1] = auVar149._4_4_ + fVar213;
      pfVar111[2] = auVar149._8_4_ + fVar214;
      pfVar111[3] = auVar149._12_4_ + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar262;
      pfVar111[1] = fVar345 + fVar268;
      pfVar111[2] = fVar346 + fVar269;
      pfVar111[3] = fVar347 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar271;
      pfVar111[1] = fVar381 + fVar281;
      pfVar111[2] = fVar383 + fVar282;
      pfVar111[3] = fVar385 + fVar283;
      auVar228._0_4_ = fVar216 + fVar387;
      auVar228._4_4_ = fVar259 + fVar397;
      auVar228._8_4_ = fVar260 + fVar398;
      auVar228._12_4_ = fVar261 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar228;
      auVar355._0_4_ = fVar387 - fVar216;
      auVar355._4_4_ = fVar397 - fVar259;
      auVar355._8_4_ = fVar398 - fVar260;
      auVar355._12_4_ = fVar399 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar355;
      auVar317._0_4_ = fVar271 - fVar349;
      auVar317._4_4_ = fVar281 - fVar381;
      auVar317._8_4_ = fVar282 - fVar383;
      auVar317._12_4_ = fVar283 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar317;
      auVar289._0_4_ = fVar262 - fVar335;
      auVar289._4_4_ = fVar268 - fVar345;
      auVar289._8_4_ = fVar269 - fVar346;
      auVar289._12_4_ = fVar270 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar289;
      auVar192._0_4_ = fVar186 - auVar149._0_4_;
      auVar192._4_4_ = fVar213 - auVar149._4_4_;
      auVar192._8_4_ = fVar214 - auVar149._8_4_;
      auVar192._12_4_ = fVar215 - auVar149._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4)
           = auVar192;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar149._0_12_ = ZEXT812(0x3c23d70a);
    auVar149._12_4_ = 0.0;
    compareBufferRelative(&local_130,&local_150,auVar149._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar151._0_8_ = std::ostream::flush();
  auVar151._8_56_ = extraout_var_09;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar151._0_16_ = ZEXT816(0);
      if (uVar114 < 0x10) {
        auVar150._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar150._8_56_ = extraout_var_10;
        auVar151._4_60_ = auVar150._4_60_;
        auVar151._0_4_ = (float)auVar150._0_8_;
      }
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar151._0_4_;
      local_130._buffer[uVar114] = auVar151._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    lVar113 = 0;
    fVar414 = (float)DAT_001c2600;
    fVar426 = DAT_001c2600._4_4_;
    fVar427 = (float)DAT_001c2630;
    fVar428 = DAT_001c2630._4_4_;
    fVar429 = DAT_001c2630._8_4_;
    fVar436 = DAT_001c2630._12_4_;
    fVar437 = (float)DAT_001c2640;
    fVar438 = DAT_001c2640._4_4_;
    fVar439 = DAT_001c2640._8_4_;
    fVar454 = DAT_001c2640._12_4_;
    fVar455 = (float)DAT_001c2650;
    fVar456 = DAT_001c2650._4_4_;
    fVar457 = DAT_001c2650._8_4_;
    fVar469 = DAT_001c2650._12_4_;
    fVar470 = (float)DAT_001c2660;
    fVar471 = DAT_001c2660._4_4_;
    fVar116 = DAT_001c2660._8_4_;
    fVar182 = DAT_001c2660._12_4_;
    bVar106 = true;
    do {
      bVar107 = bVar106;
      fVar214 = (*(float *)((undefined1 *)local_150._buffer + lVar113) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar414;
      fVar215 = (*(float *)((undefined1 *)local_150._buffer + lVar113) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113)) *
                fVar426;
      fVar259 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar216 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar113 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar183 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 0xc);
      fVar184 = *(float *)((undefined1 *)local_150._buffer + lVar113 + 4);
      fVar186 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 4);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113 + 0xc);
      fVar260 = fVar213 * fVar470 + fVar186 * fVar455 + fVar184 * fVar437 + fVar183 * fVar427;
      fVar261 = fVar213 * fVar471 + fVar186 * fVar456 + fVar184 * fVar438 + fVar183 * fVar428;
      fVar262 = fVar213 * fVar116 + fVar186 * fVar457 + fVar184 * fVar439 + fVar183 * fVar429;
      fVar186 = fVar213 * fVar182 + fVar186 * fVar469 + fVar184 * fVar454 + fVar183 * fVar436;
      fVar183 = fVar259 + fVar215;
      fVar184 = fVar216 + fVar214;
      fVar214 = fVar214 - fVar216;
      fVar215 = fVar215 - fVar259;
      auVar123._0_4_ = fVar260 + fVar184;
      auVar123._4_4_ = fVar261 + fVar183;
      auVar123._8_4_ = fVar262 + fVar215;
      auVar123._12_4_ = fVar186 + fVar214;
      auVar151._0_16_ = auVar123;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar113) = auVar123;
      auVar229._4_4_ = fVar215 - fVar262;
      auVar229._0_4_ = fVar214 - fVar186;
      auVar229._8_4_ = fVar183 - fVar261;
      auVar229._12_4_ = fVar184 - fVar260;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar113) =
           auVar229;
      lVar113 = 0x20;
      bVar106 = false;
    } while (bVar107);
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar284 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar306 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar307 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar308 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar309 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar332 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar333 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar334 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      auVar151._0_4_ =
           fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      auVar151._4_4_ =
           fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      auVar151._8_4_ =
           fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      auVar151._12_4_ =
           fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar335 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar345 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar346 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar347 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar349 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar381 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar383 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar385 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar387 = (*pfVar111 + *pfVar9) * fVar116;
      fVar397 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar398 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar399 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar284 + fVar271;
      fVar268 = fVar306 + fVar281;
      fVar269 = fVar307 + fVar282;
      fVar270 = fVar308 + fVar283;
      fVar271 = fVar271 - fVar284;
      fVar281 = fVar281 - fVar306;
      fVar282 = fVar282 - fVar307;
      fVar283 = fVar283 - fVar308;
      fVar186 = fVar309 + fVar387;
      fVar213 = fVar332 + fVar397;
      fVar214 = fVar333 + fVar398;
      fVar215 = fVar334 + fVar399;
      fVar387 = fVar387 - fVar309;
      fVar397 = fVar397 - fVar332;
      fVar398 = fVar398 - fVar333;
      fVar399 = fVar399 - fVar334;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = auVar151._0_4_ + fVar186;
      pfVar111[1] = auVar151._4_4_ + fVar213;
      pfVar111[2] = auVar151._8_4_ + fVar214;
      pfVar111[3] = auVar151._12_4_ + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar335 + fVar262;
      pfVar111[1] = fVar345 + fVar268;
      pfVar111[2] = fVar346 + fVar269;
      pfVar111[3] = fVar347 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar271;
      pfVar111[1] = fVar381 + fVar281;
      pfVar111[2] = fVar383 + fVar282;
      pfVar111[3] = fVar385 + fVar283;
      auVar230._0_4_ = fVar216 + fVar387;
      auVar230._4_4_ = fVar259 + fVar397;
      auVar230._8_4_ = fVar260 + fVar398;
      auVar230._12_4_ = fVar261 + fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar230;
      auVar356._0_4_ = fVar387 - fVar216;
      auVar356._4_4_ = fVar397 - fVar259;
      auVar356._8_4_ = fVar398 - fVar260;
      auVar356._12_4_ = fVar399 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar356;
      auVar318._0_4_ = fVar271 - fVar349;
      auVar318._4_4_ = fVar281 - fVar381;
      auVar318._8_4_ = fVar282 - fVar383;
      auVar318._12_4_ = fVar283 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar318;
      auVar290._0_4_ = fVar262 - fVar335;
      auVar290._4_4_ = fVar268 - fVar345;
      auVar290._8_4_ = fVar269 - fVar346;
      auVar290._12_4_ = fVar270 - fVar347;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar290;
      auVar193._0_4_ = fVar186 - auVar151._0_4_;
      auVar193._4_4_ = fVar213 - auVar151._4_4_;
      auVar193._8_4_ = fVar214 - auVar151._8_4_;
      auVar193._12_4_ = fVar215 - auVar151._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4)
           = auVar193;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar151._0_12_ = ZEXT812(0x3c23d70a);
    auVar151._12_4_ = 0.0;
    compareBufferRelative(&local_130,&local_150,auVar151._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar153._0_8_ = std::ostream::flush();
  auVar153._8_56_ = extraout_var_11;
  iVar112 = 0;
  do {
    uVar114 = 0;
    do {
      auVar153._0_16_ = ZEXT816(0);
      if (uVar114 < 8) {
        auVar152._0_8_ = (double)Imath_3_2::erand48(local_136);
        auVar152._8_56_ = extraout_var_12;
        auVar153._4_60_ = auVar152._4_60_;
        auVar153._0_4_ = (float)auVar152._0_8_;
      }
      auVar185 = auVar153._16_48_;
      *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar153._0_4_;
      local_130._buffer[uVar114] = auVar153._0_4_;
      uVar114 = uVar114 + 1;
    } while (uVar114 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
    fVar429 = (*(float *)(undefined1 *)local_150._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar436 = (*(float *)(undefined1 *)local_150._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar438 = *(float *)((undefined1 *)local_150._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.46193984;
    fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_150._buffer + 8) * 0.46193984;
    fVar414 = *(float *)((undefined1 *)local_150._buffer + 0xc);
    fVar426 = *(float *)((undefined1 *)local_150._buffer + 4);
    fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
    fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
    fVar439 = fVar428 * 0.097545706 +
              fVar427 * 0.27778545 + fVar426 * 0.49039266 + fVar414 * 0.41573495;
    fVar454 = fVar428 * -0.27778545 +
              fVar427 * -0.49039266 + fVar426 * 0.41573495 + fVar414 * -0.097545706;
    fVar455 = fVar428 * 0.41573495 +
              fVar427 * 0.097545706 + fVar426 * 0.27778545 + fVar414 * -0.49039266;
    fVar427 = fVar428 * -0.49039266 +
              fVar427 * 0.41573495 + fVar426 * 0.097545706 + fVar414 * -0.27778545;
    fVar414 = fVar438 + fVar436;
    fVar426 = fVar437 + fVar429;
    fVar429 = fVar429 - fVar437;
    fVar436 = fVar436 - fVar438;
    *(float *)(undefined1 *)local_150._buffer = fVar439 + fVar426;
    *(float *)((undefined1 *)local_150._buffer + 4) = fVar454 + fVar414;
    *(float *)((undefined1 *)local_150._buffer + 8) = fVar455 + fVar436;
    *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar427 + fVar429;
    auVar231._4_4_ = fVar436 - fVar455;
    auVar231._0_4_ = fVar429 - fVar427;
    auVar231._8_4_ = fVar414 - fVar454;
    auVar231._12_4_ = fVar426 - fVar439;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar231;
    lVar113 = -8;
    fVar439 = (float)DAT_001c2690;
    fVar454 = DAT_001c2690._4_4_;
    fVar455 = DAT_001c2690._8_4_;
    fVar456 = DAT_001c2690._12_4_;
    fVar457 = (float)DAT_001c26c0;
    fVar469 = DAT_001c26c0._4_4_;
    fVar470 = DAT_001c26c0._8_4_;
    fVar471 = DAT_001c26c0._12_4_;
    fVar414 = (float)DAT_001c26e0;
    fVar426 = DAT_001c26e0._4_4_;
    fVar427 = DAT_001c26e0._8_4_;
    fVar428 = DAT_001c26e0._12_4_;
    fVar429 = (float)DAT_001c26f0;
    fVar436 = DAT_001c26f0._4_4_;
    fVar437 = DAT_001c26f0._8_4_;
    fVar438 = DAT_001c26f0._12_4_;
    fVar116 = (float)DAT_001c2700;
    fVar182 = DAT_001c2700._4_4_;
    fVar183 = DAT_001c2700._8_4_;
    fVar184 = DAT_001c2700._12_4_;
    do {
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      fVar186 = *pfVar111;
      fVar213 = pfVar111[1];
      fVar214 = pfVar111[2];
      fVar215 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4);
      fVar216 = *pfVar9;
      fVar259 = pfVar9[1];
      fVar260 = pfVar9[2];
      fVar261 = pfVar9[3];
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4);
      fVar309 = *pfVar111 * 0.19134216 - *pfVar9 * 0.46193984;
      fVar332 = pfVar111[1] * 0.19134216 - pfVar9[1] * 0.46193984;
      fVar333 = pfVar111[2] * 0.19134216 - pfVar9[2] * 0.46193984;
      fVar334 = pfVar111[3] * 0.19134216 - pfVar9[3] * 0.46193984;
      fVar335 = *pfVar9 * 0.19134216 + *pfVar111 * 0.46193984;
      fVar345 = pfVar9[1] * 0.19134216 + pfVar111[1] * 0.46193984;
      fVar346 = pfVar9[2] * 0.19134216 + pfVar111[2] * 0.46193984;
      fVar347 = pfVar9[3] * 0.19134216 + pfVar111[3] * 0.46193984;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4);
      fVar262 = *pfVar111;
      fVar268 = pfVar111[1];
      fVar269 = pfVar111[2];
      fVar270 = pfVar111[3];
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      fVar271 = *pfVar111;
      fVar281 = pfVar111[1];
      fVar282 = pfVar111[2];
      fVar283 = pfVar111[3];
      fVar284 = fVar271 * fVar457 + fVar262 * 0.27778545 + fVar186 * 0.49039266 + fVar216 * fVar439;
      fVar306 = fVar281 * fVar469 + fVar268 * 0.27778545 + fVar213 * 0.49039266 + fVar259 * fVar454;
      fVar307 = fVar282 * fVar470 + fVar269 * 0.27778545 + fVar214 * 0.49039266 + fVar260 * fVar455;
      fVar308 = fVar283 * fVar471 + fVar270 * 0.27778545 + fVar215 * 0.49039266 + fVar261 * fVar456;
      fVar349 = fVar271 * fVar429 + fVar262 * fVar414 + fVar186 * fVar439 + fVar216 * -0.097545706;
      fVar381 = fVar281 * fVar436 + fVar268 * fVar426 + fVar213 * fVar454 + fVar259 * -0.097545706;
      fVar383 = fVar282 * fVar437 + fVar269 * fVar427 + fVar214 * fVar455 + fVar260 * -0.097545706;
      fVar385 = fVar283 * fVar438 + fVar270 * fVar428 + fVar215 * fVar456 + fVar261 * -0.097545706;
      fVar387 = fVar271 * fVar439 + fVar262 * fVar457 + fVar186 * 0.27778545 + fVar216 * fVar414;
      fVar397 = fVar281 * fVar454 + fVar268 * fVar469 + fVar213 * 0.27778545 + fVar259 * fVar426;
      fVar398 = fVar282 * fVar455 + fVar269 * fVar470 + fVar214 * 0.27778545 + fVar260 * fVar427;
      fVar399 = fVar283 * fVar456 + fVar270 * fVar471 + fVar215 * 0.27778545 + fVar261 * fVar428;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      fVar216 = fVar271 * fVar414 + fVar262 * fVar439 + fVar186 * fVar457 + fVar216 * fVar429;
      fVar259 = fVar281 * fVar426 + fVar268 * fVar454 + fVar213 * fVar469 + fVar259 * fVar436;
      fVar260 = fVar282 * fVar427 + fVar269 * fVar455 + fVar214 * fVar470 + fVar260 * fVar437;
      fVar261 = fVar283 * fVar428 + fVar270 * fVar456 + fVar215 * fVar471 + fVar261 * fVar438;
      pfVar9 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4);
      fVar350 = (*pfVar111 + *pfVar9) * fVar116;
      fVar382 = (pfVar111[1] + pfVar9[1]) * fVar182;
      fVar384 = (pfVar111[2] + pfVar9[2]) * fVar183;
      fVar386 = (pfVar111[3] + pfVar9[3]) * fVar184;
      fVar271 = (*pfVar111 - *pfVar9) * fVar116;
      fVar281 = (pfVar111[1] - pfVar9[1]) * fVar182;
      fVar282 = (pfVar111[2] - pfVar9[2]) * fVar183;
      fVar283 = (pfVar111[3] - pfVar9[3]) * fVar184;
      fVar262 = fVar309 + fVar271;
      fVar268 = fVar332 + fVar281;
      fVar269 = fVar333 + fVar282;
      fVar270 = fVar334 + fVar283;
      fVar271 = fVar271 - fVar309;
      fVar281 = fVar281 - fVar332;
      fVar282 = fVar282 - fVar333;
      fVar283 = fVar283 - fVar334;
      fVar186 = fVar335 + fVar350;
      fVar213 = fVar345 + fVar382;
      fVar214 = fVar346 + fVar384;
      fVar215 = fVar347 + fVar386;
      fVar350 = fVar350 - fVar335;
      fVar382 = fVar382 - fVar345;
      fVar384 = fVar384 - fVar346;
      fVar386 = fVar386 - fVar347;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar113 * 4);
      *pfVar111 = fVar284 + fVar186;
      pfVar111[1] = fVar306 + fVar213;
      pfVar111[2] = fVar307 + fVar214;
      pfVar111[3] = fVar308 + fVar215;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar113 * 4);
      *pfVar111 = fVar349 + fVar262;
      pfVar111[1] = fVar381 + fVar268;
      pfVar111[2] = fVar383 + fVar269;
      pfVar111[3] = fVar385 + fVar270;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar113 * 4);
      *pfVar111 = fVar387 + fVar271;
      pfVar111[1] = fVar397 + fVar281;
      pfVar111[2] = fVar398 + fVar282;
      pfVar111[3] = fVar399 + fVar283;
      auVar232._0_4_ = fVar216 + fVar350;
      auVar232._4_4_ = fVar259 + fVar382;
      auVar232._8_4_ = fVar260 + fVar384;
      auVar232._12_4_ = fVar261 + fVar386;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar113 * 4) =
           auVar232;
      auVar357._0_4_ = fVar350 - fVar216;
      auVar357._4_4_ = fVar382 - fVar259;
      auVar357._8_4_ = fVar384 - fVar260;
      auVar357._12_4_ = fVar386 - fVar261;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar113 * 4) =
           auVar357;
      auVar319._0_4_ = fVar271 - fVar387;
      auVar319._4_4_ = fVar281 - fVar397;
      auVar319._8_4_ = fVar282 - fVar398;
      auVar319._12_4_ = fVar283 - fVar399;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar113 * 4) =
           auVar319;
      auVar291._0_4_ = fVar262 - fVar349;
      auVar291._4_4_ = fVar268 - fVar381;
      auVar291._8_4_ = fVar269 - fVar383;
      auVar291._12_4_ = fVar270 - fVar385;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar113 * 4) =
           auVar291;
      pfVar111 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar113 * 4);
      *pfVar111 = fVar186 - fVar284;
      pfVar111[1] = fVar213 - fVar306;
      pfVar111[2] = fVar214 - fVar307;
      pfVar111[3] = fVar215 - fVar308;
      lVar113 = lVar113 + 4;
    } while (lVar113 != 0);
    auVar153._0_12_ = ZEXT812(0x3c23d70a);
    auVar153._12_4_ = 0;
    auVar153._16_48_ = auVar185;
    compareBufferRelative(&local_130,&local_150,auVar153._0_4_,1e-06);
    iVar112 = iVar112 + 1;
  } while (iVar112 != 1000000);
  Imf_3_2::CpuId::CpuId(local_87);
  if (local_87[0] == (CpuId)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Inverse, SSE2: ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    iVar112 = 0;
    do {
      lVar113 = 0;
      do {
        dVar117 = (double)Imath_3_2::erand48(local_136);
        *(float *)((undefined1 *)local_150._buffer + lVar113 * 4) = (float)dVar117;
        local_130._buffer[lVar113] = (float)dVar117;
        lVar113 = lVar113 + 1;
      } while (lVar113 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar233._0_4_ = fVar439 + fVar428;
      auVar233._4_4_ = fVar454 + fVar436;
      auVar233._8_4_ = fVar455 + fVar438;
      auVar233._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = auVar233;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar234._0_4_ = fVar457 + fVar271;
        auVar234._4_4_ = fVar469 + fVar281;
        auVar234._8_4_ = fVar470 + fVar282;
        auVar234._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar234;
        auVar358._0_4_ = fVar271 - fVar457;
        auVar358._4_4_ = fVar281 - fVar469;
        auVar358._8_4_ = fVar282 - fVar470;
        auVar358._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar358;
        auVar320._0_4_ = fVar216 - fVar262;
        auVar320._4_4_ = fVar259 - fVar268;
        auVar320._8_4_ = fVar260 - fVar269;
        auVar320._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar320;
        auVar292._0_4_ = fVar186 - fVar116;
        auVar292._4_4_ = fVar213 - fVar182;
        auVar292._8_4_ = fVar214 - fVar183;
        auVar292._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar292;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      compareBufferRelative(&local_130,&local_150,0.01,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar155._0_8_ = std::ostream::flush();
    auVar155._8_56_ = extraout_var_13;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar155._0_16_ = ZEXT816(0);
        if (uVar114 < 0x38) {
          auVar154._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar154._8_56_ = extraout_var_14;
          auVar155._4_60_ = auVar154._4_60_;
          auVar155._0_4_ = (float)auVar154._0_8_;
        }
        auVar185 = auVar155._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar155._0_4_;
        local_130._buffer[uVar114] = auVar155._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar235._0_4_ = fVar439 + fVar428;
      auVar235._4_4_ = fVar454 + fVar436;
      auVar235._8_4_ = fVar455 + fVar438;
      auVar235._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = auVar235;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar236._0_4_ = fVar457 + fVar271;
        auVar236._4_4_ = fVar469 + fVar281;
        auVar236._8_4_ = fVar470 + fVar282;
        auVar236._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar236;
        auVar359._0_4_ = fVar271 - fVar457;
        auVar359._4_4_ = fVar281 - fVar469;
        auVar359._8_4_ = fVar282 - fVar470;
        auVar359._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar359;
        auVar321._0_4_ = fVar216 - fVar262;
        auVar321._4_4_ = fVar259 - fVar268;
        auVar321._8_4_ = fVar260 - fVar269;
        auVar321._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar321;
        auVar293._0_4_ = fVar186 - fVar116;
        auVar293._4_4_ = fVar213 - fVar182;
        auVar293._8_4_ = fVar214 - fVar183;
        auVar293._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar293;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar155._0_12_ = ZEXT812(0x3c23d70a);
      auVar155._12_4_ = 0;
      auVar155._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar155._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar157._0_8_ = std::ostream::flush();
    auVar157._8_56_ = extraout_var_15;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar157._0_16_ = ZEXT816(0);
        if (uVar114 < 0x30) {
          auVar156._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar156._8_56_ = extraout_var_16;
          auVar157._4_60_ = auVar156._4_60_;
          auVar157._0_4_ = (float)auVar156._0_8_;
        }
        auVar185 = auVar157._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar157._0_4_;
        local_130._buffer[uVar114] = auVar157._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar237._0_4_ = fVar439 + fVar428;
      auVar237._4_4_ = fVar454 + fVar436;
      auVar237._8_4_ = fVar455 + fVar438;
      auVar237._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = auVar237;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar238._0_4_ = fVar457 + fVar271;
        auVar238._4_4_ = fVar469 + fVar281;
        auVar238._8_4_ = fVar470 + fVar282;
        auVar238._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar238;
        auVar360._0_4_ = fVar271 - fVar457;
        auVar360._4_4_ = fVar281 - fVar469;
        auVar360._8_4_ = fVar282 - fVar470;
        auVar360._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar360;
        auVar322._0_4_ = fVar216 - fVar262;
        auVar322._4_4_ = fVar259 - fVar268;
        auVar322._8_4_ = fVar260 - fVar269;
        auVar322._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar322;
        auVar294._0_4_ = fVar186 - fVar116;
        auVar294._4_4_ = fVar213 - fVar182;
        auVar294._8_4_ = fVar214 - fVar183;
        auVar294._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar294;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar157._0_12_ = ZEXT812(0x3c23d70a);
      auVar157._12_4_ = 0;
      auVar157._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar157._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar159._0_8_ = std::ostream::flush();
    auVar159._8_56_ = extraout_var_17;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar114 < 0x28) {
          auVar158._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar158._8_56_ = extraout_var_18;
          auVar159._4_60_ = auVar158._4_60_;
          auVar159._0_4_ = (float)auVar158._0_8_;
        }
        auVar185 = auVar159._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar159._0_4_;
        local_130._buffer[uVar114] = auVar159._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar239._0_4_ = fVar439 + fVar428;
      auVar239._4_4_ = fVar454 + fVar436;
      auVar239._8_4_ = fVar455 + fVar438;
      auVar239._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x80) = auVar239;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar240._0_4_ = fVar457 + fVar271;
        auVar240._4_4_ = fVar469 + fVar281;
        auVar240._8_4_ = fVar470 + fVar282;
        auVar240._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar240;
        auVar361._0_4_ = fVar271 - fVar457;
        auVar361._4_4_ = fVar281 - fVar469;
        auVar361._8_4_ = fVar282 - fVar470;
        auVar361._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar361;
        auVar323._0_4_ = fVar216 - fVar262;
        auVar323._4_4_ = fVar259 - fVar268;
        auVar323._8_4_ = fVar260 - fVar269;
        auVar323._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar323;
        auVar295._0_4_ = fVar186 - fVar116;
        auVar295._4_4_ = fVar213 - fVar182;
        auVar295._8_4_ = fVar214 - fVar183;
        auVar295._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar295;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      auVar159._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar159._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar161._0_8_ = std::ostream::flush();
    auVar161._8_56_ = extraout_var_19;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar161._0_16_ = ZEXT816(0);
        if (uVar114 < 0x20) {
          auVar160._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar160._8_56_ = extraout_var_20;
          auVar161._4_60_ = auVar160._4_60_;
          auVar161._0_4_ = (float)auVar160._0_8_;
        }
        auVar185 = auVar161._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar161._0_4_;
        local_130._buffer[uVar114] = auVar161._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar439 + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar454 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar455 + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar241._0_4_ = fVar439 + fVar428;
      auVar241._4_4_ = fVar454 + fVar436;
      auVar241._8_4_ = fVar455 + fVar438;
      auVar241._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x60) = auVar241;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar242._0_4_ = fVar457 + fVar271;
        auVar242._4_4_ = fVar469 + fVar281;
        auVar242._8_4_ = fVar470 + fVar282;
        auVar242._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar242;
        auVar362._0_4_ = fVar271 - fVar457;
        auVar362._4_4_ = fVar281 - fVar469;
        auVar362._8_4_ = fVar282 - fVar470;
        auVar362._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar362;
        auVar324._0_4_ = fVar216 - fVar262;
        auVar324._4_4_ = fVar259 - fVar268;
        auVar324._8_4_ = fVar260 - fVar269;
        auVar324._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar324;
        auVar296._0_4_ = fVar186 - fVar116;
        auVar296._4_4_ = fVar213 - fVar182;
        auVar296._8_4_ = fVar214 - fVar183;
        auVar296._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar296;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar161._0_12_ = ZEXT812(0x3c23d70a);
      auVar161._12_4_ = 0;
      auVar161._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar161._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar163._0_8_ = std::ostream::flush();
    auVar163._8_56_ = extraout_var_21;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar163._0_16_ = ZEXT816(0);
        if (uVar114 < 0x18) {
          auVar162._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar162._8_56_ = extraout_var_22;
          auVar163._4_60_ = auVar162._4_60_;
          auVar163._0_4_ = (float)auVar162._0_8_;
        }
        auVar185 = auVar163._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar163._0_4_;
        local_130._buffer[uVar114] = auVar163._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar426 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar429 + fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar414 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      fVar414 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar438 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar439 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar454 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar455 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar426 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar428 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar436 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar438 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      auVar243._0_4_ = fVar439 + fVar428;
      auVar243._4_4_ = fVar454 + fVar436;
      auVar243._8_4_ = fVar455 + fVar438;
      auVar243._12_4_ = fVar426 + fVar414;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x40) = auVar243;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar426 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar455 - fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar454 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar439 - fVar428;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar244._0_4_ = fVar457 + fVar271;
        auVar244._4_4_ = fVar469 + fVar281;
        auVar244._8_4_ = fVar470 + fVar282;
        auVar244._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar244;
        auVar363._0_4_ = fVar271 - fVar457;
        auVar363._4_4_ = fVar281 - fVar469;
        auVar363._8_4_ = fVar282 - fVar470;
        auVar363._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar363;
        auVar325._0_4_ = fVar216 - fVar262;
        auVar325._4_4_ = fVar259 - fVar268;
        auVar325._8_4_ = fVar260 - fVar269;
        auVar325._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar325;
        auVar297._0_4_ = fVar186 - fVar116;
        auVar297._4_4_ = fVar213 - fVar182;
        auVar297._8_4_ = fVar214 - fVar183;
        auVar297._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar297;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar163._0_12_ = ZEXT812(0x3c23d70a);
      auVar163._12_4_ = 0;
      auVar163._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar163._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar165._0_8_ = std::ostream::flush();
    auVar165._8_56_ = extraout_var_23;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar165._0_16_ = ZEXT816(0);
        if (uVar114 < 0x10) {
          auVar164._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar164._8_56_ = extraout_var_24;
          auVar165._4_60_ = auVar164._4_60_;
          auVar165._0_4_ = (float)auVar164._0_8_;
        }
        auVar185 = auVar165._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar165._0_4_;
        local_130._buffer[uVar114] = auVar165._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar184 = (float)DAT_001c2710;
      fVar186 = DAT_001c2710._4_4_;
      fVar213 = DAT_001c2710._8_4_;
      fVar214 = DAT_001c2710._12_4_;
      fVar438 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar215 = (float)DAT_001c2720;
      fVar216 = DAT_001c2720._4_4_;
      fVar259 = DAT_001c2720._8_4_;
      fVar260 = DAT_001c2720._12_4_;
      fVar261 = (float)DAT_001c2730;
      fVar262 = DAT_001c2730._4_4_;
      fVar268 = DAT_001c2730._8_4_;
      fVar269 = DAT_001c2730._12_4_;
      fVar457 = fVar438 + fVar426 * fVar184 + fVar428 * fVar215 + fVar436 * fVar261;
      fVar469 = fVar438 + fVar426 * fVar186 + fVar428 * fVar216 + fVar436 * fVar262;
      fVar470 = fVar438 + fVar426 * fVar213 + fVar428 * fVar259 + fVar436 * fVar268;
      fVar471 = fVar438 + fVar426 * fVar214 + fVar428 * fVar260 + fVar436 * fVar269;
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar428 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar438 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar270 = (float)DAT_001c2740;
      fVar271 = DAT_001c2740._4_4_;
      fVar281 = DAT_001c2740._8_4_;
      fVar282 = DAT_001c2740._12_4_;
      fVar283 = (float)DAT_001c2750;
      fVar284 = DAT_001c2750._4_4_;
      fVar306 = DAT_001c2750._8_4_;
      fVar307 = DAT_001c2750._12_4_;
      fVar308 = (float)DAT_001c2760;
      fVar309 = DAT_001c2760._4_4_;
      fVar332 = DAT_001c2760._8_4_;
      fVar333 = DAT_001c2760._12_4_;
      fVar439 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar456 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar334 = (float)DAT_001c2770;
      fVar335 = DAT_001c2770._4_4_;
      fVar345 = DAT_001c2770._8_4_;
      fVar346 = DAT_001c2770._12_4_;
      fVar116 = fVar414 * fVar270 + 0.0 + fVar427 * fVar283 + fVar429 * fVar308 + fVar437 * fVar334;
      fVar182 = fVar414 * fVar271 + 0.0 + fVar427 * fVar284 + fVar429 * fVar309 + fVar437 * fVar335;
      fVar183 = fVar414 * fVar281 + 0.0 + fVar427 * fVar306 + fVar429 * fVar332 + fVar437 * fVar345;
      fVar414 = fVar414 * fVar282 + 0.0 + fVar427 * fVar307 + fVar429 * fVar333 + fVar437 * fVar346;
      *(float *)(undefined1 *)local_150._buffer = fVar457 + fVar116;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar469 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar470 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar471 + fVar414;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar471 - fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar470 - fVar183;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar469 - fVar182;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar457 - fVar116;
      fVar414 = fVar426 * 0.3535536 + 0.0;
      fVar426 = fVar414 + fVar436 * fVar184 + fVar439 * fVar215 + fVar455 * fVar261;
      fVar427 = fVar414 + fVar436 * fVar186 + fVar439 * fVar216 + fVar455 * fVar262;
      fVar429 = fVar414 + fVar436 * fVar213 + fVar439 * fVar259 + fVar455 * fVar268;
      fVar414 = fVar414 + fVar436 * fVar214 + fVar439 * fVar260 + fVar455 * fVar269;
      fVar436 = fVar428 * fVar270 + 0.0 + fVar438 * fVar283 + fVar454 * fVar308 + fVar456 * fVar334;
      fVar437 = fVar428 * fVar271 + 0.0 + fVar438 * fVar284 + fVar454 * fVar309 + fVar456 * fVar335;
      fVar439 = fVar428 * fVar281 + 0.0 + fVar438 * fVar306 + fVar454 * fVar332 + fVar456 * fVar345;
      fVar428 = fVar428 * fVar282 + 0.0 + fVar438 * fVar307 + fVar454 * fVar333 + fVar456 * fVar346;
      auVar245._0_4_ = fVar426 + fVar436;
      auVar245._4_4_ = fVar427 + fVar437;
      auVar245._8_4_ = fVar429 + fVar439;
      auVar245._12_4_ = fVar414 + fVar428;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar245;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar414 - fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar426 - fVar436;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar246._0_4_ = fVar457 + fVar271;
        auVar246._4_4_ = fVar469 + fVar281;
        auVar246._8_4_ = fVar470 + fVar282;
        auVar246._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar246;
        auVar364._0_4_ = fVar271 - fVar457;
        auVar364._4_4_ = fVar281 - fVar469;
        auVar364._8_4_ = fVar282 - fVar470;
        auVar364._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar364;
        auVar326._0_4_ = fVar216 - fVar262;
        auVar326._4_4_ = fVar259 - fVar268;
        auVar326._8_4_ = fVar260 - fVar269;
        auVar326._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar326;
        auVar298._0_4_ = fVar186 - fVar116;
        auVar298._4_4_ = fVar213 - fVar182;
        auVar298._8_4_ = fVar214 - fVar183;
        auVar298._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar298;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar165._0_12_ = ZEXT812(0x3c23d70a);
      auVar165._12_4_ = 0;
      auVar165._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar165._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar167._0_8_ = std::ostream::flush();
    auVar167._8_56_ = extraout_var_25;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar167._0_16_ = ZEXT816(0);
        if (uVar114 < 8) {
          auVar166._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar166._8_56_ = extraout_var_26;
          auVar167._4_60_ = auVar166._4_60_;
          auVar167._0_4_ = (float)auVar166._0_8_;
        }
        auVar185 = auVar167._16_48_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar167._0_4_;
        local_130._buffer[uVar114] = auVar167._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      fVar414 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar426 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar427 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar428 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar429 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar438 = fVar437 * 0.09754573 +
                fVar429 * 0.2777855 + fVar427 * 0.4157349 + fVar414 * 0.4903927 + 0.0;
      fVar439 = fVar437 * -0.2777855 +
                fVar429 * -0.4903927 + fVar427 * -0.09754573 + fVar414 * 0.4157349 + 0.0;
      fVar454 = fVar437 * 0.4157349 +
                fVar429 * 0.09754573 + fVar427 * -0.4903927 + fVar414 * 0.2777855 + 0.0;
      fVar455 = fVar437 * -0.4903927 +
                fVar429 * 0.4157349 + fVar427 * -0.2777855 + fVar414 * 0.09754573 + 0.0;
      fVar414 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar427 = fVar414 + fVar426 * 0.4619398 + fVar428 * 0.3535536 + fVar436 * 0.1913422;
      fVar429 = fVar414 + fVar426 * 0.1913422 + fVar428 * -0.3535536 + fVar436 * -0.4619398;
      fVar437 = fVar414 + fVar426 * -0.1913422 + fVar428 * -0.3535536 + fVar436 * 0.4619398;
      fVar414 = fVar414 + fVar426 * -0.4619398 + fVar428 * 0.3535536 + fVar436 * -0.1913422;
      auVar247._0_4_ = fVar427 + fVar438;
      auVar247._4_4_ = fVar429 + fVar439;
      auVar247._8_4_ = fVar437 + fVar454;
      auVar247._12_4_ = fVar414 + fVar455;
      *(undefined1 (*) [16])local_150._buffer = auVar247;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar414 - fVar455;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar437 - fVar454;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar429 - fVar439;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar427 - fVar438;
      lVar113 = 0;
      bVar106 = true;
      do {
        bVar107 = bVar106;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar113 * 0x10);
        lVar110 = 0;
        do {
          uVar91 = *(undefined8 *)((long)(*pauVar1 + lVar110 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar110) = *(undefined8 *)(*pauVar1 + lVar110 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar110) = uVar91;
          lVar110 = lVar110 + 0x10;
        } while (lVar110 != 0x80);
        fVar429 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar436 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar437 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar438 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar439 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar454 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar455 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar456 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar457 = (float)DAT_001c27a0;
        fVar469 = DAT_001c27a0._4_4_;
        fVar470 = DAT_001c27a0._8_4_;
        fVar471 = DAT_001c27a0._12_4_;
        fVar186 = (float)DAT_001c27b0;
        fVar213 = DAT_001c27b0._4_4_;
        fVar214 = DAT_001c27b0._8_4_;
        fVar215 = DAT_001c27b0._12_4_;
        fVar216 = (float)DAT_001c27c0;
        fVar259 = DAT_001c27c0._4_4_;
        fVar260 = DAT_001c27c0._8_4_;
        fVar261 = DAT_001c27c0._12_4_;
        fVar271 = (float)DAT_001c27d0;
        fVar281 = DAT_001c27d0._4_4_;
        fVar282 = DAT_001c27d0._8_4_;
        fVar283 = DAT_001c27d0._12_4_;
        fVar414 = local_b0 * fVar271 + local_d0 * fVar216 + local_f0 * fVar186 + local_110 * fVar457
        ;
        fVar426 = fStack_ac * fVar281 + fStack_cc * fVar259 +
                  fStack_ec * fVar213 + fStack_10c * fVar469;
        fVar427 = fStack_a8 * fVar282 + fStack_c8 * fVar260 +
                  fStack_e8 * fVar214 + fStack_108 * fVar470;
        fVar428 = fStack_a4 * fVar283 + fStack_c4 * fVar261 +
                  fStack_e4 * fVar215 + fStack_104 * fVar471;
        fVar116 = (local_110 * fVar186 - local_f0 * fVar271) -
                  (local_b0 * fVar216 + local_d0 * fVar457);
        fVar182 = (fStack_10c * fVar213 - fStack_ec * fVar281) -
                  (fStack_ac * fVar259 + fStack_cc * fVar469);
        fVar183 = (fStack_108 * fVar214 - fStack_e8 * fVar282) -
                  (fStack_a8 * fVar260 + fStack_c8 * fVar470);
        fVar184 = (fStack_104 * fVar215 - fStack_e4 * fVar283) -
                  (fStack_a4 * fVar261 + fStack_c4 * fVar471);
        fVar262 = local_b0 * fVar186 + local_d0 * fVar271 +
                  (local_110 * fVar216 - local_f0 * fVar457);
        fVar268 = fStack_ac * fVar213 + fStack_cc * fVar281 +
                  (fStack_10c * fVar259 - fStack_ec * fVar469);
        fVar269 = fStack_a8 * fVar214 + fStack_c8 * fVar282 +
                  (fStack_108 * fVar260 - fStack_e8 * fVar470);
        fVar270 = fStack_a4 * fVar215 + fStack_c4 * fVar283 +
                  (fStack_104 * fVar261 - fStack_e4 * fVar471);
        fVar457 = (local_d0 * fVar186 - local_b0 * fVar457) +
                  (local_110 * fVar271 - local_f0 * fVar216);
        fVar469 = (fStack_cc * fVar213 - fStack_ac * fVar469) +
                  (fStack_10c * fVar281 - fStack_ec * fVar259);
        fVar470 = (fStack_c8 * fVar214 - fStack_a8 * fVar470) +
                  (fStack_108 * fVar282 - fStack_e8 * fVar260);
        fVar471 = (fStack_c4 * fVar215 - fStack_a4 * fVar471) +
                  (fStack_104 * fVar283 - fStack_e4 * fVar261);
        fVar271 = (local_120 + local_e0) * (float)DAT_001c27e0;
        fVar281 = (fStack_11c + fStack_dc) * DAT_001c27e0._4_4_;
        fVar282 = (fStack_118 + fStack_d8) * DAT_001c27e0._8_4_;
        fVar283 = (fStack_114 + fStack_d4) * DAT_001c27e0._12_4_;
        fVar216 = (local_120 - local_e0) * (float)DAT_001c27e0;
        fVar259 = (fStack_11c - fStack_dc) * DAT_001c27e0._4_4_;
        fVar260 = (fStack_118 - fStack_d8) * DAT_001c27e0._8_4_;
        fVar261 = (fStack_114 - fStack_d4) * DAT_001c27e0._12_4_;
        fVar186 = fVar429 + fVar216;
        fVar213 = fVar436 + fVar259;
        fVar214 = fVar437 + fVar260;
        fVar215 = fVar438 + fVar261;
        fVar216 = fVar216 - fVar429;
        fVar259 = fVar259 - fVar436;
        fVar260 = fVar260 - fVar437;
        fVar261 = fVar261 - fVar438;
        fVar429 = fVar439 + fVar271;
        fVar436 = fVar454 + fVar281;
        fVar437 = fVar455 + fVar282;
        fVar438 = fVar456 + fVar283;
        fVar271 = fVar271 - fVar439;
        fVar281 = fVar281 - fVar454;
        fVar282 = fVar282 - fVar455;
        fVar283 = fVar283 - fVar456;
        *(float *)*pauVar1 = fVar414 + fVar429;
        *(float *)(*pauVar1 + 4) = fVar426 + fVar436;
        *(float *)(*pauVar1 + 8) = fVar427 + fVar437;
        *(float *)(*pauVar1 + 0xc) = fVar428 + fVar438;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 2) * 0x10);
        *(float *)*pauVar1 = fVar116 + fVar186;
        *(float *)(*pauVar1 + 4) = fVar182 + fVar213;
        *(float *)(*pauVar1 + 8) = fVar183 + fVar214;
        *(float *)(*pauVar1 + 0xc) = fVar184 + fVar215;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 4) * 0x10);
        *(float *)*pauVar1 = fVar262 + fVar216;
        *(float *)(*pauVar1 + 4) = fVar268 + fVar259;
        *(float *)(*pauVar1 + 8) = fVar269 + fVar260;
        *(float *)(*pauVar1 + 0xc) = fVar270 + fVar261;
        auVar248._0_4_ = fVar457 + fVar271;
        auVar248._4_4_ = fVar469 + fVar281;
        auVar248._8_4_ = fVar470 + fVar282;
        auVar248._12_4_ = fVar471 + fVar283;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 6) * 0x10) = auVar248;
        auVar365._0_4_ = fVar271 - fVar457;
        auVar365._4_4_ = fVar281 - fVar469;
        auVar365._8_4_ = fVar282 - fVar470;
        auVar365._12_4_ = fVar283 - fVar471;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 8) * 0x10) = auVar365;
        auVar327._0_4_ = fVar216 - fVar262;
        auVar327._4_4_ = fVar259 - fVar268;
        auVar327._8_4_ = fVar260 - fVar269;
        auVar327._12_4_ = fVar261 - fVar270;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 10) * 0x10) = auVar327;
        auVar299._0_4_ = fVar186 - fVar116;
        auVar299._4_4_ = fVar213 - fVar182;
        auVar299._8_4_ = fVar214 - fVar183;
        auVar299._12_4_ = fVar215 - fVar184;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xc) * 0x10) = auVar299;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar113 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar429 - fVar414;
        *(float *)(*pauVar1 + 4) = fVar436 - fVar426;
        *(float *)(*pauVar1 + 8) = fVar437 - fVar427;
        *(float *)(*pauVar1 + 0xc) = fVar438 - fVar428;
        lVar113 = 1;
        bVar106 = false;
      } while (bVar107);
      auVar167._0_12_ = ZEXT812(0x3c23d70a);
      auVar167._12_4_ = 0;
      auVar167._16_48_ = auVar185;
      compareBufferRelative(&local_130,&local_150,auVar167._0_4_,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
  }
  if (local_82 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Inverse, AVX: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    iVar112 = 0;
    do {
      lVar113 = 0;
      do {
        dVar117 = (double)Imath_3_2::erand48(local_136);
        *(float *)((undefined1 *)local_150._buffer + lVar113 * 4) = (float)dVar117;
        local_130._buffer[lVar113] = (float)dVar117;
        lVar113 = lVar113 + 1;
      } while (lVar113 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar440._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar440._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar458._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar458._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar440,auVar458);
      auVar10 = vunpckhpd_avx(auVar440,auVar458);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar264 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar415._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar415._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar430._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar430._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar196 = vunpcklpd_avx(auVar415,auVar430);
      auVar11 = vunpckhpd_avx(auVar415,auVar430);
      auVar366 = vunpcklps_avx(auVar196,auVar11);
      auVar11 = vunpckhps_avx(auVar196,auVar11);
      auVar12 = vunpcklpd_avx(auVar366,auVar11);
      auVar11 = vunpckhpd_avx(auVar366,auVar11);
      auVar401._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar401._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar406._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar406._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar366 = vunpcklpd_avx(auVar401,auVar406);
      auVar196 = vunpckhpd_avx(auVar401,auVar406);
      auVar195 = vunpcklps_avx(auVar366,auVar196);
      auVar196 = vunpckhps_avx(auVar366,auVar196);
      auVar13 = vunpcklpd_avx(auVar195,auVar196);
      auVar196 = vunpckhpd_avx(auVar195,auVar196);
      auVar366._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      auVar366._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar389._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      auVar389._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar195 = vunpcklpd_avx(auVar366,auVar389);
      auVar366 = vunpckhpd_avx(auVar366,auVar389);
      auVar14 = vunpcklps_avx(auVar195,auVar366);
      auVar366 = vunpckhps_avx(auVar195,auVar366);
      auVar195 = vunpcklpd_avx(auVar14,auVar366);
      auVar366 = vunpckhpd_avx(auVar14,auVar366);
      auVar14 = vpermilps_avx(auVar264,0);
      auVar15 = vpermilps_avx(auVar264,0x55);
      auVar16 = vpermilps_avx(auVar264,0xaa);
      auVar264 = vpermilps_avx(auVar264,0xff);
      auVar124._0_4_ =
           local_120 * auVar14._0_4_ + local_110 * auVar15._0_4_ +
           local_100 * auVar16._0_4_ + local_f0 * auVar264._0_4_;
      auVar124._4_4_ =
           fStack_11c * auVar14._4_4_ + fStack_10c * auVar15._4_4_ +
           fStack_fc * auVar16._4_4_ + fStack_ec * auVar264._4_4_;
      auVar124._8_4_ =
           fStack_118 * auVar14._8_4_ + fStack_108 * auVar15._8_4_ +
           fStack_f8 * auVar16._8_4_ + fStack_e8 * auVar264._8_4_;
      auVar124._12_4_ =
           fStack_114 * auVar14._12_4_ + fStack_104 * auVar15._12_4_ +
           fStack_f4 * auVar16._12_4_ + fStack_e4 * auVar264._12_4_;
      auVar124._16_4_ =
           local_120 * auVar14._16_4_ + local_110 * auVar15._16_4_ +
           local_100 * auVar16._16_4_ + local_f0 * auVar264._16_4_;
      auVar124._20_4_ =
           fStack_11c * auVar14._20_4_ + fStack_10c * auVar15._20_4_ +
           fStack_fc * auVar16._20_4_ + fStack_ec * auVar264._20_4_;
      auVar124._24_4_ =
           fStack_118 * auVar14._24_4_ + fStack_108 * auVar15._24_4_ +
           fStack_f8 * auVar16._24_4_ + fStack_e8 * auVar264._24_4_;
      auVar124._28_4_ = auVar14._28_4_ + auVar15._28_4_ + auVar16._28_4_ + auVar264._28_4_;
      auVar264 = vpermilps_avx(auVar12,0);
      auVar14 = vpermilps_avx(auVar12,0x55);
      auVar15 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar194._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar14._0_4_ +
           local_100 * auVar15._0_4_ + local_f0 * auVar12._0_4_;
      auVar194._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar14._4_4_ +
           fStack_fc * auVar15._4_4_ + fStack_ec * auVar12._4_4_;
      auVar194._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar14._8_4_ +
           fStack_f8 * auVar15._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar194._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar14._12_4_ +
           fStack_f4 * auVar15._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar194._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar14._16_4_ +
           local_100 * auVar15._16_4_ + local_f0 * auVar12._16_4_;
      auVar194._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar14._20_4_ +
           fStack_fc * auVar15._20_4_ + fStack_ec * auVar12._20_4_;
      auVar194._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar14._24_4_ +
           fStack_f8 * auVar15._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar194._28_4_ = auVar264._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar12._28_4_;
      auVar264 = vpermilps_avx(auVar13,0);
      auVar12 = vpermilps_avx(auVar13,0x55);
      auVar14 = vpermilps_avx(auVar13,0xaa);
      auVar13 = vpermilps_avx(auVar13,0xff);
      auVar249._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar13._0_4_;
      auVar249._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar13._4_4_;
      auVar249._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar13._8_4_;
      auVar249._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar13._12_4_;
      auVar249._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar13._16_4_;
      auVar249._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar13._20_4_;
      auVar249._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar13._24_4_;
      auVar249._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar14._28_4_ + auVar13._28_4_;
      auVar264 = vpermilps_avx(auVar195,0);
      auVar12 = vpermilps_avx(auVar195,0x55);
      auVar13 = vpermilps_avx(auVar195,0xaa);
      auVar195 = vpermilps_avx(auVar195,0xff);
      auVar263._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar195._0_4_;
      auVar263._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar195._4_4_;
      auVar263._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar195._8_4_;
      auVar263._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar195._12_4_;
      auVar263._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar195._16_4_;
      auVar263._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar195._20_4_;
      auVar263._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar195._24_4_;
      auVar263._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar195._28_4_;
      auVar99._4_4_ = fStack_dc;
      auVar99._0_4_ = local_e0;
      auVar99._8_4_ = fStack_d8;
      auVar99._12_4_ = fStack_d4;
      auVar367._16_16_ = auVar99;
      auVar367._0_16_ = auVar99;
      auVar264 = vpermilps_avx(auVar10,0);
      auVar12 = vpermilps_avx(auVar10,0x55);
      auVar13 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar273._0_4_ =
           local_e0 * auVar264._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar10._0_4_;
      auVar273._4_4_ =
           fStack_dc * auVar264._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar10._4_4_;
      auVar273._8_4_ =
           fStack_d8 * auVar264._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar273._12_4_ =
           fStack_d4 * auVar264._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar273._16_4_ =
           local_e0 * auVar264._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar10._16_4_;
      auVar273._20_4_ =
           fStack_dc * auVar264._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar10._20_4_;
      auVar273._24_4_ =
           fStack_d8 * auVar264._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar273._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar264 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar300._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar264._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar300._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar264._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar300._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar264._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar300._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar264._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar300._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar264._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar300._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar264._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar300._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar264._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar300._28_4_ = auVar10._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar10 = vpermilps_avx(auVar196,0);
      auVar11 = vpermilps_avx(auVar196,0x55);
      auVar264 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      auVar328._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar196._0_4_;
      auVar328._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar196._4_4_;
      auVar328._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar196._8_4_;
      auVar328._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar196._12_4_;
      auVar328._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar196._16_4_;
      auVar328._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar196._20_4_;
      auVar328._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar196._24_4_;
      auVar328._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar264._28_4_ + auVar196._28_4_;
      auVar10 = vpermilps_avx(auVar366,0);
      auVar11 = vpermilps_avx(auVar366,0x55);
      auVar196 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar337._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar196._0_4_ + local_b0 * auVar366._0_4_;
      auVar337._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar196._4_4_ + fStack_ac * auVar366._4_4_;
      auVar337._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar196._8_4_ + fStack_a8 * auVar366._8_4_;
      auVar337._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar196._12_4_ + fStack_a4 * auVar366._12_4_;
      auVar337._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar196._16_4_ + local_b0 * auVar366._16_4_;
      auVar337._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar196._20_4_ + fStack_ac * auVar366._20_4_;
      auVar337._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar196._24_4_ + fStack_a8 * auVar366._24_4_;
      auVar337._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar196._28_4_ + auVar366._28_4_;
      auVar10 = vsubps_avx(auVar124,auVar273);
      auVar125._0_4_ = auVar124._0_4_ + auVar273._0_4_;
      auVar125._4_4_ = auVar124._4_4_ + auVar273._4_4_;
      auVar125._8_4_ = auVar124._8_4_ + auVar273._8_4_;
      auVar125._12_4_ = auVar124._12_4_ + auVar273._12_4_;
      auVar125._16_4_ = auVar124._16_4_ + auVar273._16_4_;
      auVar125._20_4_ = auVar124._20_4_ + auVar273._20_4_;
      auVar125._24_4_ = auVar124._24_4_ + auVar273._24_4_;
      auVar125._28_4_ = auVar124._28_4_ + auVar273._28_4_;
      auVar11 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar194,auVar300);
      auVar195._0_4_ = auVar194._0_4_ + auVar300._0_4_;
      auVar195._4_4_ = auVar194._4_4_ + auVar300._4_4_;
      auVar195._8_4_ = auVar194._8_4_ + auVar300._8_4_;
      auVar195._12_4_ = auVar194._12_4_ + auVar300._12_4_;
      auVar195._16_4_ = auVar194._16_4_ + auVar300._16_4_;
      auVar195._20_4_ = auVar194._20_4_ + auVar300._20_4_;
      auVar195._24_4_ = auVar194._24_4_ + auVar300._24_4_;
      auVar195._28_4_ = auVar194._28_4_ + auVar300._28_4_;
      auVar15 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar249,auVar328);
      auVar250._0_4_ = auVar249._0_4_ + auVar328._0_4_;
      auVar250._4_4_ = auVar249._4_4_ + auVar328._4_4_;
      auVar250._8_4_ = auVar249._8_4_ + auVar328._8_4_;
      auVar250._12_4_ = auVar249._12_4_ + auVar328._12_4_;
      auVar250._16_4_ = auVar249._16_4_ + auVar328._16_4_;
      auVar250._20_4_ = auVar249._20_4_ + auVar328._20_4_;
      auVar250._24_4_ = auVar249._24_4_ + auVar328._24_4_;
      auVar250._28_4_ = auVar249._28_4_ + auVar328._28_4_;
      auVar16 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar263,auVar337);
      auVar264._0_4_ = auVar263._0_4_ + auVar337._0_4_;
      auVar264._4_4_ = auVar263._4_4_ + auVar337._4_4_;
      auVar264._8_4_ = auVar263._8_4_ + auVar337._8_4_;
      auVar264._12_4_ = auVar263._12_4_ + auVar337._12_4_;
      auVar264._16_4_ = auVar263._16_4_ + auVar337._16_4_;
      auVar264._20_4_ = auVar263._20_4_ + auVar337._20_4_;
      auVar264._24_4_ = auVar263._24_4_ + auVar337._24_4_;
      auVar264._28_4_ = auVar263._28_4_ + auVar337._28_4_;
      auVar17 = vpermilps_avx(auVar10,0x1b);
      auVar366 = vperm2f128_avx(auVar17,auVar264,0x13);
      auVar264 = vperm2f128_avx(auVar17,auVar264,2);
      auVar196 = vperm2f128_avx(auVar16,auVar250,0x13);
      auVar12 = vperm2f128_avx(auVar16,auVar250,2);
      auVar13 = vperm2f128_avx(auVar15,auVar195,0x13);
      auVar195 = vperm2f128_avx(auVar15,auVar195,2);
      auVar10 = vperm2f128_avx(auVar11,auVar125,0x13);
      auVar14 = vperm2f128_avx(auVar11,auVar125,2);
      auVar124 = vpermilps_avx(auVar367,0xff);
      auVar125 = vpermilps_avx(auVar367,0xaa);
      auVar194 = vpermilps_avx(auVar367,0x55);
      auVar249 = vpermilps_avx(auVar367,0);
      fVar414 = auVar10._0_4_;
      fVar268 = auVar249._0_4_;
      fVar429 = auVar10._4_4_;
      fVar269 = auVar249._4_4_;
      fVar439 = auVar10._8_4_;
      fVar270 = auVar249._8_4_;
      fVar457 = auVar10._12_4_;
      fVar271 = auVar249._12_4_;
      fVar116 = auVar10._16_4_;
      fVar281 = auVar249._16_4_;
      fVar186 = auVar10._20_4_;
      fVar282 = auVar249._20_4_;
      fVar216 = auVar10._24_4_;
      fVar283 = auVar249._24_4_;
      fVar426 = auVar13._0_4_;
      fVar284 = auVar194._0_4_;
      fVar436 = auVar13._4_4_;
      fVar306 = auVar194._4_4_;
      fVar454 = auVar13._8_4_;
      fVar307 = auVar194._8_4_;
      fVar469 = auVar13._12_4_;
      fVar308 = auVar194._12_4_;
      fVar182 = auVar13._16_4_;
      fVar309 = auVar194._16_4_;
      fVar213 = auVar13._20_4_;
      fVar332 = auVar194._20_4_;
      fVar259 = auVar13._24_4_;
      fVar333 = auVar194._24_4_;
      fVar427 = auVar196._0_4_;
      fVar334 = auVar125._0_4_;
      fVar437 = auVar196._4_4_;
      fVar335 = auVar125._4_4_;
      fVar455 = auVar196._8_4_;
      fVar345 = auVar125._8_4_;
      fVar470 = auVar196._12_4_;
      fVar346 = auVar125._12_4_;
      fVar183 = auVar196._16_4_;
      fVar347 = auVar125._16_4_;
      fVar214 = auVar196._20_4_;
      fVar349 = auVar125._20_4_;
      fVar260 = auVar196._24_4_;
      fVar381 = auVar125._24_4_;
      fVar428 = auVar366._0_4_;
      fVar383 = auVar124._0_4_;
      fVar438 = auVar366._4_4_;
      fVar385 = auVar124._4_4_;
      fVar456 = auVar366._8_4_;
      fVar387 = auVar124._8_4_;
      fVar471 = auVar366._12_4_;
      fVar397 = auVar124._12_4_;
      fVar184 = auVar366._16_4_;
      fVar398 = auVar124._16_4_;
      fVar215 = auVar366._20_4_;
      fVar399 = auVar124._20_4_;
      fVar261 = auVar366._24_4_;
      fVar350 = auVar124._24_4_;
      fVar262 = auVar17._28_4_;
      fVar382 = fVar262 + auVar16._28_4_;
      auVar416._0_4_ = fVar383 * fVar428 + fVar334 * fVar427 + fVar284 * fVar426 + fVar268 * fVar414
      ;
      auVar416._4_4_ = fVar385 * fVar438 + fVar335 * fVar437 + fVar306 * fVar436 + fVar269 * fVar429
      ;
      auVar416._8_4_ = fVar387 * fVar456 + fVar345 * fVar455 + fVar307 * fVar454 + fVar270 * fVar439
      ;
      auVar416._12_4_ =
           fVar397 * fVar471 + fVar346 * fVar470 + fVar308 * fVar469 + fVar271 * fVar457;
      auVar416._16_4_ =
           fVar398 * fVar184 + fVar347 * fVar183 + fVar309 * fVar182 + fVar281 * fVar116;
      auVar416._20_4_ =
           fVar399 * fVar215 + fVar349 * fVar214 + fVar332 * fVar213 + fVar282 * fVar186;
      auVar416._24_4_ =
           fVar350 * fVar261 + fVar381 * fVar260 + fVar333 * fVar259 + fVar283 * fVar216;
      auVar416._28_4_ = fVar382 + auVar15._28_4_ + auVar11._28_4_;
      auVar10._4_4_ = fVar306 * fVar429;
      auVar10._0_4_ = fVar284 * fVar414;
      auVar10._8_4_ = fVar307 * fVar439;
      auVar10._12_4_ = fVar308 * fVar457;
      auVar10._16_4_ = fVar309 * fVar116;
      auVar10._20_4_ = fVar332 * fVar186;
      auVar10._24_4_ = fVar333 * fVar216;
      auVar10._28_4_ = auVar15._28_4_;
      auVar441._0_4_ = fVar268 * fVar427 + fVar383 * fVar426;
      auVar441._4_4_ = fVar269 * fVar437 + fVar385 * fVar436;
      auVar441._8_4_ = fVar270 * fVar455 + fVar387 * fVar454;
      auVar441._12_4_ = fVar271 * fVar470 + fVar397 * fVar469;
      auVar441._16_4_ = fVar281 * fVar183 + fVar398 * fVar182;
      auVar441._20_4_ = fVar282 * fVar214 + fVar399 * fVar213;
      auVar441._24_4_ = fVar283 * fVar260 + fVar350 * fVar259;
      auVar441._28_4_ = fVar262 + fVar382;
      auVar10 = vsubps_avx(auVar10,auVar441);
      auVar11._4_4_ = fVar335 * fVar438;
      auVar11._0_4_ = fVar334 * fVar428;
      auVar11._8_4_ = fVar345 * fVar456;
      auVar11._12_4_ = fVar346 * fVar471;
      auVar11._16_4_ = fVar347 * fVar184;
      auVar11._20_4_ = fVar349 * fVar215;
      auVar11._24_4_ = fVar381 * fVar261;
      auVar11._28_4_ = fVar262;
      auVar10 = vsubps_avx(auVar10,auVar11);
      auVar15._4_4_ = fVar335 * fVar429;
      auVar15._0_4_ = fVar334 * fVar414;
      auVar15._8_4_ = fVar345 * fVar439;
      auVar15._12_4_ = fVar346 * fVar457;
      auVar15._16_4_ = fVar347 * fVar116;
      auVar15._20_4_ = fVar349 * fVar186;
      auVar15._24_4_ = fVar381 * fVar216;
      auVar15._28_4_ = auVar441._28_4_;
      auVar16._4_4_ = fVar269 * fVar436;
      auVar16._0_4_ = fVar268 * fVar426;
      auVar16._8_4_ = fVar270 * fVar454;
      auVar16._12_4_ = fVar271 * fVar469;
      auVar16._16_4_ = fVar281 * fVar182;
      auVar16._20_4_ = fVar282 * fVar213;
      auVar16._24_4_ = fVar283 * fVar259;
      auVar16._28_4_ = fVar262;
      auVar11 = vsubps_avx(auVar15,auVar16);
      auVar442._0_4_ = auVar11._0_4_ + fVar383 * fVar427 + fVar284 * fVar428;
      auVar442._4_4_ = auVar11._4_4_ + fVar385 * fVar437 + fVar306 * fVar438;
      auVar442._8_4_ = auVar11._8_4_ + fVar387 * fVar455 + fVar307 * fVar456;
      auVar442._12_4_ = auVar11._12_4_ + fVar397 * fVar470 + fVar308 * fVar471;
      auVar442._16_4_ = auVar11._16_4_ + fVar398 * fVar183 + fVar309 * fVar184;
      auVar442._20_4_ = auVar11._20_4_ + fVar399 * fVar214 + fVar332 * fVar215;
      auVar442._24_4_ = auVar11._24_4_ + fVar350 * fVar260 + fVar333 * fVar261;
      auVar442._28_4_ = auVar11._28_4_ + fVar262 + fVar262;
      auVar459._0_4_ = fVar383 * fVar414 + fVar284 * fVar427;
      auVar459._4_4_ = fVar385 * fVar429 + fVar306 * fVar437;
      auVar459._8_4_ = fVar387 * fVar439 + fVar307 * fVar455;
      auVar459._12_4_ = fVar397 * fVar457 + fVar308 * fVar470;
      auVar459._16_4_ = fVar398 * fVar116 + fVar309 * fVar183;
      auVar459._20_4_ = fVar399 * fVar186 + fVar332 * fVar214;
      auVar459._24_4_ = fVar350 * fVar216 + fVar333 * fVar260;
      auVar459._28_4_ = fVar262 + auVar196._28_4_;
      auVar265._0_4_ = fVar268 * fVar428 + fVar334 * fVar426;
      auVar265._4_4_ = fVar269 * fVar438 + fVar335 * fVar436;
      auVar265._8_4_ = fVar270 * fVar456 + fVar345 * fVar454;
      auVar265._12_4_ = fVar271 * fVar471 + fVar346 * fVar469;
      auVar265._16_4_ = fVar281 * fVar184 + fVar347 * fVar182;
      auVar265._20_4_ = fVar282 * fVar215 + fVar349 * fVar213;
      auVar265._24_4_ = fVar283 * fVar261 + fVar381 * fVar259;
      auVar265._28_4_ = auVar366._28_4_ + auVar13._28_4_;
      auVar11 = vsubps_avx(auVar459,auVar265);
      auVar92._4_4_ = fStack_114;
      auVar92._0_4_ = fStack_118;
      auVar92._8_4_ = local_110;
      auVar92._12_4_ = fStack_10c;
      auVar196._16_16_ = auVar92;
      auVar196._0_16_ = auVar92;
      auVar13 = vpermilps_avx(auVar196,0xff);
      auVar15 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0);
      fVar438 = auVar14._0_4_ * auVar196._0_4_;
      fVar439 = auVar14._4_4_ * auVar196._4_4_;
      auVar17._4_4_ = fVar439;
      auVar17._0_4_ = fVar438;
      fVar454 = auVar14._8_4_ * auVar196._8_4_;
      auVar17._8_4_ = fVar454;
      fVar455 = auVar14._12_4_ * auVar196._12_4_;
      auVar17._12_4_ = fVar455;
      fVar456 = auVar14._16_4_ * auVar196._16_4_;
      auVar17._16_4_ = fVar456;
      fVar457 = auVar14._20_4_ * auVar196._20_4_;
      auVar17._20_4_ = fVar457;
      fVar469 = auVar14._24_4_ * auVar196._24_4_;
      auVar17._24_4_ = fVar469;
      auVar17._28_4_ = auVar124._28_4_;
      fVar414 = auVar12._0_4_ * auVar196._0_4_;
      fVar426 = auVar12._4_4_ * auVar196._4_4_;
      auVar14._4_4_ = fVar426;
      auVar14._0_4_ = fVar414;
      fVar427 = auVar12._8_4_ * auVar196._8_4_;
      auVar14._8_4_ = fVar427;
      fVar428 = auVar12._12_4_ * auVar196._12_4_;
      auVar14._12_4_ = fVar428;
      fVar429 = auVar12._16_4_ * auVar196._16_4_;
      auVar14._16_4_ = fVar429;
      fVar436 = auVar12._20_4_ * auVar196._20_4_;
      auVar14._20_4_ = fVar436;
      fVar437 = auVar12._24_4_ * auVar196._24_4_;
      auVar14._24_4_ = fVar437;
      auVar14._28_4_ = auVar12._28_4_;
      auVar407._0_4_ = fVar438 + fVar414;
      auVar407._4_4_ = fVar439 + fVar426;
      auVar407._8_4_ = fVar454 + fVar427;
      auVar407._12_4_ = fVar455 + fVar428;
      auVar407._16_4_ = fVar456 + fVar429;
      auVar407._20_4_ = fVar457 + fVar436;
      auVar407._24_4_ = fVar469 + fVar437;
      auVar407._28_4_ = auVar124._28_4_ + auVar12._28_4_;
      auVar196 = vsubps_avx(auVar17,auVar14);
      auVar338._0_4_ = auVar264._0_4_ * auVar13._0_4_ + auVar195._0_4_ * auVar15._0_4_;
      auVar338._4_4_ = auVar264._4_4_ * auVar13._4_4_ + auVar195._4_4_ * auVar15._4_4_;
      auVar338._8_4_ = auVar264._8_4_ * auVar13._8_4_ + auVar195._8_4_ * auVar15._8_4_;
      auVar338._12_4_ = auVar264._12_4_ * auVar13._12_4_ + auVar195._12_4_ * auVar15._12_4_;
      auVar338._16_4_ = auVar264._16_4_ * auVar13._16_4_ + auVar195._16_4_ * auVar15._16_4_;
      auVar338._20_4_ = auVar264._20_4_ * auVar13._20_4_ + auVar195._20_4_ * auVar15._20_4_;
      auVar338._24_4_ = auVar264._24_4_ * auVar13._24_4_ + auVar195._24_4_ * auVar15._24_4_;
      auVar338._28_4_ = auVar194._28_4_ + auVar366._28_4_;
      auVar368._0_4_ = auVar407._0_4_ + auVar338._0_4_;
      auVar368._4_4_ = auVar407._4_4_ + auVar338._4_4_;
      auVar368._8_4_ = auVar407._8_4_ + auVar338._8_4_;
      auVar368._12_4_ = auVar407._12_4_ + auVar338._12_4_;
      auVar368._16_4_ = auVar407._16_4_ + auVar338._16_4_;
      auVar368._20_4_ = auVar407._20_4_ + auVar338._20_4_;
      auVar368._24_4_ = auVar407._24_4_ + auVar338._24_4_;
      auVar368._28_4_ = auVar407._28_4_ + auVar338._28_4_;
      auVar366 = vsubps_avx(auVar407,auVar338);
      auVar12._4_4_ = auVar195._4_4_ * auVar13._4_4_;
      auVar12._0_4_ = auVar195._0_4_ * auVar13._0_4_;
      auVar12._8_4_ = auVar195._8_4_ * auVar13._8_4_;
      auVar12._12_4_ = auVar195._12_4_ * auVar13._12_4_;
      auVar12._16_4_ = auVar195._16_4_ * auVar13._16_4_;
      auVar12._20_4_ = auVar195._20_4_ * auVar13._20_4_;
      auVar12._24_4_ = auVar195._24_4_ * auVar13._24_4_;
      auVar12._28_4_ = auVar338._28_4_;
      auVar13._4_4_ = auVar264._4_4_ * auVar15._4_4_;
      auVar13._0_4_ = auVar264._0_4_ * auVar15._0_4_;
      auVar13._8_4_ = auVar264._8_4_ * auVar15._8_4_;
      auVar13._12_4_ = auVar264._12_4_ * auVar15._12_4_;
      auVar13._16_4_ = auVar264._16_4_ * auVar15._16_4_;
      auVar13._20_4_ = auVar264._20_4_ * auVar15._20_4_;
      auVar13._24_4_ = auVar264._24_4_ * auVar15._24_4_;
      auVar13._28_4_ = auVar194._28_4_;
      auVar264 = vsubps_avx(auVar12,auVar13);
      auVar390._0_4_ = auVar196._0_4_ + auVar264._0_4_;
      auVar390._4_4_ = auVar196._4_4_ + auVar264._4_4_;
      auVar390._8_4_ = auVar196._8_4_ + auVar264._8_4_;
      auVar390._12_4_ = auVar196._12_4_ + auVar264._12_4_;
      auVar390._16_4_ = auVar196._16_4_ + auVar264._16_4_;
      auVar390._20_4_ = auVar196._20_4_ + auVar264._20_4_;
      auVar390._24_4_ = auVar196._24_4_ + auVar264._24_4_;
      auVar390._28_4_ = auVar196._28_4_ + auVar264._28_4_;
      auVar196 = vsubps_avx(auVar196,auVar264);
      auVar264 = vsubps_avx(auVar368,auVar416);
      auVar12 = vsubps_avx(auVar390,auVar10);
      auVar13 = vsubps_avx(auVar196,auVar442);
      auVar195 = vsubps_avx(auVar366,auVar11);
      *(float *)(undefined1 *)local_150._buffer = auVar368._0_4_ + auVar416._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar368._4_4_ + auVar416._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar368._8_4_ + auVar416._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar368._12_4_ + auVar416._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar368._16_4_ + auVar416._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar368._20_4_ + auVar416._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar368._24_4_ + auVar416._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar368._28_4_ + auVar416._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar390._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar390._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar390._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar390._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar390._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar390._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar390._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar390._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar196._0_4_ + auVar442._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar196._4_4_ + auVar442._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar196._8_4_ + auVar442._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar196._12_4_ + auVar442._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar196._16_4_ + auVar442._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar196._20_4_ + auVar442._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar196._24_4_ + auVar442._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar196._28_4_ + auVar442._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar366._0_4_ + auVar11._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar366._4_4_ + auVar11._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar366._8_4_ + auVar11._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar366._12_4_ + auVar11._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar366._16_4_ + auVar11._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar366._20_4_ + auVar11._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar366._24_4_ + auVar11._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar366._28_4_ + auVar11._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar195;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar264;
      compareBufferRelative(&local_130,&local_150,0.01,1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar169._0_8_ = std::ostream::flush();
    auVar169._8_56_ = extraout_var_27;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar169._0_16_ = ZEXT816(0);
        if (uVar114 < 0x38) {
          auVar168._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar168._8_56_ = extraout_var_28;
          auVar169._4_60_ = auVar168._4_60_;
          auVar169._0_4_ = (float)auVar168._0_8_;
        }
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar169._0_4_;
        local_130._buffer[uVar114] = auVar169._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar443._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar443._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar460._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar460._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar443,auVar460);
      auVar10 = vunpckhpd_avx(auVar443,auVar460);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar264 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar417._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar417._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar431._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar431._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar196 = vunpcklpd_avx(auVar417,auVar431);
      auVar11 = vunpckhpd_avx(auVar417,auVar431);
      auVar366 = vunpcklps_avx(auVar196,auVar11);
      auVar11 = vunpckhps_avx(auVar196,auVar11);
      auVar12 = vunpcklpd_avx(auVar366,auVar11);
      auVar11 = vunpckhpd_avx(auVar366,auVar11);
      auVar402._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar402._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar408._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar408._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar366 = vunpcklpd_avx(auVar402,auVar408);
      auVar196 = vunpckhpd_avx(auVar402,auVar408);
      auVar195 = vunpcklps_avx(auVar366,auVar196);
      auVar196 = vunpckhps_avx(auVar366,auVar196);
      auVar13 = vunpcklpd_avx(auVar195,auVar196);
      auVar196 = vunpckhpd_avx(auVar195,auVar196);
      auVar369._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      auVar369._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar391._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      auVar391._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar195 = vunpcklpd_avx(auVar369,auVar391);
      auVar366 = vunpckhpd_avx(auVar369,auVar391);
      auVar14 = vunpcklps_avx(auVar195,auVar366);
      auVar366 = vunpckhps_avx(auVar195,auVar366);
      auVar195 = vunpcklpd_avx(auVar14,auVar366);
      auVar366 = vunpckhpd_avx(auVar14,auVar366);
      auVar14 = vpermilps_avx(auVar264,0);
      auVar15 = vpermilps_avx(auVar264,0x55);
      auVar16 = vpermilps_avx(auVar264,0xaa);
      auVar264 = vpermilps_avx(auVar264,0xff);
      auVar126._0_4_ =
           local_120 * auVar14._0_4_ + local_110 * auVar15._0_4_ +
           local_100 * auVar16._0_4_ + local_f0 * auVar264._0_4_;
      auVar126._4_4_ =
           fStack_11c * auVar14._4_4_ + fStack_10c * auVar15._4_4_ +
           fStack_fc * auVar16._4_4_ + fStack_ec * auVar264._4_4_;
      auVar126._8_4_ =
           fStack_118 * auVar14._8_4_ + fStack_108 * auVar15._8_4_ +
           fStack_f8 * auVar16._8_4_ + fStack_e8 * auVar264._8_4_;
      auVar126._12_4_ =
           fStack_114 * auVar14._12_4_ + fStack_104 * auVar15._12_4_ +
           fStack_f4 * auVar16._12_4_ + fStack_e4 * auVar264._12_4_;
      auVar126._16_4_ =
           local_120 * auVar14._16_4_ + local_110 * auVar15._16_4_ +
           local_100 * auVar16._16_4_ + local_f0 * auVar264._16_4_;
      auVar126._20_4_ =
           fStack_11c * auVar14._20_4_ + fStack_10c * auVar15._20_4_ +
           fStack_fc * auVar16._20_4_ + fStack_ec * auVar264._20_4_;
      auVar126._24_4_ =
           fStack_118 * auVar14._24_4_ + fStack_108 * auVar15._24_4_ +
           fStack_f8 * auVar16._24_4_ + fStack_e8 * auVar264._24_4_;
      auVar126._28_4_ = auVar14._28_4_ + auVar15._28_4_ + auVar16._28_4_ + auVar264._28_4_;
      auVar264 = vpermilps_avx(auVar12,0);
      auVar14 = vpermilps_avx(auVar12,0x55);
      auVar15 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar197._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar14._0_4_ +
           local_100 * auVar15._0_4_ + local_f0 * auVar12._0_4_;
      auVar197._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar14._4_4_ +
           fStack_fc * auVar15._4_4_ + fStack_ec * auVar12._4_4_;
      auVar197._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar14._8_4_ +
           fStack_f8 * auVar15._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar197._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar14._12_4_ +
           fStack_f4 * auVar15._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar197._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar14._16_4_ +
           local_100 * auVar15._16_4_ + local_f0 * auVar12._16_4_;
      auVar197._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar14._20_4_ +
           fStack_fc * auVar15._20_4_ + fStack_ec * auVar12._20_4_;
      auVar197._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar14._24_4_ +
           fStack_f8 * auVar15._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar197._28_4_ = auVar264._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar12._28_4_;
      auVar264 = vpermilps_avx(auVar13,0);
      auVar12 = vpermilps_avx(auVar13,0x55);
      auVar14 = vpermilps_avx(auVar13,0xaa);
      auVar13 = vpermilps_avx(auVar13,0xff);
      auVar251._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar13._0_4_;
      auVar251._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar13._4_4_;
      auVar251._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar13._8_4_;
      auVar251._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar13._12_4_;
      auVar251._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar13._16_4_;
      auVar251._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar13._20_4_;
      auVar251._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar13._24_4_;
      auVar251._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar14._28_4_ + auVar13._28_4_;
      auVar264 = vpermilps_avx(auVar195,0);
      auVar12 = vpermilps_avx(auVar195,0x55);
      auVar13 = vpermilps_avx(auVar195,0xaa);
      auVar195 = vpermilps_avx(auVar195,0xff);
      auVar266._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar195._0_4_;
      auVar266._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar195._4_4_;
      auVar266._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar195._8_4_;
      auVar266._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar195._12_4_;
      auVar266._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar195._16_4_;
      auVar266._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar195._20_4_;
      auVar266._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar195._24_4_;
      auVar266._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar195._28_4_;
      auVar100._4_4_ = fStack_dc;
      auVar100._0_4_ = local_e0;
      auVar100._8_4_ = fStack_d8;
      auVar100._12_4_ = fStack_d4;
      auVar370._16_16_ = auVar100;
      auVar370._0_16_ = auVar100;
      auVar264 = vpermilps_avx(auVar10,0);
      auVar12 = vpermilps_avx(auVar10,0x55);
      auVar13 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar274._0_4_ =
           local_e0 * auVar264._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar10._0_4_;
      auVar274._4_4_ =
           fStack_dc * auVar264._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar10._4_4_;
      auVar274._8_4_ =
           fStack_d8 * auVar264._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar274._12_4_ =
           fStack_d4 * auVar264._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar274._16_4_ =
           local_e0 * auVar264._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar10._16_4_;
      auVar274._20_4_ =
           fStack_dc * auVar264._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar10._20_4_;
      auVar274._24_4_ =
           fStack_d8 * auVar264._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar274._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar264 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar301._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar264._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar301._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar264._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar301._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar264._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar301._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar264._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar301._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar264._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar301._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar264._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar301._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar264._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar301._28_4_ = auVar10._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar10 = vpermilps_avx(auVar196,0);
      auVar11 = vpermilps_avx(auVar196,0x55);
      auVar264 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      auVar329._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar196._0_4_;
      auVar329._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar196._4_4_;
      auVar329._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar196._8_4_;
      auVar329._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar196._12_4_;
      auVar329._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar196._16_4_;
      auVar329._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar196._20_4_;
      auVar329._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar196._24_4_;
      auVar329._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar264._28_4_ + auVar196._28_4_;
      auVar10 = vpermilps_avx(auVar366,0);
      auVar11 = vpermilps_avx(auVar366,0x55);
      auVar196 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar339._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar196._0_4_ + local_b0 * auVar366._0_4_;
      auVar339._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar196._4_4_ + fStack_ac * auVar366._4_4_;
      auVar339._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar196._8_4_ + fStack_a8 * auVar366._8_4_;
      auVar339._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar196._12_4_ + fStack_a4 * auVar366._12_4_;
      auVar339._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar196._16_4_ + local_b0 * auVar366._16_4_;
      auVar339._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar196._20_4_ + fStack_ac * auVar366._20_4_;
      auVar339._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar196._24_4_ + fStack_a8 * auVar366._24_4_;
      auVar339._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar196._28_4_ + auVar366._28_4_;
      auVar10 = vsubps_avx(auVar126,auVar274);
      auVar127._0_4_ = auVar126._0_4_ + auVar274._0_4_;
      auVar127._4_4_ = auVar126._4_4_ + auVar274._4_4_;
      auVar127._8_4_ = auVar126._8_4_ + auVar274._8_4_;
      auVar127._12_4_ = auVar126._12_4_ + auVar274._12_4_;
      auVar127._16_4_ = auVar126._16_4_ + auVar274._16_4_;
      auVar127._20_4_ = auVar126._20_4_ + auVar274._20_4_;
      auVar127._24_4_ = auVar126._24_4_ + auVar274._24_4_;
      auVar127._28_4_ = auVar126._28_4_ + auVar274._28_4_;
      auVar11 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar197,auVar301);
      auVar198._0_4_ = auVar197._0_4_ + auVar301._0_4_;
      auVar198._4_4_ = auVar197._4_4_ + auVar301._4_4_;
      auVar198._8_4_ = auVar197._8_4_ + auVar301._8_4_;
      auVar198._12_4_ = auVar197._12_4_ + auVar301._12_4_;
      auVar198._16_4_ = auVar197._16_4_ + auVar301._16_4_;
      auVar198._20_4_ = auVar197._20_4_ + auVar301._20_4_;
      auVar198._24_4_ = auVar197._24_4_ + auVar301._24_4_;
      auVar198._28_4_ = auVar197._28_4_ + auVar301._28_4_;
      auVar14 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar251,auVar329);
      auVar252._0_4_ = auVar251._0_4_ + auVar329._0_4_;
      auVar252._4_4_ = auVar251._4_4_ + auVar329._4_4_;
      auVar252._8_4_ = auVar251._8_4_ + auVar329._8_4_;
      auVar252._12_4_ = auVar251._12_4_ + auVar329._12_4_;
      auVar252._16_4_ = auVar251._16_4_ + auVar329._16_4_;
      auVar252._20_4_ = auVar251._20_4_ + auVar329._20_4_;
      auVar252._24_4_ = auVar251._24_4_ + auVar329._24_4_;
      auVar252._28_4_ = auVar251._28_4_ + auVar329._28_4_;
      auVar15 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar266,auVar339);
      auVar267._0_4_ = auVar266._0_4_ + auVar339._0_4_;
      auVar267._4_4_ = auVar266._4_4_ + auVar339._4_4_;
      auVar267._8_4_ = auVar266._8_4_ + auVar339._8_4_;
      auVar267._12_4_ = auVar266._12_4_ + auVar339._12_4_;
      auVar267._16_4_ = auVar266._16_4_ + auVar339._16_4_;
      auVar267._20_4_ = auVar266._20_4_ + auVar339._20_4_;
      auVar267._24_4_ = auVar266._24_4_ + auVar339._24_4_;
      auVar267._28_4_ = auVar266._28_4_ + auVar339._28_4_;
      auVar16 = vpermilps_avx(auVar10,0x1b);
      auVar264 = vperm2f128_avx(auVar16,auVar267,2);
      auVar196 = vperm2f128_avx(auVar15,auVar252,0x13);
      auVar366 = vperm2f128_avx(auVar15,auVar252,2);
      auVar12 = vperm2f128_avx(auVar14,auVar198,0x13);
      auVar13 = vperm2f128_avx(auVar14,auVar198,2);
      auVar10 = vperm2f128_avx(auVar11,auVar127,0x13);
      auVar195 = vperm2f128_avx(auVar11,auVar127,2);
      auVar17 = vpermilps_avx(auVar370,0xff);
      auVar124 = vpermilps_avx(auVar370,0xaa);
      auVar125 = vpermilps_avx(auVar370,0x55);
      auVar194 = vpermilps_avx(auVar370,0);
      fVar414 = auVar10._0_4_;
      fVar214 = auVar194._0_4_;
      fVar428 = auVar10._4_4_;
      fVar215 = auVar194._4_4_;
      fVar437 = auVar10._8_4_;
      fVar216 = auVar194._8_4_;
      fVar454 = auVar10._12_4_;
      fVar259 = auVar194._12_4_;
      fVar457 = auVar10._16_4_;
      fVar260 = auVar194._16_4_;
      fVar471 = auVar10._20_4_;
      fVar261 = auVar194._20_4_;
      fVar183 = auVar10._24_4_;
      fVar262 = auVar194._24_4_;
      fVar426 = auVar12._0_4_;
      fVar268 = auVar125._0_4_;
      fVar429 = auVar12._4_4_;
      fVar269 = auVar125._4_4_;
      fVar438 = auVar12._8_4_;
      fVar270 = auVar125._8_4_;
      fVar455 = auVar12._12_4_;
      fVar271 = auVar125._12_4_;
      fVar469 = auVar12._16_4_;
      fVar281 = auVar125._16_4_;
      fVar116 = auVar12._20_4_;
      fVar282 = auVar125._20_4_;
      fVar184 = auVar12._24_4_;
      fVar283 = auVar125._24_4_;
      fVar427 = auVar196._0_4_;
      fVar284 = auVar124._0_4_;
      fVar436 = auVar196._4_4_;
      fVar306 = auVar124._4_4_;
      fVar439 = auVar196._8_4_;
      fVar307 = auVar124._8_4_;
      fVar456 = auVar196._12_4_;
      fVar308 = auVar124._12_4_;
      fVar470 = auVar196._16_4_;
      fVar309 = auVar124._16_4_;
      fVar182 = auVar196._20_4_;
      fVar332 = auVar124._20_4_;
      fVar186 = auVar196._24_4_;
      fVar333 = auVar124._24_4_;
      auVar418._0_4_ = fVar284 * fVar427 + fVar268 * fVar426 + fVar214 * fVar414;
      auVar418._4_4_ = fVar306 * fVar436 + fVar269 * fVar429 + fVar215 * fVar428;
      auVar418._8_4_ = fVar307 * fVar439 + fVar270 * fVar438 + fVar216 * fVar437;
      auVar418._12_4_ = fVar308 * fVar456 + fVar271 * fVar455 + fVar259 * fVar454;
      auVar418._16_4_ = fVar309 * fVar470 + fVar281 * fVar469 + fVar260 * fVar457;
      auVar418._20_4_ = fVar332 * fVar182 + fVar282 * fVar116 + fVar261 * fVar471;
      auVar418._24_4_ = fVar333 * fVar186 + fVar283 * fVar184 + fVar262 * fVar183;
      auVar418._28_4_ = auVar15._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar18._4_4_ = fVar269 * fVar428;
      auVar18._0_4_ = fVar268 * fVar414;
      auVar18._8_4_ = fVar270 * fVar437;
      auVar18._12_4_ = fVar271 * fVar454;
      auVar18._16_4_ = fVar281 * fVar457;
      auVar18._20_4_ = fVar282 * fVar471;
      auVar18._24_4_ = fVar283 * fVar183;
      auVar18._28_4_ = auVar14._28_4_;
      fVar334 = auVar17._0_4_;
      fVar335 = auVar17._4_4_;
      fVar345 = auVar17._8_4_;
      fVar346 = auVar17._12_4_;
      fVar347 = auVar17._16_4_;
      fVar349 = auVar17._20_4_;
      fVar381 = auVar17._24_4_;
      fVar213 = auVar16._28_4_;
      auVar444._0_4_ = fVar214 * fVar427 + fVar334 * fVar426;
      auVar444._4_4_ = fVar215 * fVar436 + fVar335 * fVar429;
      auVar444._8_4_ = fVar216 * fVar439 + fVar345 * fVar438;
      auVar444._12_4_ = fVar259 * fVar456 + fVar346 * fVar455;
      auVar444._16_4_ = fVar260 * fVar470 + fVar347 * fVar469;
      auVar444._20_4_ = fVar261 * fVar182 + fVar349 * fVar116;
      auVar444._24_4_ = fVar262 * fVar186 + fVar381 * fVar184;
      auVar444._28_4_ = fVar213 + auVar15._28_4_;
      auVar10 = vsubps_avx(auVar18,auVar444);
      auVar19._4_4_ = fVar306 * fVar428;
      auVar19._0_4_ = fVar284 * fVar414;
      auVar19._8_4_ = fVar307 * fVar437;
      auVar19._12_4_ = fVar308 * fVar454;
      auVar19._16_4_ = fVar309 * fVar457;
      auVar19._20_4_ = fVar332 * fVar471;
      auVar19._24_4_ = fVar333 * fVar183;
      auVar19._28_4_ = auVar444._28_4_;
      auVar20._4_4_ = fVar215 * fVar429;
      auVar20._0_4_ = fVar214 * fVar426;
      auVar20._8_4_ = fVar216 * fVar438;
      auVar20._12_4_ = fVar259 * fVar455;
      auVar20._16_4_ = fVar260 * fVar469;
      auVar20._20_4_ = fVar261 * fVar116;
      auVar20._24_4_ = fVar262 * fVar184;
      auVar20._28_4_ = fVar213;
      auVar11 = vsubps_avx(auVar19,auVar20);
      auVar445._0_4_ = auVar11._0_4_ + fVar334 * fVar427;
      auVar445._4_4_ = auVar11._4_4_ + fVar335 * fVar436;
      auVar445._8_4_ = auVar11._8_4_ + fVar345 * fVar439;
      auVar445._12_4_ = auVar11._12_4_ + fVar346 * fVar456;
      auVar445._16_4_ = auVar11._16_4_ + fVar347 * fVar470;
      auVar445._20_4_ = auVar11._20_4_ + fVar349 * fVar182;
      auVar445._24_4_ = auVar11._24_4_ + fVar381 * fVar186;
      auVar445._28_4_ = auVar11._28_4_ + fVar213;
      auVar21._4_4_ = fVar306 * fVar429;
      auVar21._0_4_ = fVar284 * fVar426;
      auVar21._8_4_ = fVar307 * fVar438;
      auVar21._12_4_ = fVar308 * fVar455;
      auVar21._16_4_ = fVar309 * fVar469;
      auVar21._20_4_ = fVar332 * fVar116;
      auVar21._24_4_ = fVar333 * fVar184;
      auVar21._28_4_ = auVar12._28_4_;
      auVar461._0_4_ = fVar334 * fVar414 + fVar268 * fVar427;
      auVar461._4_4_ = fVar335 * fVar428 + fVar269 * fVar436;
      auVar461._8_4_ = fVar345 * fVar437 + fVar270 * fVar439;
      auVar461._12_4_ = fVar346 * fVar454 + fVar271 * fVar456;
      auVar461._16_4_ = fVar347 * fVar457 + fVar281 * fVar470;
      auVar461._20_4_ = fVar349 * fVar471 + fVar282 * fVar182;
      auVar461._24_4_ = fVar381 * fVar183 + fVar283 * fVar186;
      auVar461._28_4_ = fVar213 + auVar196._28_4_;
      auVar11 = vsubps_avx(auVar461,auVar21);
      auVar93._4_4_ = fStack_114;
      auVar93._0_4_ = fStack_118;
      auVar93._8_4_ = local_110;
      auVar93._12_4_ = fStack_10c;
      auVar199._16_16_ = auVar93;
      auVar199._0_16_ = auVar93;
      auVar12 = vpermilps_avx(auVar199,0xff);
      auVar14 = vpermilps_avx(auVar199,0xaa);
      auVar196 = vpermilps_avx(auVar199,0);
      fVar438 = auVar195._0_4_ * auVar196._0_4_;
      fVar439 = auVar195._4_4_ * auVar196._4_4_;
      auVar22._4_4_ = fVar439;
      auVar22._0_4_ = fVar438;
      fVar454 = auVar195._8_4_ * auVar196._8_4_;
      auVar22._8_4_ = fVar454;
      fVar455 = auVar195._12_4_ * auVar196._12_4_;
      auVar22._12_4_ = fVar455;
      fVar456 = auVar195._16_4_ * auVar196._16_4_;
      auVar22._16_4_ = fVar456;
      fVar457 = auVar195._20_4_ * auVar196._20_4_;
      auVar22._20_4_ = fVar457;
      fVar469 = auVar195._24_4_ * auVar196._24_4_;
      auVar22._24_4_ = fVar469;
      auVar22._28_4_ = auVar17._28_4_;
      fVar414 = auVar366._0_4_ * auVar196._0_4_;
      fVar426 = auVar366._4_4_ * auVar196._4_4_;
      auVar23._4_4_ = fVar426;
      auVar23._0_4_ = fVar414;
      fVar427 = auVar366._8_4_ * auVar196._8_4_;
      auVar23._8_4_ = fVar427;
      fVar428 = auVar366._12_4_ * auVar196._12_4_;
      auVar23._12_4_ = fVar428;
      fVar429 = auVar366._16_4_ * auVar196._16_4_;
      auVar23._16_4_ = fVar429;
      fVar436 = auVar366._20_4_ * auVar196._20_4_;
      auVar23._20_4_ = fVar436;
      fVar437 = auVar366._24_4_ * auVar196._24_4_;
      auVar23._24_4_ = fVar437;
      auVar23._28_4_ = auVar366._28_4_;
      auVar409._0_4_ = fVar438 + fVar414;
      auVar409._4_4_ = fVar439 + fVar426;
      auVar409._8_4_ = fVar454 + fVar427;
      auVar409._12_4_ = fVar455 + fVar428;
      auVar409._16_4_ = fVar456 + fVar429;
      auVar409._20_4_ = fVar457 + fVar436;
      auVar409._24_4_ = fVar469 + fVar437;
      auVar409._28_4_ = auVar17._28_4_ + auVar366._28_4_;
      auVar196 = vsubps_avx(auVar22,auVar23);
      auVar340._0_4_ = auVar264._0_4_ * auVar12._0_4_ + auVar13._0_4_ * auVar14._0_4_;
      auVar340._4_4_ = auVar264._4_4_ * auVar12._4_4_ + auVar13._4_4_ * auVar14._4_4_;
      auVar340._8_4_ = auVar264._8_4_ * auVar12._8_4_ + auVar13._8_4_ * auVar14._8_4_;
      auVar340._12_4_ = auVar264._12_4_ * auVar12._12_4_ + auVar13._12_4_ * auVar14._12_4_;
      auVar340._16_4_ = auVar264._16_4_ * auVar12._16_4_ + auVar13._16_4_ * auVar14._16_4_;
      auVar340._20_4_ = auVar264._20_4_ * auVar12._20_4_ + auVar13._20_4_ * auVar14._20_4_;
      auVar340._24_4_ = auVar264._24_4_ * auVar12._24_4_ + auVar13._24_4_ * auVar14._24_4_;
      auVar340._28_4_ = auVar125._28_4_ + auVar339._28_4_;
      auVar371._0_4_ = auVar409._0_4_ + auVar340._0_4_;
      auVar371._4_4_ = auVar409._4_4_ + auVar340._4_4_;
      auVar371._8_4_ = auVar409._8_4_ + auVar340._8_4_;
      auVar371._12_4_ = auVar409._12_4_ + auVar340._12_4_;
      auVar371._16_4_ = auVar409._16_4_ + auVar340._16_4_;
      auVar371._20_4_ = auVar409._20_4_ + auVar340._20_4_;
      auVar371._24_4_ = auVar409._24_4_ + auVar340._24_4_;
      auVar371._28_4_ = auVar409._28_4_ + auVar340._28_4_;
      auVar366 = vsubps_avx(auVar409,auVar340);
      auVar24._4_4_ = auVar13._4_4_ * auVar12._4_4_;
      auVar24._0_4_ = auVar13._0_4_ * auVar12._0_4_;
      auVar24._8_4_ = auVar13._8_4_ * auVar12._8_4_;
      auVar24._12_4_ = auVar13._12_4_ * auVar12._12_4_;
      auVar24._16_4_ = auVar13._16_4_ * auVar12._16_4_;
      auVar24._20_4_ = auVar13._20_4_ * auVar12._20_4_;
      auVar24._24_4_ = auVar13._24_4_ * auVar12._24_4_;
      auVar24._28_4_ = auVar340._28_4_;
      auVar25._4_4_ = auVar264._4_4_ * auVar14._4_4_;
      auVar25._0_4_ = auVar264._0_4_ * auVar14._0_4_;
      auVar25._8_4_ = auVar264._8_4_ * auVar14._8_4_;
      auVar25._12_4_ = auVar264._12_4_ * auVar14._12_4_;
      auVar25._16_4_ = auVar264._16_4_ * auVar14._16_4_;
      auVar25._20_4_ = auVar264._20_4_ * auVar14._20_4_;
      auVar25._24_4_ = auVar264._24_4_ * auVar14._24_4_;
      auVar25._28_4_ = auVar125._28_4_;
      auVar264 = vsubps_avx(auVar24,auVar25);
      auVar392._0_4_ = auVar196._0_4_ + auVar264._0_4_;
      auVar392._4_4_ = auVar196._4_4_ + auVar264._4_4_;
      auVar392._8_4_ = auVar196._8_4_ + auVar264._8_4_;
      auVar392._12_4_ = auVar196._12_4_ + auVar264._12_4_;
      auVar392._16_4_ = auVar196._16_4_ + auVar264._16_4_;
      auVar392._20_4_ = auVar196._20_4_ + auVar264._20_4_;
      auVar392._24_4_ = auVar196._24_4_ + auVar264._24_4_;
      auVar392._28_4_ = auVar196._28_4_ + auVar264._28_4_;
      auVar196 = vsubps_avx(auVar196,auVar264);
      auVar264 = vsubps_avx(auVar371,auVar418);
      auVar12 = vsubps_avx(auVar392,auVar10);
      auVar13 = vsubps_avx(auVar196,auVar445);
      auVar195 = vsubps_avx(auVar366,auVar11);
      *(float *)(undefined1 *)local_150._buffer = auVar371._0_4_ + auVar418._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar371._4_4_ + auVar418._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar371._8_4_ + auVar418._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar371._12_4_ + auVar418._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar371._16_4_ + auVar418._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar371._20_4_ + auVar418._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar371._24_4_ + auVar418._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar371._28_4_ + auVar418._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar392._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar392._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar392._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar392._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar392._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar392._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar392._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar392._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar196._0_4_ + auVar445._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar196._4_4_ + auVar445._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar196._8_4_ + auVar445._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar196._12_4_ + auVar445._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar196._16_4_ + auVar445._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar196._20_4_ + auVar445._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar196._24_4_ + auVar445._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar196._28_4_ + auVar445._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar366._0_4_ + auVar11._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar366._4_4_ + auVar11._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar366._8_4_ + auVar11._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar366._12_4_ + auVar11._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar366._16_4_ + auVar11._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar366._20_4_ + auVar11._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar366._24_4_ + auVar11._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar366._28_4_ + auVar11._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar195;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar264;
      auVar141 = ZEXT1664(auVar264._0_16_);
      auVar169 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar171._0_8_ = std::ostream::flush();
    auVar171._8_56_ = extraout_var_29;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar171._0_16_ = ZEXT816(0);
        if (uVar114 < 0x30) {
          auVar170._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar170._8_56_ = extraout_var_30;
          auVar171._4_60_ = auVar170._4_60_;
          auVar171._0_4_ = (float)auVar170._0_8_;
        }
        auVar348 = auVar141._28_36_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar171._0_4_;
        local_130._buffer[uVar114] = auVar171._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar446._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar446._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar462._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar462._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar446,auVar462);
      auVar10 = vunpckhpd_avx(auVar446,auVar462);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar366 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar419._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar419._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar432._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar432._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar196 = vunpcklpd_avx(auVar419,auVar432);
      auVar11 = vunpckhpd_avx(auVar419,auVar432);
      auVar12 = vunpcklps_avx(auVar196,auVar11);
      auVar11 = vunpckhps_avx(auVar196,auVar11);
      auVar264 = vunpcklpd_avx(auVar12,auVar11);
      auVar11 = vunpckhpd_avx(auVar12,auVar11);
      auVar403._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar403._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar410._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar410._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar12 = vunpcklpd_avx(auVar403,auVar410);
      auVar196 = vunpckhpd_avx(auVar403,auVar410);
      auVar13 = vunpcklps_avx(auVar12,auVar196);
      auVar196 = vunpckhps_avx(auVar12,auVar196);
      auVar12 = vunpcklpd_avx(auVar13,auVar196);
      auVar196 = vunpckhpd_avx(auVar13,auVar196);
      auVar13 = vpermilps_avx(auVar366,0);
      auVar195 = vpermilps_avx(auVar366,0x55);
      auVar14 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar128._0_4_ =
           local_120 * auVar13._0_4_ + local_110 * auVar195._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar366._0_4_;
      auVar128._4_4_ =
           fStack_11c * auVar13._4_4_ + fStack_10c * auVar195._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar366._4_4_;
      auVar128._8_4_ =
           fStack_118 * auVar13._8_4_ + fStack_108 * auVar195._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar366._8_4_;
      auVar128._12_4_ =
           fStack_114 * auVar13._12_4_ + fStack_104 * auVar195._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar366._12_4_;
      auVar128._16_4_ =
           local_120 * auVar13._16_4_ + local_110 * auVar195._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar366._16_4_;
      auVar128._20_4_ =
           fStack_11c * auVar13._20_4_ + fStack_10c * auVar195._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar366._20_4_;
      auVar128._24_4_ =
           fStack_118 * auVar13._24_4_ + fStack_108 * auVar195._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar366._24_4_;
      auVar128._28_4_ = auVar13._28_4_ + auVar195._28_4_ + auVar14._28_4_ + auVar366._28_4_;
      auVar366 = vpermilps_avx(auVar264,0);
      auVar13 = vpermilps_avx(auVar264,0x55);
      auVar195 = vpermilps_avx(auVar264,0xaa);
      auVar264 = vpermilps_avx(auVar264,0xff);
      auVar200._0_4_ =
           local_120 * auVar366._0_4_ + local_110 * auVar13._0_4_ +
           local_100 * auVar195._0_4_ + local_f0 * auVar264._0_4_;
      auVar200._4_4_ =
           fStack_11c * auVar366._4_4_ + fStack_10c * auVar13._4_4_ +
           fStack_fc * auVar195._4_4_ + fStack_ec * auVar264._4_4_;
      auVar200._8_4_ =
           fStack_118 * auVar366._8_4_ + fStack_108 * auVar13._8_4_ +
           fStack_f8 * auVar195._8_4_ + fStack_e8 * auVar264._8_4_;
      auVar200._12_4_ =
           fStack_114 * auVar366._12_4_ + fStack_104 * auVar13._12_4_ +
           fStack_f4 * auVar195._12_4_ + fStack_e4 * auVar264._12_4_;
      auVar200._16_4_ =
           local_120 * auVar366._16_4_ + local_110 * auVar13._16_4_ +
           local_100 * auVar195._16_4_ + local_f0 * auVar264._16_4_;
      auVar200._20_4_ =
           fStack_11c * auVar366._20_4_ + fStack_10c * auVar13._20_4_ +
           fStack_fc * auVar195._20_4_ + fStack_ec * auVar264._20_4_;
      auVar200._24_4_ =
           fStack_118 * auVar366._24_4_ + fStack_108 * auVar13._24_4_ +
           fStack_f8 * auVar195._24_4_ + fStack_e8 * auVar264._24_4_;
      auVar200._28_4_ = auVar366._28_4_ + auVar13._28_4_ + auVar195._28_4_ + auVar264._28_4_;
      auVar366 = vpermilps_avx(auVar12,0);
      auVar264 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar253._0_4_ =
           local_120 * auVar366._0_4_ + local_110 * auVar264._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar12._0_4_;
      auVar253._4_4_ =
           fStack_11c * auVar366._4_4_ + fStack_10c * auVar264._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar12._4_4_;
      auVar253._8_4_ =
           fStack_118 * auVar366._8_4_ + fStack_108 * auVar264._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar253._12_4_ =
           fStack_114 * auVar366._12_4_ + fStack_104 * auVar264._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar253._16_4_ =
           local_120 * auVar366._16_4_ + local_110 * auVar264._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar12._16_4_;
      auVar253._20_4_ =
           fStack_11c * auVar366._20_4_ + fStack_10c * auVar264._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar12._20_4_;
      auVar253._24_4_ =
           fStack_118 * auVar366._24_4_ + fStack_108 * auVar264._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar253._28_4_ = auVar366._28_4_ + auVar264._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar101._4_4_ = fStack_dc;
      auVar101._0_4_ = local_e0;
      auVar101._8_4_ = fStack_d8;
      auVar101._12_4_ = fStack_d4;
      auVar372._16_16_ = auVar101;
      auVar372._0_16_ = auVar101;
      auVar366 = vpermilps_avx(auVar10,0);
      auVar264 = vpermilps_avx(auVar10,0x55);
      auVar12 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar275._0_4_ =
           local_e0 * auVar366._0_4_ + local_d0 * auVar264._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar10._0_4_;
      auVar275._4_4_ =
           fStack_dc * auVar366._4_4_ + fStack_cc * auVar264._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar10._4_4_;
      auVar275._8_4_ =
           fStack_d8 * auVar366._8_4_ + fStack_c8 * auVar264._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar275._12_4_ =
           fStack_d4 * auVar366._12_4_ + fStack_c4 * auVar264._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar275._16_4_ =
           local_e0 * auVar366._16_4_ + local_d0 * auVar264._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar10._16_4_;
      auVar275._20_4_ =
           fStack_dc * auVar366._20_4_ + fStack_cc * auVar264._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar10._20_4_;
      auVar275._24_4_ =
           fStack_d8 * auVar366._24_4_ + fStack_c8 * auVar264._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar275._28_4_ = auVar366._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar366 = vpermilps_avx(auVar11,0x55);
      auVar264 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar302._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar366._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar11._0_4_;
      auVar302._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar366._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar11._4_4_;
      auVar302._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar366._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar302._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar366._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar302._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar366._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar11._16_4_;
      auVar302._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar366._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar11._20_4_;
      auVar302._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar366._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar302._28_4_ = auVar10._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar11._28_4_;
      auVar10 = vpermilps_avx(auVar196,0);
      auVar11 = vpermilps_avx(auVar196,0x55);
      auVar366 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      fVar213 = auVar196._28_4_;
      auVar330._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar196._0_4_;
      auVar330._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar196._4_4_;
      auVar330._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar196._8_4_;
      auVar330._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar196._12_4_;
      auVar330._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar196._16_4_;
      auVar330._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar196._20_4_;
      auVar330._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar196._24_4_;
      auVar330._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar366._28_4_ + fVar213;
      auVar10 = vsubps_avx(auVar128,auVar275);
      auVar129._0_4_ = auVar128._0_4_ + auVar275._0_4_;
      auVar129._4_4_ = auVar128._4_4_ + auVar275._4_4_;
      auVar129._8_4_ = auVar128._8_4_ + auVar275._8_4_;
      auVar129._12_4_ = auVar128._12_4_ + auVar275._12_4_;
      auVar129._16_4_ = auVar128._16_4_ + auVar275._16_4_;
      auVar129._20_4_ = auVar128._20_4_ + auVar275._20_4_;
      auVar129._24_4_ = auVar128._24_4_ + auVar275._24_4_;
      auVar129._28_4_ = auVar128._28_4_ + auVar275._28_4_;
      auVar11 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar200,auVar302);
      auVar201._0_4_ = auVar200._0_4_ + auVar302._0_4_;
      auVar201._4_4_ = auVar200._4_4_ + auVar302._4_4_;
      auVar201._8_4_ = auVar200._8_4_ + auVar302._8_4_;
      auVar201._12_4_ = auVar200._12_4_ + auVar302._12_4_;
      auVar201._16_4_ = auVar200._16_4_ + auVar302._16_4_;
      auVar201._20_4_ = auVar200._20_4_ + auVar302._20_4_;
      auVar201._24_4_ = auVar200._24_4_ + auVar302._24_4_;
      auVar201._28_4_ = auVar200._28_4_ + auVar302._28_4_;
      auVar195 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar253,auVar330);
      auVar254._0_4_ = auVar253._0_4_ + auVar330._0_4_;
      auVar254._4_4_ = auVar253._4_4_ + auVar330._4_4_;
      auVar254._8_4_ = auVar253._8_4_ + auVar330._8_4_;
      auVar254._12_4_ = auVar253._12_4_ + auVar330._12_4_;
      auVar254._16_4_ = auVar253._16_4_ + auVar330._16_4_;
      auVar254._20_4_ = auVar253._20_4_ + auVar330._20_4_;
      auVar254._24_4_ = auVar253._24_4_ + auVar330._24_4_;
      auVar254._28_4_ = auVar253._28_4_ + auVar330._28_4_;
      auVar14 = vpermilps_avx(auVar10,0x1b);
      auVar196 = vperm2f128_avx(auVar14,auVar254,0x13);
      auVar366 = vperm2f128_avx(auVar14,auVar254,2);
      auVar264 = vperm2f128_avx(auVar195,auVar201,0x13);
      auVar12 = vperm2f128_avx(auVar195,auVar201,2);
      auVar10 = vperm2f128_avx(auVar11,auVar129,0x13);
      auVar13 = vperm2f128_avx(auVar11,auVar129,2);
      auVar15 = vpermilps_avx(auVar372,0xff);
      auVar16 = vpermilps_avx(auVar372,0xaa);
      auVar17 = vpermilps_avx(auVar372,0x55);
      auVar124 = vpermilps_avx(auVar372,0);
      fVar414 = auVar10._0_4_;
      fVar214 = auVar124._0_4_;
      fVar428 = auVar10._4_4_;
      fVar215 = auVar124._4_4_;
      fVar437 = auVar10._8_4_;
      fVar216 = auVar124._8_4_;
      fVar454 = auVar10._12_4_;
      fVar259 = auVar124._12_4_;
      fVar457 = auVar10._16_4_;
      fVar260 = auVar124._16_4_;
      fVar471 = auVar10._20_4_;
      fVar261 = auVar124._20_4_;
      fVar183 = auVar10._24_4_;
      fVar262 = auVar124._24_4_;
      fVar426 = auVar264._0_4_;
      fVar268 = auVar17._0_4_;
      fVar429 = auVar264._4_4_;
      fVar269 = auVar17._4_4_;
      fVar438 = auVar264._8_4_;
      fVar270 = auVar17._8_4_;
      fVar455 = auVar264._12_4_;
      fVar271 = auVar17._12_4_;
      fVar469 = auVar264._16_4_;
      fVar281 = auVar17._16_4_;
      fVar116 = auVar264._20_4_;
      fVar282 = auVar17._20_4_;
      fVar184 = auVar264._24_4_;
      fVar283 = auVar17._24_4_;
      fVar427 = auVar196._0_4_;
      fVar284 = auVar16._0_4_;
      fVar436 = auVar196._4_4_;
      fVar306 = auVar16._4_4_;
      fVar439 = auVar196._8_4_;
      fVar307 = auVar16._8_4_;
      fVar456 = auVar196._12_4_;
      fVar308 = auVar16._12_4_;
      fVar470 = auVar196._16_4_;
      fVar309 = auVar16._16_4_;
      fVar182 = auVar196._20_4_;
      fVar332 = auVar16._20_4_;
      fVar186 = auVar196._24_4_;
      fVar333 = auVar16._24_4_;
      auVar420._0_4_ = fVar284 * fVar427 + fVar268 * fVar426 + fVar214 * fVar414;
      auVar420._4_4_ = fVar306 * fVar436 + fVar269 * fVar429 + fVar215 * fVar428;
      auVar420._8_4_ = fVar307 * fVar439 + fVar270 * fVar438 + fVar216 * fVar437;
      auVar420._12_4_ = fVar308 * fVar456 + fVar271 * fVar455 + fVar259 * fVar454;
      auVar420._16_4_ = fVar309 * fVar470 + fVar281 * fVar469 + fVar260 * fVar457;
      auVar420._20_4_ = fVar332 * fVar182 + fVar282 * fVar116 + fVar261 * fVar471;
      auVar420._24_4_ = fVar333 * fVar186 + fVar283 * fVar184 + fVar262 * fVar183;
      auVar420._28_4_ = auVar14._28_4_ + auVar195._28_4_ + auVar11._28_4_;
      auVar26._4_4_ = fVar269 * fVar428;
      auVar26._0_4_ = fVar268 * fVar414;
      auVar26._8_4_ = fVar270 * fVar437;
      auVar26._12_4_ = fVar271 * fVar454;
      auVar26._16_4_ = fVar281 * fVar457;
      auVar26._20_4_ = fVar282 * fVar471;
      auVar26._24_4_ = fVar283 * fVar183;
      auVar26._28_4_ = auVar195._28_4_;
      fVar334 = auVar15._0_4_;
      fVar335 = auVar15._4_4_;
      fVar345 = auVar15._8_4_;
      fVar346 = auVar15._12_4_;
      fVar347 = auVar15._16_4_;
      fVar349 = auVar15._20_4_;
      fVar381 = auVar15._24_4_;
      auVar447._0_4_ = fVar214 * fVar427 + fVar334 * fVar426;
      auVar447._4_4_ = fVar215 * fVar436 + fVar335 * fVar429;
      auVar447._8_4_ = fVar216 * fVar439 + fVar345 * fVar438;
      auVar447._12_4_ = fVar259 * fVar456 + fVar346 * fVar455;
      auVar447._16_4_ = fVar260 * fVar470 + fVar347 * fVar469;
      auVar447._20_4_ = fVar261 * fVar182 + fVar349 * fVar116;
      auVar447._24_4_ = fVar262 * fVar186 + fVar381 * fVar184;
      auVar447._28_4_ = fVar213 + auVar14._28_4_;
      auVar10 = vsubps_avx(auVar26,auVar447);
      auVar27._4_4_ = fVar306 * fVar428;
      auVar27._0_4_ = fVar284 * fVar414;
      auVar27._8_4_ = fVar307 * fVar437;
      auVar27._12_4_ = fVar308 * fVar454;
      auVar27._16_4_ = fVar309 * fVar457;
      auVar27._20_4_ = fVar332 * fVar471;
      auVar27._24_4_ = fVar333 * fVar183;
      auVar27._28_4_ = auVar447._28_4_;
      auVar28._4_4_ = fVar215 * fVar429;
      auVar28._0_4_ = fVar214 * fVar426;
      auVar28._8_4_ = fVar216 * fVar438;
      auVar28._12_4_ = fVar259 * fVar455;
      auVar28._16_4_ = fVar260 * fVar469;
      auVar28._20_4_ = fVar261 * fVar116;
      auVar28._24_4_ = fVar262 * fVar184;
      auVar28._28_4_ = fVar213;
      auVar11 = vsubps_avx(auVar27,auVar28);
      auVar448._0_4_ = auVar11._0_4_ + fVar334 * fVar427;
      auVar448._4_4_ = auVar11._4_4_ + fVar335 * fVar436;
      auVar448._8_4_ = auVar11._8_4_ + fVar345 * fVar439;
      auVar448._12_4_ = auVar11._12_4_ + fVar346 * fVar456;
      auVar448._16_4_ = auVar11._16_4_ + fVar347 * fVar470;
      auVar448._20_4_ = auVar11._20_4_ + fVar349 * fVar182;
      auVar448._24_4_ = auVar11._24_4_ + fVar381 * fVar186;
      auVar448._28_4_ = auVar11._28_4_ + fVar213;
      auVar29._4_4_ = fVar306 * fVar429;
      auVar29._0_4_ = fVar284 * fVar426;
      auVar29._8_4_ = fVar307 * fVar438;
      auVar29._12_4_ = fVar308 * fVar455;
      auVar29._16_4_ = fVar309 * fVar469;
      auVar29._20_4_ = fVar332 * fVar116;
      auVar29._24_4_ = fVar333 * fVar184;
      auVar29._28_4_ = auVar264._28_4_;
      auVar463._0_4_ = fVar334 * fVar414 + fVar268 * fVar427;
      auVar463._4_4_ = fVar335 * fVar428 + fVar269 * fVar436;
      auVar463._8_4_ = fVar345 * fVar437 + fVar270 * fVar439;
      auVar463._12_4_ = fVar346 * fVar454 + fVar271 * fVar456;
      auVar463._16_4_ = fVar347 * fVar457 + fVar281 * fVar470;
      auVar463._20_4_ = fVar349 * fVar471 + fVar282 * fVar182;
      auVar463._24_4_ = fVar381 * fVar183 + fVar283 * fVar186;
      auVar463._28_4_ = fVar213 + auVar196._28_4_;
      auVar11 = vsubps_avx(auVar463,auVar29);
      auVar94._4_4_ = fStack_114;
      auVar94._0_4_ = fStack_118;
      auVar94._8_4_ = local_110;
      auVar94._12_4_ = fStack_10c;
      auVar202._16_16_ = auVar94;
      auVar202._0_16_ = auVar94;
      auVar264 = vpermilps_avx(auVar202,0xff);
      auVar195 = vpermilps_avx(auVar202,0xaa);
      auVar196 = vpermilps_avx(auVar202,0);
      fVar438 = auVar13._0_4_ * auVar196._0_4_;
      fVar439 = auVar13._4_4_ * auVar196._4_4_;
      auVar30._4_4_ = fVar439;
      auVar30._0_4_ = fVar438;
      fVar454 = auVar13._8_4_ * auVar196._8_4_;
      auVar30._8_4_ = fVar454;
      fVar455 = auVar13._12_4_ * auVar196._12_4_;
      auVar30._12_4_ = fVar455;
      fVar456 = auVar13._16_4_ * auVar196._16_4_;
      auVar30._16_4_ = fVar456;
      fVar457 = auVar13._20_4_ * auVar196._20_4_;
      auVar30._20_4_ = fVar457;
      fVar469 = auVar13._24_4_ * auVar196._24_4_;
      auVar30._24_4_ = fVar469;
      auVar30._28_4_ = auVar15._28_4_;
      fVar414 = auVar366._0_4_ * auVar196._0_4_;
      fVar426 = auVar366._4_4_ * auVar196._4_4_;
      auVar31._4_4_ = fVar426;
      auVar31._0_4_ = fVar414;
      fVar427 = auVar366._8_4_ * auVar196._8_4_;
      auVar31._8_4_ = fVar427;
      fVar428 = auVar366._12_4_ * auVar196._12_4_;
      auVar31._12_4_ = fVar428;
      fVar429 = auVar366._16_4_ * auVar196._16_4_;
      auVar31._16_4_ = fVar429;
      fVar436 = auVar366._20_4_ * auVar196._20_4_;
      auVar31._20_4_ = fVar436;
      fVar437 = auVar366._24_4_ * auVar196._24_4_;
      auVar31._24_4_ = fVar437;
      auVar31._28_4_ = auVar366._28_4_;
      auVar411._0_4_ = fVar438 + fVar414;
      auVar411._4_4_ = fVar439 + fVar426;
      auVar411._8_4_ = fVar454 + fVar427;
      auVar411._12_4_ = fVar455 + fVar428;
      auVar411._16_4_ = fVar456 + fVar429;
      auVar411._20_4_ = fVar457 + fVar436;
      auVar411._24_4_ = fVar469 + fVar437;
      auVar411._28_4_ = auVar15._28_4_ + auVar366._28_4_;
      auVar196 = vsubps_avx(auVar30,auVar31);
      auVar341._0_4_ = auVar12._0_4_ * auVar195._0_4_;
      auVar341._4_4_ = auVar12._4_4_ * auVar195._4_4_;
      auVar341._8_4_ = auVar12._8_4_ * auVar195._8_4_;
      auVar341._12_4_ = auVar12._12_4_ * auVar195._12_4_;
      auVar341._16_4_ = auVar12._16_4_ * auVar195._16_4_;
      auVar341._20_4_ = auVar12._20_4_ * auVar195._20_4_;
      auVar341._24_4_ = auVar12._24_4_ * auVar195._24_4_;
      auVar341._28_36_ = auVar348;
      auVar373._0_4_ = auVar411._0_4_ + auVar341._0_4_;
      auVar373._4_4_ = auVar411._4_4_ + auVar341._4_4_;
      auVar373._8_4_ = auVar411._8_4_ + auVar341._8_4_;
      auVar373._12_4_ = auVar411._12_4_ + auVar341._12_4_;
      auVar373._16_4_ = auVar411._16_4_ + auVar341._16_4_;
      auVar373._20_4_ = auVar411._20_4_ + auVar341._20_4_;
      auVar373._24_4_ = auVar411._24_4_ + auVar341._24_4_;
      fVar414 = auVar348._0_4_;
      auVar373._28_4_ = auVar411._28_4_ + fVar414;
      auVar366 = vsubps_avx(auVar411,auVar341._0_32_);
      fVar426 = auVar12._0_4_ * auVar264._0_4_;
      fVar427 = auVar12._4_4_ * auVar264._4_4_;
      auVar32._4_4_ = fVar427;
      auVar32._0_4_ = fVar426;
      fVar428 = auVar12._8_4_ * auVar264._8_4_;
      auVar32._8_4_ = fVar428;
      fVar429 = auVar12._12_4_ * auVar264._12_4_;
      auVar32._12_4_ = fVar429;
      fVar436 = auVar12._16_4_ * auVar264._16_4_;
      auVar32._16_4_ = fVar436;
      fVar437 = auVar12._20_4_ * auVar264._20_4_;
      auVar32._20_4_ = fVar437;
      fVar438 = auVar12._24_4_ * auVar264._24_4_;
      auVar32._24_4_ = fVar438;
      auVar32._28_4_ = fVar414;
      auVar393._0_4_ = auVar196._0_4_ + fVar426;
      auVar393._4_4_ = auVar196._4_4_ + fVar427;
      auVar393._8_4_ = auVar196._8_4_ + fVar428;
      auVar393._12_4_ = auVar196._12_4_ + fVar429;
      auVar393._16_4_ = auVar196._16_4_ + fVar436;
      auVar393._20_4_ = auVar196._20_4_ + fVar437;
      auVar393._24_4_ = auVar196._24_4_ + fVar438;
      auVar393._28_4_ = auVar196._28_4_ + fVar414;
      auVar196 = vsubps_avx(auVar196,auVar32);
      auVar264 = vsubps_avx(auVar373,auVar420);
      auVar12 = vsubps_avx(auVar393,auVar10);
      auVar13 = vsubps_avx(auVar196,auVar448);
      auVar195 = vsubps_avx(auVar366,auVar11);
      *(float *)(undefined1 *)local_150._buffer = auVar373._0_4_ + auVar420._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar373._4_4_ + auVar420._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar373._8_4_ + auVar420._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar373._12_4_ + auVar420._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar373._16_4_ + auVar420._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar373._20_4_ + auVar420._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar373._24_4_ + auVar420._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar373._28_4_ + auVar420._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar393._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar393._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar393._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar393._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar393._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar393._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar393._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar393._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar196._0_4_ + auVar448._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar196._4_4_ + auVar448._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar196._8_4_ + auVar448._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar196._12_4_ + auVar448._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar196._16_4_ + auVar448._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar196._20_4_ + auVar448._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar196._24_4_ + auVar448._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar196._28_4_ + auVar448._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar366._0_4_ + auVar11._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar366._4_4_ + auVar11._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar366._8_4_ + auVar11._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar366._12_4_ + auVar11._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar366._16_4_ + auVar11._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar366._20_4_ + auVar11._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar366._24_4_ + auVar11._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar366._28_4_ + auVar11._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar195;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar264;
      auVar141 = ZEXT1664(auVar264._0_16_);
      auVar171 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar173._0_8_ = std::ostream::flush();
    auVar173._8_56_ = extraout_var_31;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar173._0_16_ = ZEXT816(0);
        if (uVar114 < 0x28) {
          auVar172._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar172._8_56_ = extraout_var_32;
          auVar173._4_60_ = auVar172._4_60_;
          auVar173._0_4_ = (float)auVar172._0_8_;
        }
        auVar348 = auVar141._28_36_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar173._0_4_;
        local_130._buffer[uVar114] = auVar173._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar449._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar449._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar464._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar464._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar449,auVar464);
      auVar10 = vunpckhpd_avx(auVar449,auVar464);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar366 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar421._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar421._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar433._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar433._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar196 = vunpcklpd_avx(auVar421,auVar433);
      auVar11 = vunpckhpd_avx(auVar421,auVar433);
      auVar12 = vunpcklps_avx(auVar196,auVar11);
      auVar11 = vunpckhps_avx(auVar196,auVar11);
      auVar264 = vunpcklpd_avx(auVar12,auVar11);
      auVar11 = vunpckhpd_avx(auVar12,auVar11);
      auVar404._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar404._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar412._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar412._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar12 = vunpcklpd_avx(auVar404,auVar412);
      auVar196 = vunpckhpd_avx(auVar404,auVar412);
      auVar13 = vunpcklps_avx(auVar12,auVar196);
      auVar196 = vunpckhps_avx(auVar12,auVar196);
      auVar12 = vunpcklpd_avx(auVar13,auVar196);
      auVar196 = vunpckhpd_avx(auVar13,auVar196);
      auVar13 = vpermilps_avx(auVar366,0);
      auVar195 = vpermilps_avx(auVar366,0x55);
      auVar14 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar130._0_4_ =
           local_120 * auVar13._0_4_ + local_110 * auVar195._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar366._0_4_;
      auVar130._4_4_ =
           fStack_11c * auVar13._4_4_ + fStack_10c * auVar195._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar366._4_4_;
      auVar130._8_4_ =
           fStack_118 * auVar13._8_4_ + fStack_108 * auVar195._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar366._8_4_;
      auVar130._12_4_ =
           fStack_114 * auVar13._12_4_ + fStack_104 * auVar195._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar366._12_4_;
      auVar130._16_4_ =
           local_120 * auVar13._16_4_ + local_110 * auVar195._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar366._16_4_;
      auVar130._20_4_ =
           fStack_11c * auVar13._20_4_ + fStack_10c * auVar195._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar366._20_4_;
      auVar130._24_4_ =
           fStack_118 * auVar13._24_4_ + fStack_108 * auVar195._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar366._24_4_;
      auVar130._28_4_ = auVar13._28_4_ + auVar195._28_4_ + auVar14._28_4_ + auVar366._28_4_;
      auVar366 = vpermilps_avx(auVar264,0);
      auVar13 = vpermilps_avx(auVar264,0x55);
      auVar195 = vpermilps_avx(auVar264,0xaa);
      auVar264 = vpermilps_avx(auVar264,0xff);
      auVar203._0_4_ =
           local_120 * auVar366._0_4_ + local_110 * auVar13._0_4_ +
           local_100 * auVar195._0_4_ + local_f0 * auVar264._0_4_;
      auVar203._4_4_ =
           fStack_11c * auVar366._4_4_ + fStack_10c * auVar13._4_4_ +
           fStack_fc * auVar195._4_4_ + fStack_ec * auVar264._4_4_;
      auVar203._8_4_ =
           fStack_118 * auVar366._8_4_ + fStack_108 * auVar13._8_4_ +
           fStack_f8 * auVar195._8_4_ + fStack_e8 * auVar264._8_4_;
      auVar203._12_4_ =
           fStack_114 * auVar366._12_4_ + fStack_104 * auVar13._12_4_ +
           fStack_f4 * auVar195._12_4_ + fStack_e4 * auVar264._12_4_;
      auVar203._16_4_ =
           local_120 * auVar366._16_4_ + local_110 * auVar13._16_4_ +
           local_100 * auVar195._16_4_ + local_f0 * auVar264._16_4_;
      auVar203._20_4_ =
           fStack_11c * auVar366._20_4_ + fStack_10c * auVar13._20_4_ +
           fStack_fc * auVar195._20_4_ + fStack_ec * auVar264._20_4_;
      auVar203._24_4_ =
           fStack_118 * auVar366._24_4_ + fStack_108 * auVar13._24_4_ +
           fStack_f8 * auVar195._24_4_ + fStack_e8 * auVar264._24_4_;
      auVar203._28_4_ = auVar366._28_4_ + auVar13._28_4_ + auVar195._28_4_ + auVar264._28_4_;
      auVar366 = vpermilps_avx(auVar12,0);
      auVar264 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar255._0_4_ =
           local_120 * auVar366._0_4_ + local_110 * auVar264._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar12._0_4_;
      auVar255._4_4_ =
           fStack_11c * auVar366._4_4_ + fStack_10c * auVar264._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar12._4_4_;
      auVar255._8_4_ =
           fStack_118 * auVar366._8_4_ + fStack_108 * auVar264._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar255._12_4_ =
           fStack_114 * auVar366._12_4_ + fStack_104 * auVar264._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar255._16_4_ =
           local_120 * auVar366._16_4_ + local_110 * auVar264._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar12._16_4_;
      auVar255._20_4_ =
           fStack_11c * auVar366._20_4_ + fStack_10c * auVar264._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar12._20_4_;
      auVar255._24_4_ =
           fStack_118 * auVar366._24_4_ + fStack_108 * auVar264._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar255._28_4_ = auVar366._28_4_ + auVar264._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar102._4_4_ = fStack_dc;
      auVar102._0_4_ = local_e0;
      auVar102._8_4_ = fStack_d8;
      auVar102._12_4_ = fStack_d4;
      auVar374._16_16_ = auVar102;
      auVar374._0_16_ = auVar102;
      auVar366 = vpermilps_avx(auVar10,0);
      auVar264 = vpermilps_avx(auVar10,0x55);
      auVar12 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar276._0_4_ =
           local_e0 * auVar366._0_4_ + local_d0 * auVar264._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar10._0_4_;
      auVar276._4_4_ =
           fStack_dc * auVar366._4_4_ + fStack_cc * auVar264._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar10._4_4_;
      auVar276._8_4_ =
           fStack_d8 * auVar366._8_4_ + fStack_c8 * auVar264._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar276._12_4_ =
           fStack_d4 * auVar366._12_4_ + fStack_c4 * auVar264._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar276._16_4_ =
           local_e0 * auVar366._16_4_ + local_d0 * auVar264._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar10._16_4_;
      auVar276._20_4_ =
           fStack_dc * auVar366._20_4_ + fStack_cc * auVar264._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar10._20_4_;
      auVar276._24_4_ =
           fStack_d8 * auVar366._24_4_ + fStack_c8 * auVar264._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar276._28_4_ = auVar366._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar366 = vpermilps_avx(auVar11,0x55);
      auVar264 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar303._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar366._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar11._0_4_;
      auVar303._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar366._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar11._4_4_;
      auVar303._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar366._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar303._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar366._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar303._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar366._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar11._16_4_;
      auVar303._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar366._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar11._20_4_;
      auVar303._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar366._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar303._28_4_ = auVar10._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar11._28_4_;
      auVar10 = vpermilps_avx(auVar196,0);
      auVar11 = vpermilps_avx(auVar196,0x55);
      auVar366 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      fVar470 = auVar196._28_4_;
      auVar331._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar196._0_4_;
      auVar331._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar196._4_4_;
      auVar331._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar196._8_4_;
      auVar331._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar196._12_4_;
      auVar331._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar196._16_4_;
      auVar331._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar196._20_4_;
      auVar331._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar196._24_4_;
      auVar331._28_4_ = auVar10._28_4_ + auVar11._28_4_ + auVar366._28_4_ + fVar470;
      auVar10 = vsubps_avx(auVar130,auVar276);
      auVar131._0_4_ = auVar130._0_4_ + auVar276._0_4_;
      auVar131._4_4_ = auVar130._4_4_ + auVar276._4_4_;
      auVar131._8_4_ = auVar130._8_4_ + auVar276._8_4_;
      auVar131._12_4_ = auVar130._12_4_ + auVar276._12_4_;
      auVar131._16_4_ = auVar130._16_4_ + auVar276._16_4_;
      auVar131._20_4_ = auVar130._20_4_ + auVar276._20_4_;
      auVar131._24_4_ = auVar130._24_4_ + auVar276._24_4_;
      auVar131._28_4_ = auVar130._28_4_ + auVar276._28_4_;
      auVar11 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar203,auVar303);
      auVar204._0_4_ = auVar203._0_4_ + auVar303._0_4_;
      auVar204._4_4_ = auVar203._4_4_ + auVar303._4_4_;
      auVar204._8_4_ = auVar203._8_4_ + auVar303._8_4_;
      auVar204._12_4_ = auVar203._12_4_ + auVar303._12_4_;
      auVar204._16_4_ = auVar203._16_4_ + auVar303._16_4_;
      auVar204._20_4_ = auVar203._20_4_ + auVar303._20_4_;
      auVar204._24_4_ = auVar203._24_4_ + auVar303._24_4_;
      auVar204._28_4_ = auVar203._28_4_ + auVar303._28_4_;
      auVar13 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar255,auVar331);
      auVar256._0_4_ = auVar255._0_4_ + auVar331._0_4_;
      auVar256._4_4_ = auVar255._4_4_ + auVar331._4_4_;
      auVar256._8_4_ = auVar255._8_4_ + auVar331._8_4_;
      auVar256._12_4_ = auVar255._12_4_ + auVar331._12_4_;
      auVar256._16_4_ = auVar255._16_4_ + auVar331._16_4_;
      auVar256._20_4_ = auVar255._20_4_ + auVar331._20_4_;
      auVar256._24_4_ = auVar255._24_4_ + auVar331._24_4_;
      auVar256._28_4_ = auVar255._28_4_ + auVar331._28_4_;
      auVar195 = vpermilps_avx(auVar10,0x1b);
      auVar366 = vperm2f128_avx(auVar195,auVar256,2);
      auVar196 = vperm2f128_avx(auVar13,auVar204,0x13);
      auVar12 = vperm2f128_avx(auVar13,auVar204,2);
      auVar10 = vperm2f128_avx(auVar11,auVar131,0x13);
      auVar264 = vperm2f128_avx(auVar11,auVar131,2);
      auVar14 = vpermilps_avx(auVar374,0xff);
      auVar15 = vpermilps_avx(auVar374,0xaa);
      auVar16 = vpermilps_avx(auVar374,0x55);
      auVar17 = vpermilps_avx(auVar374,0);
      fVar414 = auVar10._0_4_;
      fVar427 = auVar10._4_4_;
      fVar429 = auVar10._8_4_;
      fVar437 = auVar10._12_4_;
      fVar439 = auVar10._16_4_;
      fVar455 = auVar10._20_4_;
      fVar457 = auVar10._24_4_;
      fVar426 = auVar196._0_4_;
      fVar428 = auVar196._4_4_;
      fVar436 = auVar196._8_4_;
      fVar438 = auVar196._12_4_;
      fVar454 = auVar196._16_4_;
      fVar456 = auVar196._20_4_;
      fVar469 = auVar196._24_4_;
      auVar422._0_4_ = auVar16._0_4_ * fVar426 + auVar17._0_4_ * fVar414;
      auVar422._4_4_ = auVar16._4_4_ * fVar428 + auVar17._4_4_ * fVar427;
      auVar422._8_4_ = auVar16._8_4_ * fVar436 + auVar17._8_4_ * fVar429;
      auVar422._12_4_ = auVar16._12_4_ * fVar438 + auVar17._12_4_ * fVar437;
      auVar422._16_4_ = auVar16._16_4_ * fVar454 + auVar17._16_4_ * fVar439;
      auVar422._20_4_ = auVar16._20_4_ * fVar456 + auVar17._20_4_ * fVar455;
      auVar422._24_4_ = auVar16._24_4_ * fVar469 + auVar17._24_4_ * fVar457;
      auVar422._28_4_ = auVar13._28_4_ + auVar11._28_4_;
      auVar33._4_4_ = auVar16._4_4_ * fVar427;
      auVar33._0_4_ = auVar16._0_4_ * fVar414;
      auVar33._8_4_ = auVar16._8_4_ * fVar429;
      auVar33._12_4_ = auVar16._12_4_ * fVar437;
      auVar33._16_4_ = auVar16._16_4_ * fVar439;
      auVar33._20_4_ = auVar16._20_4_ * fVar455;
      auVar33._24_4_ = auVar16._24_4_ * fVar457;
      auVar33._28_4_ = auVar13._28_4_;
      auVar34._4_4_ = auVar14._4_4_ * fVar428;
      auVar34._0_4_ = auVar14._0_4_ * fVar426;
      auVar34._8_4_ = auVar14._8_4_ * fVar436;
      auVar34._12_4_ = auVar14._12_4_ * fVar438;
      auVar34._16_4_ = auVar14._16_4_ * fVar454;
      auVar34._20_4_ = auVar14._20_4_ * fVar456;
      auVar34._24_4_ = auVar14._24_4_ * fVar469;
      auVar34._28_4_ = auVar195._28_4_;
      auVar10 = vsubps_avx(auVar33,auVar34);
      auVar35._4_4_ = auVar15._4_4_ * fVar427;
      auVar35._0_4_ = auVar15._0_4_ * fVar414;
      auVar35._8_4_ = auVar15._8_4_ * fVar429;
      auVar35._12_4_ = auVar15._12_4_ * fVar437;
      auVar35._16_4_ = auVar15._16_4_ * fVar439;
      auVar35._20_4_ = auVar15._20_4_ * fVar455;
      auVar35._24_4_ = auVar15._24_4_ * fVar457;
      auVar35._28_4_ = auVar195._28_4_;
      auVar36._4_4_ = auVar17._4_4_ * fVar428;
      auVar36._0_4_ = auVar17._0_4_ * fVar426;
      auVar36._8_4_ = auVar17._8_4_ * fVar436;
      auVar36._12_4_ = auVar17._12_4_ * fVar438;
      auVar36._16_4_ = auVar17._16_4_ * fVar454;
      auVar36._20_4_ = auVar17._20_4_ * fVar456;
      auVar36._24_4_ = auVar17._24_4_ * fVar469;
      auVar36._28_4_ = fVar470;
      auVar11 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = auVar14._4_4_ * fVar427;
      auVar37._0_4_ = auVar14._0_4_ * fVar414;
      auVar37._8_4_ = auVar14._8_4_ * fVar429;
      auVar37._12_4_ = auVar14._12_4_ * fVar437;
      auVar37._16_4_ = auVar14._16_4_ * fVar439;
      auVar37._20_4_ = auVar14._20_4_ * fVar455;
      auVar37._24_4_ = auVar14._24_4_ * fVar457;
      auVar37._28_4_ = fVar470;
      auVar38._4_4_ = auVar15._4_4_ * fVar428;
      auVar38._0_4_ = auVar15._0_4_ * fVar426;
      auVar38._8_4_ = auVar15._8_4_ * fVar436;
      auVar38._12_4_ = auVar15._12_4_ * fVar438;
      auVar38._16_4_ = auVar15._16_4_ * fVar454;
      auVar38._20_4_ = auVar15._20_4_ * fVar456;
      auVar38._24_4_ = auVar15._24_4_ * fVar469;
      auVar38._28_4_ = auVar196._28_4_;
      auVar196 = vsubps_avx(auVar37,auVar38);
      auVar95._4_4_ = fStack_114;
      auVar95._0_4_ = fStack_118;
      auVar95._8_4_ = local_110;
      auVar95._12_4_ = fStack_10c;
      auVar205._16_16_ = auVar95;
      auVar205._0_16_ = auVar95;
      auVar13 = vpermilps_avx(auVar205,0xff);
      auVar195 = vpermilps_avx(auVar205,0xaa);
      auVar15 = vpermilps_avx(auVar205,0);
      fVar438 = auVar264._0_4_ * auVar15._0_4_;
      fVar439 = auVar264._4_4_ * auVar15._4_4_;
      auVar39._4_4_ = fVar439;
      auVar39._0_4_ = fVar438;
      fVar454 = auVar264._8_4_ * auVar15._8_4_;
      auVar39._8_4_ = fVar454;
      fVar455 = auVar264._12_4_ * auVar15._12_4_;
      auVar39._12_4_ = fVar455;
      fVar456 = auVar264._16_4_ * auVar15._16_4_;
      auVar39._16_4_ = fVar456;
      fVar457 = auVar264._20_4_ * auVar15._20_4_;
      auVar39._20_4_ = fVar457;
      fVar469 = auVar264._24_4_ * auVar15._24_4_;
      auVar39._24_4_ = fVar469;
      auVar39._28_4_ = auVar14._28_4_;
      fVar414 = auVar366._0_4_ * auVar15._0_4_;
      fVar426 = auVar366._4_4_ * auVar15._4_4_;
      auVar40._4_4_ = fVar426;
      auVar40._0_4_ = fVar414;
      fVar427 = auVar366._8_4_ * auVar15._8_4_;
      auVar40._8_4_ = fVar427;
      fVar428 = auVar366._12_4_ * auVar15._12_4_;
      auVar40._12_4_ = fVar428;
      fVar429 = auVar366._16_4_ * auVar15._16_4_;
      auVar40._16_4_ = fVar429;
      fVar436 = auVar366._20_4_ * auVar15._20_4_;
      auVar40._20_4_ = fVar436;
      fVar437 = auVar366._24_4_ * auVar15._24_4_;
      auVar40._24_4_ = fVar437;
      auVar40._28_4_ = auVar366._28_4_;
      auVar413._0_4_ = fVar438 + fVar414;
      auVar413._4_4_ = fVar439 + fVar426;
      auVar413._8_4_ = fVar454 + fVar427;
      auVar413._12_4_ = fVar455 + fVar428;
      auVar413._16_4_ = fVar456 + fVar429;
      auVar413._20_4_ = fVar457 + fVar436;
      auVar413._24_4_ = fVar469 + fVar437;
      auVar413._28_4_ = auVar14._28_4_ + auVar366._28_4_;
      auVar366 = vsubps_avx(auVar39,auVar40);
      auVar342._0_4_ = auVar12._0_4_ * auVar195._0_4_;
      auVar342._4_4_ = auVar12._4_4_ * auVar195._4_4_;
      auVar342._8_4_ = auVar12._8_4_ * auVar195._8_4_;
      auVar342._12_4_ = auVar12._12_4_ * auVar195._12_4_;
      auVar342._16_4_ = auVar12._16_4_ * auVar195._16_4_;
      auVar342._20_4_ = auVar12._20_4_ * auVar195._20_4_;
      auVar342._24_4_ = auVar12._24_4_ * auVar195._24_4_;
      auVar342._28_36_ = auVar348;
      auVar375._0_4_ = auVar413._0_4_ + auVar342._0_4_;
      auVar375._4_4_ = auVar413._4_4_ + auVar342._4_4_;
      auVar375._8_4_ = auVar413._8_4_ + auVar342._8_4_;
      auVar375._12_4_ = auVar413._12_4_ + auVar342._12_4_;
      auVar375._16_4_ = auVar413._16_4_ + auVar342._16_4_;
      auVar375._20_4_ = auVar413._20_4_ + auVar342._20_4_;
      auVar375._24_4_ = auVar413._24_4_ + auVar342._24_4_;
      fVar414 = auVar348._0_4_;
      auVar375._28_4_ = auVar413._28_4_ + fVar414;
      auVar264 = vsubps_avx(auVar413,auVar342._0_32_);
      fVar426 = auVar12._0_4_ * auVar13._0_4_;
      fVar427 = auVar12._4_4_ * auVar13._4_4_;
      auVar41._4_4_ = fVar427;
      auVar41._0_4_ = fVar426;
      fVar428 = auVar12._8_4_ * auVar13._8_4_;
      auVar41._8_4_ = fVar428;
      fVar429 = auVar12._12_4_ * auVar13._12_4_;
      auVar41._12_4_ = fVar429;
      fVar436 = auVar12._16_4_ * auVar13._16_4_;
      auVar41._16_4_ = fVar436;
      fVar437 = auVar12._20_4_ * auVar13._20_4_;
      auVar41._20_4_ = fVar437;
      fVar438 = auVar12._24_4_ * auVar13._24_4_;
      auVar41._24_4_ = fVar438;
      auVar41._28_4_ = fVar414;
      auVar394._0_4_ = auVar366._0_4_ + fVar426;
      auVar394._4_4_ = auVar366._4_4_ + fVar427;
      auVar394._8_4_ = auVar366._8_4_ + fVar428;
      auVar394._12_4_ = auVar366._12_4_ + fVar429;
      auVar394._16_4_ = auVar366._16_4_ + fVar436;
      auVar394._20_4_ = auVar366._20_4_ + fVar437;
      auVar394._24_4_ = auVar366._24_4_ + fVar438;
      auVar394._28_4_ = auVar366._28_4_ + fVar414;
      auVar366 = vsubps_avx(auVar366,auVar41);
      auVar12 = vsubps_avx(auVar375,auVar422);
      auVar13 = vsubps_avx(auVar394,auVar10);
      auVar195 = vsubps_avx(auVar366,auVar11);
      auVar14 = vsubps_avx(auVar264,auVar196);
      *(float *)(undefined1 *)local_150._buffer = auVar375._0_4_ + auVar422._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar375._4_4_ + auVar422._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar375._8_4_ + auVar422._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar375._12_4_ + auVar422._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar375._16_4_ + auVar422._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar375._20_4_ + auVar422._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar375._24_4_ + auVar422._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar375._28_4_ + auVar422._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar394._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar394._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar394._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar394._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar394._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar394._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar394._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar394._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar366._0_4_ + auVar11._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar366._4_4_ + auVar11._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar366._8_4_ + auVar11._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar366._12_4_ + auVar11._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar366._16_4_ + auVar11._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar366._20_4_ + auVar11._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar366._24_4_ + auVar11._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar366._28_4_ + auVar11._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar264._0_4_ + auVar196._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar264._4_4_ + auVar196._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar264._8_4_ + auVar196._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar264._12_4_ + auVar196._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar264._16_4_ + auVar196._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar264._20_4_ + auVar196._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar264._24_4_ + auVar196._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar264._28_4_ + auVar196._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar14;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar195;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar12;
      auVar141 = ZEXT1664(auVar12._0_16_);
      auVar173 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar175._0_8_ = std::ostream::flush();
    auVar175._8_56_ = extraout_var_33;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar175._0_16_ = ZEXT816(0);
        if (uVar114 < 0x20) {
          auVar174._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar174._8_56_ = extraout_var_34;
          auVar175._4_60_ = auVar174._4_60_;
          auVar175._0_4_ = (float)auVar174._0_8_;
        }
        auVar348 = auVar141._28_36_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar175._0_4_;
        local_130._buffer[uVar114] = auVar175._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar450._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar450._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar465._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar465._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar450,auVar465);
      auVar10 = vunpckhpd_avx(auVar450,auVar465);
      auVar366 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar196 = vunpcklpd_avx(auVar366,auVar10);
      auVar10 = vunpckhpd_avx(auVar366,auVar10);
      auVar423._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar423._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar434._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar434._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar366 = vunpcklpd_avx(auVar423,auVar434);
      auVar11 = vunpckhpd_avx(auVar423,auVar434);
      auVar264 = vunpcklps_avx(auVar366,auVar11);
      auVar11 = vunpckhps_avx(auVar366,auVar11);
      auVar366 = vunpcklpd_avx(auVar264,auVar11);
      auVar11 = vunpckhpd_avx(auVar264,auVar11);
      auVar264 = vpermilps_avx(auVar196,0);
      auVar12 = vpermilps_avx(auVar196,0x55);
      auVar13 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      auVar132._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar196._0_4_;
      auVar132._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar196._4_4_;
      auVar132._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar196._8_4_;
      auVar132._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar196._12_4_;
      auVar132._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar196._16_4_;
      auVar132._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar196._20_4_;
      auVar132._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar196._24_4_;
      auVar132._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar196._28_4_;
      auVar196 = vpermilps_avx(auVar366,0);
      auVar264 = vpermilps_avx(auVar366,0x55);
      auVar12 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar206._0_4_ =
           local_120 * auVar196._0_4_ + local_110 * auVar264._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar366._0_4_;
      auVar206._4_4_ =
           fStack_11c * auVar196._4_4_ + fStack_10c * auVar264._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar366._4_4_;
      auVar206._8_4_ =
           fStack_118 * auVar196._8_4_ + fStack_108 * auVar264._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar366._8_4_;
      auVar206._12_4_ =
           fStack_114 * auVar196._12_4_ + fStack_104 * auVar264._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar366._12_4_;
      auVar206._16_4_ =
           local_120 * auVar196._16_4_ + local_110 * auVar264._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar366._16_4_;
      auVar206._20_4_ =
           fStack_11c * auVar196._20_4_ + fStack_10c * auVar264._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar366._20_4_;
      auVar206._24_4_ =
           fStack_118 * auVar196._24_4_ + fStack_108 * auVar264._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar366._24_4_;
      auVar206._28_4_ = auVar196._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar366._28_4_;
      auVar103._4_4_ = fStack_dc;
      auVar103._0_4_ = local_e0;
      auVar103._8_4_ = fStack_d8;
      auVar103._12_4_ = fStack_d4;
      auVar376._16_16_ = auVar103;
      auVar376._0_16_ = auVar103;
      auVar196 = vpermilps_avx(auVar10,0);
      auVar366 = vpermilps_avx(auVar10,0x55);
      auVar264 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar277._0_4_ =
           local_e0 * auVar196._0_4_ + local_d0 * auVar366._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar10._0_4_;
      auVar277._4_4_ =
           fStack_dc * auVar196._4_4_ + fStack_cc * auVar366._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar10._4_4_;
      auVar277._8_4_ =
           fStack_d8 * auVar196._8_4_ + fStack_c8 * auVar366._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar277._12_4_ =
           fStack_d4 * auVar196._12_4_ + fStack_c4 * auVar366._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar277._16_4_ =
           local_e0 * auVar196._16_4_ + local_d0 * auVar366._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar10._16_4_;
      auVar277._20_4_ =
           fStack_dc * auVar196._20_4_ + fStack_cc * auVar366._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar10._20_4_;
      auVar277._24_4_ =
           fStack_d8 * auVar196._24_4_ + fStack_c8 * auVar366._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar277._28_4_ = auVar196._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar196 = vpermilps_avx(auVar11,0x55);
      auVar366 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      fVar470 = auVar11._28_4_;
      fVar471 = auVar366._28_4_ + fVar470;
      auVar304._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar196._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar11._0_4_;
      auVar304._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar196._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar11._4_4_;
      auVar304._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar196._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar304._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar196._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar304._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar196._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar11._16_4_;
      auVar304._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar196._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar11._20_4_;
      auVar304._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar196._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar304._28_4_ = auVar10._28_4_ + auVar196._28_4_ + fVar471;
      auVar10 = vsubps_avx(auVar132,auVar277);
      auVar133._0_4_ = auVar132._0_4_ + auVar277._0_4_;
      auVar133._4_4_ = auVar132._4_4_ + auVar277._4_4_;
      auVar133._8_4_ = auVar132._8_4_ + auVar277._8_4_;
      auVar133._12_4_ = auVar132._12_4_ + auVar277._12_4_;
      auVar133._16_4_ = auVar132._16_4_ + auVar277._16_4_;
      auVar133._20_4_ = auVar132._20_4_ + auVar277._20_4_;
      auVar133._24_4_ = auVar132._24_4_ + auVar277._24_4_;
      auVar133._28_4_ = auVar132._28_4_ + auVar277._28_4_;
      auVar11 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar206,auVar304);
      auVar207._0_4_ = auVar206._0_4_ + auVar304._0_4_;
      auVar207._4_4_ = auVar206._4_4_ + auVar304._4_4_;
      auVar207._8_4_ = auVar206._8_4_ + auVar304._8_4_;
      auVar207._12_4_ = auVar206._12_4_ + auVar304._12_4_;
      auVar207._16_4_ = auVar206._16_4_ + auVar304._16_4_;
      auVar207._20_4_ = auVar206._20_4_ + auVar304._20_4_;
      auVar207._24_4_ = auVar206._24_4_ + auVar304._24_4_;
      auVar207._28_4_ = auVar206._28_4_ + auVar304._28_4_;
      auVar12 = vpermilps_avx(auVar10,0x1b);
      auVar196 = vperm2f128_avx(auVar12,auVar207,0x13);
      auVar264 = vperm2f128_avx(auVar12,auVar207,2);
      auVar10 = vperm2f128_avx(auVar11,auVar133,0x13);
      auVar366 = vperm2f128_avx(auVar11,auVar133,2);
      auVar13 = vpermilps_avx(auVar376,0xff);
      auVar195 = vpermilps_avx(auVar376,0xaa);
      auVar14 = vpermilps_avx(auVar376,0x55);
      auVar15 = vpermilps_avx(auVar376,0);
      fVar414 = auVar10._0_4_;
      fVar427 = auVar10._4_4_;
      fVar429 = auVar10._8_4_;
      fVar437 = auVar10._12_4_;
      fVar439 = auVar10._16_4_;
      fVar455 = auVar10._20_4_;
      fVar457 = auVar10._24_4_;
      fVar426 = auVar196._0_4_;
      fVar428 = auVar196._4_4_;
      fVar436 = auVar196._8_4_;
      fVar438 = auVar196._12_4_;
      fVar454 = auVar196._16_4_;
      fVar456 = auVar196._20_4_;
      fVar469 = auVar196._24_4_;
      auVar424._0_4_ = auVar14._0_4_ * fVar426 + auVar15._0_4_ * fVar414;
      auVar424._4_4_ = auVar14._4_4_ * fVar428 + auVar15._4_4_ * fVar427;
      auVar424._8_4_ = auVar14._8_4_ * fVar436 + auVar15._8_4_ * fVar429;
      auVar424._12_4_ = auVar14._12_4_ * fVar438 + auVar15._12_4_ * fVar437;
      auVar424._16_4_ = auVar14._16_4_ * fVar454 + auVar15._16_4_ * fVar439;
      auVar424._20_4_ = auVar14._20_4_ * fVar456 + auVar15._20_4_ * fVar455;
      auVar424._24_4_ = auVar14._24_4_ * fVar469 + auVar15._24_4_ * fVar457;
      auVar424._28_4_ = auVar12._28_4_ + auVar11._28_4_;
      auVar42._4_4_ = auVar14._4_4_ * fVar427;
      auVar42._0_4_ = auVar14._0_4_ * fVar414;
      auVar42._8_4_ = auVar14._8_4_ * fVar429;
      auVar42._12_4_ = auVar14._12_4_ * fVar437;
      auVar42._16_4_ = auVar14._16_4_ * fVar439;
      auVar42._20_4_ = auVar14._20_4_ * fVar455;
      auVar42._24_4_ = auVar14._24_4_ * fVar457;
      auVar42._28_4_ = auVar12._28_4_;
      auVar43._4_4_ = auVar13._4_4_ * fVar428;
      auVar43._0_4_ = auVar13._0_4_ * fVar426;
      auVar43._8_4_ = auVar13._8_4_ * fVar436;
      auVar43._12_4_ = auVar13._12_4_ * fVar438;
      auVar43._16_4_ = auVar13._16_4_ * fVar454;
      auVar43._20_4_ = auVar13._20_4_ * fVar456;
      auVar43._24_4_ = auVar13._24_4_ * fVar469;
      auVar43._28_4_ = fVar471;
      auVar10 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar195._4_4_ * fVar427;
      auVar44._0_4_ = auVar195._0_4_ * fVar414;
      auVar44._8_4_ = auVar195._8_4_ * fVar429;
      auVar44._12_4_ = auVar195._12_4_ * fVar437;
      auVar44._16_4_ = auVar195._16_4_ * fVar439;
      auVar44._20_4_ = auVar195._20_4_ * fVar455;
      auVar44._24_4_ = auVar195._24_4_ * fVar457;
      auVar44._28_4_ = fVar471;
      auVar45._4_4_ = auVar15._4_4_ * fVar428;
      auVar45._0_4_ = auVar15._0_4_ * fVar426;
      auVar45._8_4_ = auVar15._8_4_ * fVar436;
      auVar45._12_4_ = auVar15._12_4_ * fVar438;
      auVar45._16_4_ = auVar15._16_4_ * fVar454;
      auVar45._20_4_ = auVar15._20_4_ * fVar456;
      auVar45._24_4_ = auVar15._24_4_ * fVar469;
      auVar45._28_4_ = fVar470;
      auVar11 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar13._4_4_ * fVar427;
      auVar46._0_4_ = auVar13._0_4_ * fVar414;
      auVar46._8_4_ = auVar13._8_4_ * fVar429;
      auVar46._12_4_ = auVar13._12_4_ * fVar437;
      auVar46._16_4_ = auVar13._16_4_ * fVar439;
      auVar46._20_4_ = auVar13._20_4_ * fVar455;
      auVar46._24_4_ = auVar13._24_4_ * fVar457;
      auVar46._28_4_ = fVar470;
      auVar47._4_4_ = auVar195._4_4_ * fVar428;
      auVar47._0_4_ = auVar195._0_4_ * fVar426;
      auVar47._8_4_ = auVar195._8_4_ * fVar436;
      auVar47._12_4_ = auVar195._12_4_ * fVar438;
      auVar47._16_4_ = auVar195._16_4_ * fVar454;
      auVar47._20_4_ = auVar195._20_4_ * fVar456;
      auVar47._24_4_ = auVar195._24_4_ * fVar469;
      auVar47._28_4_ = auVar196._28_4_;
      auVar196 = vsubps_avx(auVar46,auVar47);
      auVar96._4_4_ = fStack_114;
      auVar96._0_4_ = fStack_118;
      auVar96._8_4_ = local_110;
      auVar96._12_4_ = fStack_10c;
      auVar208._16_16_ = auVar96;
      auVar208._0_16_ = auVar96;
      auVar12 = vpermilps_avx(auVar208,0xff);
      auVar195 = vpermilps_avx(auVar208,0xaa);
      auVar14 = vpermilps_avx(auVar208,0);
      fVar454 = auVar366._0_4_ * auVar14._0_4_;
      fVar455 = auVar366._4_4_ * auVar14._4_4_;
      auVar48._4_4_ = fVar455;
      auVar48._0_4_ = fVar454;
      fVar456 = auVar366._8_4_ * auVar14._8_4_;
      auVar48._8_4_ = fVar456;
      fVar457 = auVar366._12_4_ * auVar14._12_4_;
      auVar48._12_4_ = fVar457;
      fVar469 = auVar366._16_4_ * auVar14._16_4_;
      auVar48._16_4_ = fVar469;
      fVar470 = auVar366._20_4_ * auVar14._20_4_;
      auVar48._20_4_ = fVar470;
      fVar426 = auVar13._28_4_;
      fVar471 = auVar366._24_4_ * auVar14._24_4_;
      auVar48._24_4_ = fVar471;
      auVar48._28_4_ = fVar426;
      auVar343._0_4_ = auVar264._0_4_ * auVar195._0_4_;
      auVar343._4_4_ = auVar264._4_4_ * auVar195._4_4_;
      auVar343._8_4_ = auVar264._8_4_ * auVar195._8_4_;
      auVar343._12_4_ = auVar264._12_4_ * auVar195._12_4_;
      auVar343._16_4_ = auVar264._16_4_ * auVar195._16_4_;
      auVar343._20_4_ = auVar264._20_4_ * auVar195._20_4_;
      auVar343._24_4_ = auVar264._24_4_ * auVar195._24_4_;
      auVar343._28_36_ = auVar348;
      auVar377._0_4_ = fVar454 + auVar343._0_4_;
      auVar377._4_4_ = fVar455 + auVar343._4_4_;
      auVar377._8_4_ = fVar456 + auVar343._8_4_;
      auVar377._12_4_ = fVar457 + auVar343._12_4_;
      auVar377._16_4_ = fVar469 + auVar343._16_4_;
      auVar377._20_4_ = fVar470 + auVar343._20_4_;
      auVar377._24_4_ = fVar471 + auVar343._24_4_;
      fVar414 = auVar348._0_4_;
      auVar377._28_4_ = fVar426 + fVar414;
      auVar366 = vsubps_avx(auVar48,auVar343._0_32_);
      fVar427 = auVar264._0_4_ * auVar12._0_4_;
      fVar428 = auVar264._4_4_ * auVar12._4_4_;
      auVar49._4_4_ = fVar428;
      auVar49._0_4_ = fVar427;
      fVar429 = auVar264._8_4_ * auVar12._8_4_;
      auVar49._8_4_ = fVar429;
      fVar436 = auVar264._12_4_ * auVar12._12_4_;
      auVar49._12_4_ = fVar436;
      fVar437 = auVar264._16_4_ * auVar12._16_4_;
      auVar49._16_4_ = fVar437;
      fVar438 = auVar264._20_4_ * auVar12._20_4_;
      auVar49._20_4_ = fVar438;
      fVar439 = auVar264._24_4_ * auVar12._24_4_;
      auVar49._24_4_ = fVar439;
      auVar49._28_4_ = fVar414;
      auVar395._0_4_ = fVar454 + fVar427;
      auVar395._4_4_ = fVar455 + fVar428;
      auVar395._8_4_ = fVar456 + fVar429;
      auVar395._12_4_ = fVar457 + fVar436;
      auVar395._16_4_ = fVar469 + fVar437;
      auVar395._20_4_ = fVar470 + fVar438;
      auVar395._24_4_ = fVar471 + fVar439;
      auVar395._28_4_ = fVar426 + fVar414;
      auVar264 = vsubps_avx(auVar48,auVar49);
      auVar12 = vsubps_avx(auVar377,auVar424);
      auVar13 = vsubps_avx(auVar395,auVar10);
      auVar195 = vsubps_avx(auVar264,auVar11);
      auVar14 = vsubps_avx(auVar366,auVar196);
      *(float *)(undefined1 *)local_150._buffer = auVar377._0_4_ + auVar424._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar377._4_4_ + auVar424._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar377._8_4_ + auVar424._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar377._12_4_ + auVar424._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar377._16_4_ + auVar424._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar377._20_4_ + auVar424._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar377._24_4_ + auVar424._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar377._28_4_ + auVar424._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar395._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar395._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar395._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar395._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar395._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar395._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar395._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar395._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar264._0_4_ + auVar11._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar264._4_4_ + auVar11._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar264._8_4_ + auVar11._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar264._12_4_ + auVar11._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar264._16_4_ + auVar11._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar264._20_4_ + auVar11._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar264._24_4_ + auVar11._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar264._28_4_ + auVar11._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar366._0_4_ + auVar196._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar366._4_4_ + auVar196._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar366._8_4_ + auVar196._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar366._12_4_ + auVar196._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar366._16_4_ + auVar196._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar366._20_4_ + auVar196._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar366._24_4_ + auVar196._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar366._28_4_ + auVar196._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar14;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar195;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar12;
      auVar141 = ZEXT1664(auVar12._0_16_);
      auVar175 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar177._0_8_ = std::ostream::flush();
    auVar177._8_56_ = extraout_var_35;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar177._0_16_ = ZEXT816(0);
        if (uVar114 < 0x18) {
          auVar176._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar176._8_56_ = extraout_var_36;
          auVar177._4_60_ = auVar176._4_60_;
          auVar177._0_4_ = (float)auVar176._0_8_;
        }
        auVar348 = auVar141._28_36_;
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar177._0_4_;
        local_130._buffer[uVar114] = auVar177._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar451._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar451._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar466._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar466._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar451,auVar466);
      auVar10 = vunpckhpd_avx(auVar451,auVar466);
      auVar366 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar196 = vunpcklpd_avx(auVar366,auVar10);
      auVar10 = vunpckhpd_avx(auVar366,auVar10);
      auVar425._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar425._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar435._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar435._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar366 = vunpcklpd_avx(auVar425,auVar435);
      auVar11 = vunpckhpd_avx(auVar425,auVar435);
      auVar264 = vunpcklps_avx(auVar366,auVar11);
      auVar11 = vunpckhps_avx(auVar366,auVar11);
      auVar366 = vunpcklpd_avx(auVar264,auVar11);
      auVar11 = vunpckhpd_avx(auVar264,auVar11);
      auVar264 = vpermilps_avx(auVar196,0);
      auVar12 = vpermilps_avx(auVar196,0x55);
      auVar13 = vpermilps_avx(auVar196,0xaa);
      auVar196 = vpermilps_avx(auVar196,0xff);
      auVar134._0_4_ =
           local_120 * auVar264._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar196._0_4_;
      auVar134._4_4_ =
           fStack_11c * auVar264._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar196._4_4_;
      auVar134._8_4_ =
           fStack_118 * auVar264._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar196._8_4_;
      auVar134._12_4_ =
           fStack_114 * auVar264._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar196._12_4_;
      auVar134._16_4_ =
           local_120 * auVar264._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar196._16_4_;
      auVar134._20_4_ =
           fStack_11c * auVar264._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar196._20_4_;
      auVar134._24_4_ =
           fStack_118 * auVar264._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar196._24_4_;
      auVar134._28_4_ = auVar264._28_4_ + auVar12._28_4_ + auVar13._28_4_ + auVar196._28_4_;
      auVar196 = vpermilps_avx(auVar366,0);
      auVar264 = vpermilps_avx(auVar366,0x55);
      auVar12 = vpermilps_avx(auVar366,0xaa);
      auVar366 = vpermilps_avx(auVar366,0xff);
      auVar209._0_4_ =
           local_120 * auVar196._0_4_ + local_110 * auVar264._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar366._0_4_;
      auVar209._4_4_ =
           fStack_11c * auVar196._4_4_ + fStack_10c * auVar264._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar366._4_4_;
      auVar209._8_4_ =
           fStack_118 * auVar196._8_4_ + fStack_108 * auVar264._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar366._8_4_;
      auVar209._12_4_ =
           fStack_114 * auVar196._12_4_ + fStack_104 * auVar264._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar366._12_4_;
      auVar209._16_4_ =
           local_120 * auVar196._16_4_ + local_110 * auVar264._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar366._16_4_;
      auVar209._20_4_ =
           fStack_11c * auVar196._20_4_ + fStack_10c * auVar264._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar366._20_4_;
      auVar209._24_4_ =
           fStack_118 * auVar196._24_4_ + fStack_108 * auVar264._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar366._24_4_;
      auVar209._28_4_ = auVar196._28_4_ + auVar264._28_4_ + auVar12._28_4_ + auVar366._28_4_;
      auVar104._4_4_ = fStack_dc;
      auVar104._0_4_ = local_e0;
      auVar104._8_4_ = fStack_d8;
      auVar104._12_4_ = fStack_d4;
      auVar378._16_16_ = auVar104;
      auVar378._0_16_ = auVar104;
      auVar196 = vpermilps_avx(auVar10,0);
      auVar366 = vpermilps_avx(auVar10,0x55);
      auVar264 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar278._0_4_ =
           local_e0 * auVar196._0_4_ + local_d0 * auVar366._0_4_ +
           local_c0 * auVar264._0_4_ + local_b0 * auVar10._0_4_;
      auVar278._4_4_ =
           fStack_dc * auVar196._4_4_ + fStack_cc * auVar366._4_4_ +
           fStack_bc * auVar264._4_4_ + fStack_ac * auVar10._4_4_;
      auVar278._8_4_ =
           fStack_d8 * auVar196._8_4_ + fStack_c8 * auVar366._8_4_ +
           fStack_b8 * auVar264._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar278._12_4_ =
           fStack_d4 * auVar196._12_4_ + fStack_c4 * auVar366._12_4_ +
           fStack_b4 * auVar264._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar278._16_4_ =
           local_e0 * auVar196._16_4_ + local_d0 * auVar366._16_4_ +
           local_c0 * auVar264._16_4_ + local_b0 * auVar10._16_4_;
      auVar278._20_4_ =
           fStack_dc * auVar196._20_4_ + fStack_cc * auVar366._20_4_ +
           fStack_bc * auVar264._20_4_ + fStack_ac * auVar10._20_4_;
      auVar278._24_4_ =
           fStack_d8 * auVar196._24_4_ + fStack_c8 * auVar366._24_4_ +
           fStack_b8 * auVar264._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar278._28_4_ = auVar196._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar11,0);
      auVar196 = vpermilps_avx(auVar11,0x55);
      auVar366 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      fVar439 = auVar11._28_4_;
      fVar345 = auVar366._28_4_ + fVar439;
      auVar305._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar196._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar11._0_4_;
      auVar305._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar196._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar11._4_4_;
      auVar305._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar196._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar305._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar196._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar305._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar196._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar11._16_4_;
      auVar305._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar196._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar11._20_4_;
      auVar305._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar196._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar305._28_4_ = auVar10._28_4_ + auVar196._28_4_ + fVar345;
      auVar10 = vsubps_avx(auVar134,auVar278);
      auVar135._0_4_ = auVar134._0_4_ + auVar278._0_4_;
      auVar135._4_4_ = auVar134._4_4_ + auVar278._4_4_;
      auVar135._8_4_ = auVar134._8_4_ + auVar278._8_4_;
      auVar135._12_4_ = auVar134._12_4_ + auVar278._12_4_;
      auVar135._16_4_ = auVar134._16_4_ + auVar278._16_4_;
      auVar135._20_4_ = auVar134._20_4_ + auVar278._20_4_;
      auVar135._24_4_ = auVar134._24_4_ + auVar278._24_4_;
      auVar135._28_4_ = auVar134._28_4_ + auVar278._28_4_;
      auVar12 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vsubps_avx(auVar209,auVar305);
      auVar210._0_4_ = auVar209._0_4_ + auVar305._0_4_;
      auVar210._4_4_ = auVar209._4_4_ + auVar305._4_4_;
      auVar210._8_4_ = auVar209._8_4_ + auVar305._8_4_;
      auVar210._12_4_ = auVar209._12_4_ + auVar305._12_4_;
      auVar210._16_4_ = auVar209._16_4_ + auVar305._16_4_;
      auVar210._20_4_ = auVar209._20_4_ + auVar305._20_4_;
      auVar210._24_4_ = auVar209._24_4_ + auVar305._24_4_;
      auVar210._28_4_ = auVar209._28_4_ + auVar305._28_4_;
      auVar13 = vpermilps_avx(auVar10,0x1b);
      auVar11 = vperm2f128_avx(auVar13,auVar210,2);
      auVar10 = vperm2f128_avx(auVar12,auVar135,0x13);
      auVar196 = vperm2f128_avx(auVar12,auVar135,2);
      auVar366 = vpermilps_avx(auVar378,0xff);
      auVar264 = vpermilps_avx(auVar378,0xaa);
      auVar195 = vpermilps_avx(auVar378,0x55);
      auVar14 = vpermilps_avx(auVar378,0);
      fVar426 = auVar10._0_4_;
      fVar216 = auVar14._0_4_ * fVar426;
      fVar427 = auVar10._4_4_;
      fVar259 = auVar14._4_4_ * fVar427;
      auVar50._4_4_ = fVar259;
      auVar50._0_4_ = fVar216;
      fVar428 = auVar10._8_4_;
      fVar260 = auVar14._8_4_ * fVar428;
      auVar50._8_4_ = fVar260;
      fVar429 = auVar10._12_4_;
      fVar261 = auVar14._12_4_ * fVar429;
      auVar50._12_4_ = fVar261;
      fVar436 = auVar10._16_4_;
      fVar262 = auVar14._16_4_ * fVar436;
      auVar50._16_4_ = fVar262;
      fVar437 = auVar10._20_4_;
      fVar268 = auVar14._20_4_ * fVar437;
      auVar50._20_4_ = fVar268;
      fVar438 = auVar10._24_4_;
      fVar269 = auVar14._24_4_ * fVar438;
      auVar50._24_4_ = fVar269;
      auVar50._28_4_ = auVar12._28_4_;
      fVar270 = auVar195._0_4_ * fVar426;
      fVar271 = auVar195._4_4_ * fVar427;
      auVar51._4_4_ = fVar271;
      auVar51._0_4_ = fVar270;
      fVar281 = auVar195._8_4_ * fVar428;
      auVar51._8_4_ = fVar281;
      fVar282 = auVar195._12_4_ * fVar429;
      auVar51._12_4_ = fVar282;
      fVar283 = auVar195._16_4_ * fVar436;
      auVar51._16_4_ = fVar283;
      fVar284 = auVar195._20_4_ * fVar437;
      auVar51._20_4_ = fVar284;
      fVar306 = auVar195._24_4_ * fVar438;
      auVar51._24_4_ = fVar306;
      auVar51._28_4_ = auVar13._28_4_;
      fVar307 = auVar264._0_4_ * fVar426;
      fVar308 = auVar264._4_4_ * fVar427;
      auVar52._4_4_ = fVar308;
      auVar52._0_4_ = fVar307;
      fVar309 = auVar264._8_4_ * fVar428;
      auVar52._8_4_ = fVar309;
      fVar332 = auVar264._12_4_ * fVar429;
      auVar52._12_4_ = fVar332;
      fVar333 = auVar264._16_4_ * fVar436;
      auVar52._16_4_ = fVar333;
      fVar334 = auVar264._20_4_ * fVar437;
      auVar52._20_4_ = fVar334;
      fVar335 = auVar264._24_4_ * fVar438;
      auVar52._24_4_ = fVar335;
      auVar52._28_4_ = fVar345;
      fVar426 = auVar366._0_4_ * fVar426;
      fVar427 = auVar366._4_4_ * fVar427;
      auVar53._4_4_ = fVar427;
      auVar53._0_4_ = fVar426;
      fVar428 = auVar366._8_4_ * fVar428;
      auVar53._8_4_ = fVar428;
      fVar429 = auVar366._12_4_ * fVar429;
      auVar53._12_4_ = fVar429;
      fVar436 = auVar366._16_4_ * fVar436;
      auVar53._16_4_ = fVar436;
      fVar437 = auVar366._20_4_ * fVar437;
      auVar53._20_4_ = fVar437;
      fVar438 = auVar366._24_4_ * fVar438;
      auVar53._24_4_ = fVar438;
      auVar53._28_4_ = fVar439;
      auVar97._4_4_ = fStack_114;
      auVar97._0_4_ = fStack_118;
      auVar97._8_4_ = local_110;
      auVar97._12_4_ = fStack_10c;
      auVar211._16_16_ = auVar97;
      auVar211._0_16_ = auVar97;
      auVar264 = vpermilps_avx(auVar211,0xff);
      auVar10 = vpermilps_avx(auVar211,0xaa);
      auVar195 = vpermilps_avx(auVar211,0);
      fVar182 = auVar196._0_4_ * auVar195._0_4_;
      fVar183 = auVar196._4_4_ * auVar195._4_4_;
      auVar54._4_4_ = fVar183;
      auVar54._0_4_ = fVar182;
      fVar184 = auVar196._8_4_ * auVar195._8_4_;
      auVar54._8_4_ = fVar184;
      fVar186 = auVar196._12_4_ * auVar195._12_4_;
      auVar54._12_4_ = fVar186;
      fVar213 = auVar196._16_4_ * auVar195._16_4_;
      auVar54._16_4_ = fVar213;
      fVar214 = auVar196._20_4_ * auVar195._20_4_;
      auVar54._20_4_ = fVar214;
      fVar454 = auVar366._28_4_;
      fVar215 = auVar196._24_4_ * auVar195._24_4_;
      auVar54._24_4_ = fVar215;
      auVar54._28_4_ = fVar454;
      auVar344._0_4_ = auVar11._0_4_ * auVar10._0_4_;
      auVar344._4_4_ = auVar11._4_4_ * auVar10._4_4_;
      auVar344._8_4_ = auVar11._8_4_ * auVar10._8_4_;
      auVar344._12_4_ = auVar11._12_4_ * auVar10._12_4_;
      auVar344._16_4_ = auVar11._16_4_ * auVar10._16_4_;
      auVar344._20_4_ = auVar11._20_4_ * auVar10._20_4_;
      auVar344._24_4_ = auVar11._24_4_ * auVar10._24_4_;
      auVar344._28_36_ = auVar348;
      auVar379._0_4_ = fVar182 + auVar344._0_4_;
      auVar379._4_4_ = fVar183 + auVar344._4_4_;
      auVar379._8_4_ = fVar184 + auVar344._8_4_;
      auVar379._12_4_ = fVar186 + auVar344._12_4_;
      auVar379._16_4_ = fVar213 + auVar344._16_4_;
      auVar379._20_4_ = fVar214 + auVar344._20_4_;
      auVar379._24_4_ = fVar215 + auVar344._24_4_;
      fVar414 = auVar348._0_4_;
      auVar379._28_4_ = fVar454 + fVar414;
      auVar10 = vsubps_avx(auVar54,auVar344._0_32_);
      fVar455 = auVar11._0_4_ * auVar264._0_4_;
      fVar456 = auVar11._4_4_ * auVar264._4_4_;
      auVar55._4_4_ = fVar456;
      auVar55._0_4_ = fVar455;
      fVar457 = auVar11._8_4_ * auVar264._8_4_;
      auVar55._8_4_ = fVar457;
      fVar469 = auVar11._12_4_ * auVar264._12_4_;
      auVar55._12_4_ = fVar469;
      fVar470 = auVar11._16_4_ * auVar264._16_4_;
      auVar55._16_4_ = fVar470;
      fVar471 = auVar11._20_4_ * auVar264._20_4_;
      auVar55._20_4_ = fVar471;
      fVar116 = auVar11._24_4_ * auVar264._24_4_;
      auVar55._24_4_ = fVar116;
      auVar55._28_4_ = fVar414;
      auVar396._0_4_ = fVar182 + fVar455;
      auVar396._4_4_ = fVar183 + fVar456;
      auVar396._8_4_ = fVar184 + fVar457;
      auVar396._12_4_ = fVar186 + fVar469;
      auVar396._16_4_ = fVar213 + fVar470;
      auVar396._20_4_ = fVar214 + fVar471;
      auVar396._24_4_ = fVar215 + fVar116;
      auVar396._28_4_ = fVar454 + fVar414;
      auVar11 = vsubps_avx(auVar54,auVar55);
      auVar257._0_4_ = auVar11._0_4_ + fVar307;
      auVar257._4_4_ = auVar11._4_4_ + fVar308;
      auVar257._8_4_ = auVar11._8_4_ + fVar309;
      auVar257._12_4_ = auVar11._12_4_ + fVar332;
      auVar257._16_4_ = auVar11._16_4_ + fVar333;
      auVar257._20_4_ = auVar11._20_4_ + fVar334;
      auVar257._24_4_ = auVar11._24_4_ + fVar335;
      auVar257._28_4_ = auVar11._28_4_ + fVar345;
      auVar196 = vsubps_avx(auVar379,auVar50);
      auVar366 = vsubps_avx(auVar396,auVar51);
      auVar11 = vsubps_avx(auVar11,auVar52);
      auVar264 = vsubps_avx(auVar10,auVar53);
      *(float *)(undefined1 *)local_150._buffer = auVar379._0_4_ + fVar216;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar379._4_4_ + fVar259;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar379._8_4_ + fVar260;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar379._12_4_ + fVar261;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar379._16_4_ + fVar262;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar379._20_4_ + fVar268;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar379._24_4_ + fVar269;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar379._28_4_ + auVar12._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar396._0_4_ + fVar270;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar396._4_4_ + fVar271;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar396._8_4_ + fVar281;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar396._12_4_ + fVar282;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = auVar396._16_4_ + fVar283;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar396._20_4_ + fVar284;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar396._24_4_ + fVar306;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar396._28_4_ + auVar13._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x40) = auVar257;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = auVar10._0_4_ + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar10._4_4_ + fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar10._8_4_ + fVar428;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar10._12_4_ + fVar429;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar10._16_4_ + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar10._20_4_ + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar10._24_4_ + fVar438;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar10._28_4_ + fVar439;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar264;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar11;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar366;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar196;
      auVar141 = ZEXT1664(auVar196._0_16_);
      auVar177 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar179._0_8_ = std::ostream::flush();
    auVar179._8_56_ = extraout_var_37;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar179._0_16_ = ZEXT816(0);
        if (uVar114 < 0x10) {
          auVar178._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar178._8_56_ = extraout_var_38;
          auVar179._4_60_ = auVar178._4_60_;
          auVar179._0_4_ = (float)auVar178._0_8_;
        }
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar179._0_4_;
        local_130._buffer[uVar114] = auVar179._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar452._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar452._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar467._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar467._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar452,auVar467);
      auVar10 = vunpckhpd_avx(auVar452,auVar467);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar11 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar196 = vpermilps_avx(auVar11,0);
      auVar366 = vpermilps_avx(auVar11,0x55);
      auVar264 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar136._0_4_ =
           local_120 * auVar196._0_4_ + local_110 * auVar366._0_4_ +
           local_100 * auVar264._0_4_ + local_f0 * auVar11._0_4_;
      auVar136._4_4_ =
           fStack_11c * auVar196._4_4_ + fStack_10c * auVar366._4_4_ +
           fStack_fc * auVar264._4_4_ + fStack_ec * auVar11._4_4_;
      auVar136._8_4_ =
           fStack_118 * auVar196._8_4_ + fStack_108 * auVar366._8_4_ +
           fStack_f8 * auVar264._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar136._12_4_ =
           fStack_114 * auVar196._12_4_ + fStack_104 * auVar366._12_4_ +
           fStack_f4 * auVar264._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar136._16_4_ =
           local_120 * auVar196._16_4_ + local_110 * auVar366._16_4_ +
           local_100 * auVar264._16_4_ + local_f0 * auVar11._16_4_;
      auVar136._20_4_ =
           fStack_11c * auVar196._20_4_ + fStack_10c * auVar366._20_4_ +
           fStack_fc * auVar264._20_4_ + fStack_ec * auVar11._20_4_;
      auVar136._24_4_ =
           fStack_118 * auVar196._24_4_ + fStack_108 * auVar366._24_4_ +
           fStack_f8 * auVar264._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar136._28_4_ = auVar196._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar11._28_4_;
      auVar105._4_4_ = fStack_dc;
      auVar105._0_4_ = local_e0;
      auVar105._8_4_ = fStack_d8;
      auVar105._12_4_ = fStack_d4;
      auVar380._16_16_ = auVar105;
      auVar380._0_16_ = auVar105;
      auVar11 = vpermilps_avx(auVar10,0);
      auVar196 = vpermilps_avx(auVar10,0x55);
      auVar366 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar438 = auVar196._28_4_;
      fVar439 = auVar10._28_4_;
      fVar307 = auVar366._28_4_ + fVar439;
      auVar279._0_4_ =
           local_e0 * auVar11._0_4_ + local_d0 * auVar196._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar10._0_4_;
      auVar279._4_4_ =
           fStack_dc * auVar11._4_4_ + fStack_cc * auVar196._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar10._4_4_;
      auVar279._8_4_ =
           fStack_d8 * auVar11._8_4_ + fStack_c8 * auVar196._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar279._12_4_ =
           fStack_d4 * auVar11._12_4_ + fStack_c4 * auVar196._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar279._16_4_ =
           local_e0 * auVar11._16_4_ + local_d0 * auVar196._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar10._16_4_;
      auVar279._20_4_ =
           fStack_dc * auVar11._20_4_ + fStack_cc * auVar196._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar10._20_4_;
      auVar279._24_4_ =
           fStack_d8 * auVar11._24_4_ + fStack_c8 * auVar196._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar279._28_4_ = auVar11._28_4_ + fVar438 + fVar307;
      auVar10 = vsubps_avx(auVar136,auVar279);
      auVar137._0_4_ = auVar136._0_4_ + auVar279._0_4_;
      auVar137._4_4_ = auVar136._4_4_ + auVar279._4_4_;
      auVar137._8_4_ = auVar136._8_4_ + auVar279._8_4_;
      auVar137._12_4_ = auVar136._12_4_ + auVar279._12_4_;
      auVar137._16_4_ = auVar136._16_4_ + auVar279._16_4_;
      auVar137._20_4_ = auVar136._20_4_ + auVar279._20_4_;
      auVar137._24_4_ = auVar136._24_4_ + auVar279._24_4_;
      auVar137._28_4_ = auVar136._28_4_ + auVar279._28_4_;
      auVar264 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vperm2f128_avx(auVar264,auVar137,0x13);
      auVar11 = vperm2f128_avx(auVar264,auVar137,2);
      auVar196 = vpermilps_avx(auVar380,0xff);
      auVar366 = vpermilps_avx(auVar380,0xaa);
      auVar12 = vpermilps_avx(auVar380,0x55);
      auVar13 = vpermilps_avx(auVar380,0);
      fVar414 = auVar10._0_4_;
      fVar182 = auVar13._0_4_ * fVar414;
      fVar426 = auVar10._4_4_;
      fVar183 = auVar13._4_4_ * fVar426;
      auVar56._4_4_ = fVar183;
      auVar56._0_4_ = fVar182;
      fVar427 = auVar10._8_4_;
      fVar184 = auVar13._8_4_ * fVar427;
      auVar56._8_4_ = fVar184;
      fVar428 = auVar10._12_4_;
      fVar186 = auVar13._12_4_ * fVar428;
      auVar56._12_4_ = fVar186;
      fVar429 = auVar10._16_4_;
      fVar213 = auVar13._16_4_ * fVar429;
      auVar56._16_4_ = fVar213;
      fVar436 = auVar10._20_4_;
      fVar214 = auVar13._20_4_ * fVar436;
      auVar56._20_4_ = fVar214;
      fVar437 = auVar10._24_4_;
      fVar215 = auVar13._24_4_ * fVar437;
      auVar56._24_4_ = fVar215;
      auVar56._28_4_ = auVar264._28_4_;
      fVar216 = auVar12._0_4_ * fVar414;
      fVar259 = auVar12._4_4_ * fVar426;
      auVar57._4_4_ = fVar259;
      auVar57._0_4_ = fVar216;
      fVar260 = auVar12._8_4_ * fVar427;
      auVar57._8_4_ = fVar260;
      fVar261 = auVar12._12_4_ * fVar428;
      auVar57._12_4_ = fVar261;
      fVar262 = auVar12._16_4_ * fVar429;
      auVar57._16_4_ = fVar262;
      fVar268 = auVar12._20_4_ * fVar436;
      auVar57._20_4_ = fVar268;
      fVar269 = auVar12._24_4_ * fVar437;
      auVar57._24_4_ = fVar269;
      auVar57._28_4_ = fVar438;
      fVar270 = auVar366._0_4_ * fVar414;
      fVar271 = auVar366._4_4_ * fVar426;
      auVar58._4_4_ = fVar271;
      auVar58._0_4_ = fVar270;
      fVar281 = auVar366._8_4_ * fVar427;
      auVar58._8_4_ = fVar281;
      fVar282 = auVar366._12_4_ * fVar428;
      auVar58._12_4_ = fVar282;
      fVar283 = auVar366._16_4_ * fVar429;
      auVar58._16_4_ = fVar283;
      fVar284 = auVar366._20_4_ * fVar436;
      auVar58._20_4_ = fVar284;
      fVar306 = auVar366._24_4_ * fVar437;
      auVar58._24_4_ = fVar306;
      auVar58._28_4_ = fVar307;
      fVar414 = auVar196._0_4_ * fVar414;
      fVar426 = auVar196._4_4_ * fVar426;
      auVar59._4_4_ = fVar426;
      auVar59._0_4_ = fVar414;
      fVar427 = auVar196._8_4_ * fVar427;
      auVar59._8_4_ = fVar427;
      fVar428 = auVar196._12_4_ * fVar428;
      auVar59._12_4_ = fVar428;
      fVar429 = auVar196._16_4_ * fVar429;
      auVar59._16_4_ = fVar429;
      fVar436 = auVar196._20_4_ * fVar436;
      auVar59._20_4_ = fVar436;
      fVar437 = auVar196._24_4_ * fVar437;
      auVar59._24_4_ = fVar437;
      auVar59._28_4_ = fVar439;
      auVar98._4_4_ = fStack_114;
      auVar98._0_4_ = fStack_118;
      auVar98._8_4_ = local_110;
      auVar98._12_4_ = fStack_10c;
      auVar212._16_16_ = auVar98;
      auVar212._0_16_ = auVar98;
      vpermilps_avx(auVar212,0xff);
      vpermilps_avx(auVar212,0xaa);
      auVar10 = vpermilps_avx(auVar212,0);
      fVar455 = auVar11._0_4_ * auVar10._0_4_;
      fVar456 = auVar11._4_4_ * auVar10._4_4_;
      auVar60._4_4_ = fVar456;
      auVar60._0_4_ = fVar455;
      fVar457 = auVar11._8_4_ * auVar10._8_4_;
      auVar60._8_4_ = fVar457;
      fVar469 = auVar11._12_4_ * auVar10._12_4_;
      auVar60._12_4_ = fVar469;
      fVar470 = auVar11._16_4_ * auVar10._16_4_;
      auVar60._16_4_ = fVar470;
      fVar471 = auVar11._20_4_ * auVar10._20_4_;
      auVar60._20_4_ = fVar471;
      fVar454 = auVar196._28_4_;
      fVar116 = auVar11._24_4_ * auVar10._24_4_;
      auVar60._24_4_ = fVar116;
      auVar60._28_4_ = fVar454;
      auVar258._0_4_ = fVar455 + fVar270;
      auVar258._4_4_ = fVar456 + fVar271;
      auVar258._8_4_ = fVar457 + fVar281;
      auVar258._12_4_ = fVar469 + fVar282;
      auVar258._16_4_ = fVar470 + fVar283;
      auVar258._20_4_ = fVar471 + fVar284;
      auVar258._24_4_ = fVar116 + fVar306;
      auVar258._28_4_ = fVar454 + fVar307;
      auVar10 = vsubps_avx(auVar60,auVar56);
      auVar11 = vsubps_avx(auVar60,auVar57);
      auVar196 = vsubps_avx(auVar60,auVar58);
      auVar366 = vsubps_avx(auVar60,auVar59);
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar456 + fVar183;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar457 + fVar184;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar186;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar470 + fVar213;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar471 + fVar214;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar116 + fVar215;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           fVar454 + auVar264._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar455 + fVar216;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar456 + fVar259;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar457 + fVar260;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar469 + fVar261;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar470 + fVar262;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar471 + fVar268;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar116 + fVar269;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar454 + fVar438;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x40) = auVar258;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar455 + fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar456 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar457 + fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar469 + fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar470 + fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar471 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar116 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar454 + fVar439;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar366;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar196;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar10;
      auVar179 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar181._0_8_ = std::ostream::flush();
    auVar181._8_56_ = extraout_var_39;
    iVar112 = 0;
    do {
      uVar114 = 0;
      do {
        auVar181._0_16_ = ZEXT816(0);
        if (uVar114 < 8) {
          auVar180._0_8_ = (double)Imath_3_2::erand48(local_136);
          auVar180._8_56_ = extraout_var_40;
          auVar181._4_60_ = auVar180._4_60_;
          auVar181._0_4_ = (float)auVar180._0_8_;
        }
        *(float *)((undefined1 *)local_150._buffer + uVar114 * 4) = auVar181._0_4_;
        local_130._buffer[uVar114] = auVar181._0_4_;
        uVar114 = uVar114 + 1;
      } while (uVar114 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_130._buffer);
      puVar109 = &DAT_001c2e60;
      pfVar111 = &local_120;
      for (lVar113 = 0x10; lVar113 != 0; lVar113 = lVar113 + -1) {
        *(undefined8 *)pfVar111 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar115 * -2 + 1;
        pfVar111 = pfVar111 + ((ulong)bVar115 * -2 + 1) * 2;
      }
      auVar453._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar453._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar468._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar468._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar11 = vunpcklpd_avx(auVar453,auVar468);
      auVar10 = vunpckhpd_avx(auVar453,auVar468);
      auVar196 = vunpcklps_avx(auVar11,auVar10);
      auVar10 = vunpckhps_avx(auVar11,auVar10);
      auVar11 = vunpcklpd_avx(auVar196,auVar10);
      auVar10 = vunpckhpd_avx(auVar196,auVar10);
      auVar196 = vpermilps_avx(auVar11,0);
      auVar366 = vpermilps_avx(auVar11,0x55);
      auVar264 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar138._0_4_ =
           local_120 * auVar196._0_4_ + local_110 * auVar366._0_4_ +
           local_100 * auVar264._0_4_ + local_f0 * auVar11._0_4_;
      auVar138._4_4_ =
           fStack_11c * auVar196._4_4_ + fStack_10c * auVar366._4_4_ +
           fStack_fc * auVar264._4_4_ + fStack_ec * auVar11._4_4_;
      auVar138._8_4_ =
           fStack_118 * auVar196._8_4_ + fStack_108 * auVar366._8_4_ +
           fStack_f8 * auVar264._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar138._12_4_ =
           fStack_114 * auVar196._12_4_ + fStack_104 * auVar366._12_4_ +
           fStack_f4 * auVar264._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar138._16_4_ =
           local_120 * auVar196._16_4_ + local_110 * auVar366._16_4_ +
           local_100 * auVar264._16_4_ + local_f0 * auVar11._16_4_;
      auVar138._20_4_ =
           fStack_11c * auVar196._20_4_ + fStack_10c * auVar366._20_4_ +
           fStack_fc * auVar264._20_4_ + fStack_ec * auVar11._20_4_;
      auVar138._24_4_ =
           fStack_118 * auVar196._24_4_ + fStack_108 * auVar366._24_4_ +
           fStack_f8 * auVar264._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar138._28_4_ = auVar196._28_4_ + auVar366._28_4_ + auVar264._28_4_ + auVar11._28_4_;
      auVar11 = vpermilps_avx(auVar10,0);
      auVar196 = vpermilps_avx(auVar10,0x55);
      auVar366 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar280._0_4_ =
           local_e0 * auVar11._0_4_ + local_d0 * auVar196._0_4_ +
           local_c0 * auVar366._0_4_ + local_b0 * auVar10._0_4_;
      auVar280._4_4_ =
           fStack_dc * auVar11._4_4_ + fStack_cc * auVar196._4_4_ +
           fStack_bc * auVar366._4_4_ + fStack_ac * auVar10._4_4_;
      auVar280._8_4_ =
           fStack_d8 * auVar11._8_4_ + fStack_c8 * auVar196._8_4_ +
           fStack_b8 * auVar366._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar280._12_4_ =
           fStack_d4 * auVar11._12_4_ + fStack_c4 * auVar196._12_4_ +
           fStack_b4 * auVar366._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar280._16_4_ =
           local_e0 * auVar11._16_4_ + local_d0 * auVar196._16_4_ +
           local_c0 * auVar366._16_4_ + local_b0 * auVar10._16_4_;
      auVar280._20_4_ =
           fStack_dc * auVar11._20_4_ + fStack_cc * auVar196._20_4_ +
           fStack_bc * auVar366._20_4_ + fStack_ac * auVar10._20_4_;
      auVar280._24_4_ =
           fStack_d8 * auVar11._24_4_ + fStack_c8 * auVar196._24_4_ +
           fStack_b8 * auVar366._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar280._28_4_ = auVar11._28_4_ + auVar196._28_4_ + auVar366._28_4_ + auVar10._28_4_;
      auVar10 = vsubps_avx(auVar138,auVar280);
      auVar139._0_4_ = auVar138._0_4_ + auVar280._0_4_;
      auVar139._4_4_ = auVar138._4_4_ + auVar280._4_4_;
      auVar139._8_4_ = auVar138._8_4_ + auVar280._8_4_;
      auVar139._12_4_ = auVar138._12_4_ + auVar280._12_4_;
      auVar139._16_4_ = auVar138._16_4_ + auVar280._16_4_;
      auVar139._20_4_ = auVar138._20_4_ + auVar280._20_4_;
      auVar139._24_4_ = auVar138._24_4_ + auVar280._24_4_;
      auVar139._28_4_ = auVar138._28_4_ + auVar280._28_4_;
      auVar10 = vpermilps_avx(auVar10,0x1b);
      auVar10 = vperm2f128_avx(auVar10,auVar139,2);
      fVar414 = auVar10._0_4_ * local_120;
      fVar426 = auVar10._4_4_ * fStack_11c;
      fVar427 = auVar10._8_4_ * fStack_118;
      fVar428 = auVar10._12_4_ * fStack_114;
      fVar429 = auVar10._16_4_ * local_120;
      fVar436 = auVar10._20_4_ * fStack_11c;
      uVar61 = auVar10._28_4_;
      fVar437 = auVar10._24_4_ * fStack_118;
      *(float *)(undefined1 *)local_150._buffer = fVar414;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar426;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar427;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = uVar61;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = fVar414;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4) = fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc) = fVar428;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = fVar429;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = fVar437;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = uVar61;
      auVar181 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_130,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar112 = iVar112 + 1;
    } while (iVar112 != 1000000);
  }
  if (local_150._handle != (char *)0x0) {
    free(local_150._handle);
  }
  if (local_130._handle != (char *)0x0) {
    free(local_130._handle);
  }
  return;
}

Assistant:

void
testDct ()
{
    const int            numIter = 1000000;
    Rand48               rand48 (0);
    SimdAlignedBuffer64f orig;
    SimdAlignedBuffer64f test;

    cout << "   DCT Round Trip " << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        for (int i = 0; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = rand48.nextf ();
        }

        dctForward8x8 (test._buffer);
        dctInverse8x8_scalar<0> (test._buffer);

        compareBufferRelative (orig, test, .02, 1e-3);
    }

    cout << "      Inverse, DC Only" << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        orig._buffer[0] = test._buffer[0] = rand48.nextf ();
        for (int i = 1; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = 0;
        }

        dctInverse8x8_scalar<0> (orig._buffer);
        dctInverse8x8DcOnly (test._buffer);

        compareBufferRelative (orig, test, .01, 1e-6);
    }

#define INVERSE_DCT_SCALAR_TEST_N(_func, _n, _desc)                            \
    cout << "         " << _desc << endl;                                      \
    for (int iter = 0; iter < numIter; ++iter)                                 \
    {                                                                          \
        for (int i = 0; i < 64; ++i)                                           \
        {                                                                      \
            if (i < 8 * (8 - _n))                                              \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = rand48.nextf ();           \
            }                                                                  \
            else                                                               \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = 0;                         \
            }                                                                  \
        }                                                                      \
        dctInverse8x8_scalar<0> (orig._buffer);                                \
        _func<_n> (test._buffer);                                              \
        compareBufferRelative (orig, test, .01, 1e-6);                         \
    }

    cout << "      Inverse, Scalar: " << endl;
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 0, "8x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 1, "7x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 2, "6x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 3, "5x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 4, "4x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 5, "3x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 6, "2x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 7, "1x8")

    CpuId cpuid;
    if (cpuid.sse2)
    {
        cout << "      Inverse, SSE2: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 7, "1x8")
    }

    if (cpuid.avx)
    {
        cout << "      Inverse, AVX: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 7, "1x8")
    }
}